

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution_x86_avx512::forward
          (Deconvolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  undefined4 *puVar10;
  uint *puVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  Layer *pLVar15;
  byte bVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined4 uVar110;
  undefined4 uVar111;
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  undefined8 uVar115;
  undefined8 uVar116;
  undefined8 uVar117;
  undefined8 uVar118;
  long lVar119;
  float afVar120 [16];
  float afVar121 [16];
  float afVar122 [16];
  float afVar123 [16];
  float afVar124 [16];
  float afVar125 [16];
  float afVar126 [16];
  float afVar127 [16];
  float afVar128 [16];
  float afVar129 [16];
  float afVar130 [16];
  float afVar131 [16];
  float afVar132 [16];
  float afVar133 [16];
  float afVar134 [16];
  float afVar135 [16];
  float afVar136 [16];
  Mat *pMVar137;
  int u;
  int iVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  uint uVar142;
  int iVar143;
  int iVar144;
  long lVar145;
  ulong uVar146;
  undefined8 *puVar147;
  undefined1 (*pauVar148) [32];
  undefined1 (*pauVar149) [16];
  long lVar150;
  uint uVar151;
  int iVar152;
  int iVar153;
  ulong uVar154;
  long lVar155;
  int i;
  int iVar156;
  uint uVar157;
  uint uVar158;
  uint uVar159;
  uint uVar160;
  ulong uVar161;
  undefined1 (*pauVar162) [32];
  undefined1 (*pauVar163) [16];
  int y_6;
  long lVar164;
  ulong uVar165;
  ulong uVar166;
  void *pvVar167;
  undefined1 (*pauVar168) [64];
  float *pfVar169;
  uint uVar170;
  void *pvVar171;
  undefined8 *puVar172;
  float *pfVar173;
  int iVar174;
  void *pvVar175;
  int y_2;
  undefined1 (*pauVar176) [64];
  ulong uVar177;
  ulong uVar178;
  void *pvVar179;
  int y_1;
  uint uVar180;
  ulong uVar181;
  ulong uVar182;
  bool bVar183;
  bool bVar184;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar296 [64];
  undefined1 auVar297 [64];
  undefined1 auVar298 [64];
  undefined1 auVar299 [64];
  undefined1 auVar300 [64];
  undefined1 auVar301 [64];
  undefined1 auVar302 [64];
  undefined1 auVar303 [64];
  undefined1 auVar304 [64];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  undefined1 auVar311 [64];
  undefined1 auVar312 [64];
  undefined1 auVar313 [64];
  undefined1 auVar314 [64];
  undefined1 auVar315 [64];
  undefined1 auVar316 [64];
  undefined1 auVar317 [64];
  undefined1 auVar318 [64];
  undefined1 auVar319 [64];
  undefined1 auVar320 [64];
  undefined1 auVar321 [64];
  undefined1 auVar322 [64];
  undefined1 auVar323 [64];
  undefined1 auVar324 [64];
  undefined1 auVar325 [64];
  undefined1 auVar326 [64];
  undefined1 auVar327 [64];
  undefined1 auVar328 [64];
  undefined1 auVar329 [64];
  undefined1 auVar330 [64];
  undefined1 auVar331 [64];
  undefined1 auVar332 [64];
  undefined1 auVar333 [64];
  float fVar334;
  undefined4 uVar335;
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  float fVar348;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  float fVar355;
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  v4sf one;
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  __m128 pos;
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 in_ZMM29 [64];
  undefined1 (*local_2a8) [64];
  undefined1 (*local_288) [32];
  void *local_238;
  Mat local_1e8;
  ulong local_1a0;
  long local_198;
  int local_18c;
  Option *local_188;
  void *local_180;
  long local_178;
  int local_16c;
  undefined1 local_168 [64];
  Mat *local_120;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  long local_108;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined1 auStack_e8 [12];
  undefined8 local_d8;
  void *local_c8;
  int *piStack_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  undefined4 local_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  int local_90;
  size_t local_88;
  Option opt_b;
  
  uVar157 = bottom_blob->w;
  uVar160 = bottom_blob->h;
  uVar165 = bottom_blob->elemsize;
  iVar174 = bottom_blob->elempack;
  local_18c = (this->super_Deconvolution).dilation_w;
  uVar158 = (this->super_Deconvolution).num_output;
  iVar139 = (this->super_Deconvolution).stride_w;
  local_16c = ((this->super_Deconvolution).kernel_h + -1) * (this->super_Deconvolution).dilation_h;
  iVar138 = (this->super_Deconvolution).kernel_w;
  iVar156 = (this->super_Deconvolution).stride_h;
  iVar152 = (this->super_Deconvolution).output_pad_right;
  iVar153 = (this->super_Deconvolution).output_pad_bottom;
  if (opt->use_packing_layout == true) {
    if ((uVar158 & 0xf) == 0) {
      uVar151 = 0x10;
    }
    else if ((uVar158 & 7) == 0) {
      uVar151 = 8;
    }
    else {
      uVar151 = (uint)((uVar158 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar151 = 1;
  }
  uVar154 = (long)(int)uVar158 / (long)(int)uVar151 & 0xffffffff;
  local_1e8.cstep = 0;
  local_1e8.data = (void *)0x0;
  local_1e8.refcount._0_4_ = 0;
  local_1e8.refcount._4_4_ = 0;
  local_1e8.elemsize = 0;
  local_1e8.elempack = 0;
  local_1e8.allocator = (Allocator *)0x0;
  local_1e8.dims = 0;
  local_1e8.w = 0;
  local_1e8.h = 0;
  local_1e8.d = 0;
  local_1e8.c = 0;
  auVar185._0_4_ = (this->super_Deconvolution).pad_left;
  auVar185._4_4_ = (this->super_Deconvolution).pad_right;
  auVar185._8_4_ = (this->super_Deconvolution).pad_top;
  auVar185._12_4_ = (this->super_Deconvolution).pad_bottom;
  uVar166 = vpcmpd_avx512vl((undefined1  [16])0x0,auVar185,1);
  lVar150 = 0x10;
  if (((uVar166 & 0xf) == 0) &&
     ((((this->super_Deconvolution).output_w < 1 || ((this->super_Deconvolution).output_h < 1)) &&
      (lVar150 = 8, &local_1e8 != top_blob)))) {
    piVar9 = top_blob->refcount;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    local_1e8.data = top_blob->data;
    local_1e8.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_1e8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_1e8.elemsize = top_blob->elemsize;
    local_1e8.elempack = top_blob->elempack;
    local_1e8.allocator = top_blob->allocator;
    uVar3 = top_blob->dims;
    uVar4 = top_blob->w;
    uVar5 = top_blob->h;
    uVar6 = top_blob->d;
    local_1e8.c = top_blob->c;
    local_1e8.cstep = top_blob->cstep;
    local_1e8.dims = uVar3;
    local_1e8.w = uVar4;
    local_1e8.h = uVar5;
    local_1e8.d = uVar6;
  }
  local_18c = (iVar138 + -1) * local_18c;
  iVar138 = iVar152 + (uVar157 - 1) * iVar139 + local_18c + 1;
  iVar152 = (int)((long)(int)uVar158 / (long)(int)uVar151);
  local_188 = opt;
  local_120 = top_blob;
  Mat::create(&local_1e8,iVar138,iVar153 + 1 + (uVar160 - 1) * iVar156 + local_16c,iVar152,
              (uVar165 / (ulong)(long)iVar174) * (ulong)uVar151,uVar151,
              *(Allocator **)(&opt->lightmode + lVar150));
  afVar129 = ::_ps512_cephes_exp_p5;
  afVar128 = ::_ps512_cephes_exp_p4;
  afVar127 = ::_ps512_cephes_exp_p3;
  afVar126 = ::_ps512_cephes_exp_p2;
  afVar125 = ::_ps512_cephes_exp_p1;
  afVar124 = ::_ps512_cephes_exp_p0;
  afVar123 = ::_ps512_cephes_LOG2EF;
  afVar122 = ::_ps512_exp_lo;
  afVar121 = ::_ps512_exp_hi;
  afVar120 = ::_ps512_1;
  iVar139 = -100;
  if ((local_1e8.data != (void *)0x0) && (local_1e8.cstep * (long)local_1e8.c != 0)) {
    uVar158 = (this->super_Deconvolution).kernel_w;
    uVar159 = (this->super_Deconvolution).kernel_h;
    iVar156 = uVar159 * uVar158;
    local_198 = (long)iVar156;
    if (local_188->use_sgemm_convolution == true) {
      piVar9 = bottom_blob->refcount;
      local_c8 = bottom_blob->data;
      piStack_c0 = bottom_blob->refcount;
      local_b8 = bottom_blob->elemsize;
      local_b0 = bottom_blob->elempack;
      local_a8 = bottom_blob->allocator;
      iVar174 = bottom_blob->h;
      iVar139 = bottom_blob->w;
      uVar110 = bottom_blob->dims;
      uVar111 = bottom_blob->d;
      local_90 = bottom_blob->c;
      local_88 = bottom_blob->cstep;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
        iVar139 = bottom_blob->w;
        iVar174 = bottom_blob->h;
      }
      _local_a0 = CONCAT44(iVar174 * iVar139,uVar110);
      _uStack_98 = CONCAT44(uVar111,1);
      local_d8 = 0;
      local_118 = (long *)0x0;
      uStack_110 = 0;
      iStack_10c = 0;
      local_108 = 0;
      uStack_100 = 0;
      auStack_e8 = SUB1612(ZEXT816(0),0);
      opt_b.lightmode = local_188->lightmode;
      opt_b.use_shader_pack8 = local_188->use_shader_pack8;
      opt_b.use_subgroup_ops = local_188->use_subgroup_ops;
      opt_b.use_reserved_0 = local_188->use_reserved_0;
      opt_b.num_threads = local_188->num_threads;
      opt_b.workspace_allocator = local_188->workspace_allocator;
      opt_b.openmp_blocktime = local_188->openmp_blocktime;
      opt_b.use_winograd_convolution = local_188->use_winograd_convolution;
      opt_b.use_sgemm_convolution = local_188->use_sgemm_convolution;
      opt_b.use_int8_inference = local_188->use_int8_inference;
      opt_b.use_vulkan_compute = local_188->use_vulkan_compute;
      opt_b.use_bf16_storage = local_188->use_bf16_storage;
      opt_b.use_fp16_packed = local_188->use_fp16_packed;
      opt_b.use_fp16_storage = local_188->use_fp16_storage;
      opt_b.use_fp16_arithmetic = local_188->use_fp16_arithmetic;
      opt_b.use_int8_packed = local_188->use_int8_packed;
      opt_b.use_int8_storage = local_188->use_int8_storage;
      opt_b.use_int8_arithmetic = local_188->use_int8_arithmetic;
      opt_b.use_packing_layout = local_188->use_packing_layout;
      opt_b.vulkan_device_index = local_188->vulkan_device_index;
      opt_b.use_reserved_1 = local_188->use_reserved_1;
      opt_b.use_image_storage = local_188->use_image_storage;
      opt_b.use_tensor_storage = local_188->use_tensor_storage;
      opt_b.use_reserved_2 = local_188->use_reserved_2;
      opt_b.flush_denormals = local_188->flush_denormals;
      opt_b.use_local_pool_allocator = local_188->use_local_pool_allocator;
      opt_b.use_shader_local_memory = local_188->use_shader_local_memory;
      opt_b.use_cooperative_matrix = local_188->use_cooperative_matrix;
      opt_b.use_winograd23_convolution = local_188->use_winograd23_convolution;
      opt_b.use_winograd43_convolution = local_188->use_winograd43_convolution;
      opt_b.use_winograd63_convolution = local_188->use_winograd63_convolution;
      opt_b.use_a53_a55_optimized_kernel = local_188->use_a53_a55_optimized_kernel;
      opt_b.use_fp16_uniform = local_188->use_fp16_uniform;
      opt_b.use_int8_uniform = local_188->use_int8_uniform;
      opt_b.use_reserved_9 = local_188->use_reserved_9;
      opt_b.use_reserved_10 = local_188->use_reserved_10;
      opt_b.use_reserved_11 = local_188->use_reserved_11;
      opt_b.blob_allocator = local_1e8.allocator;
      local_f8 = local_118;
      uStack_f0 = uStack_110;
      iStack_ec = iStack_10c;
      iVar139 = (*this->gemm->_vptr_Layer[7])();
      if (iVar139 != 0) {
        piVar9 = (int *)CONCAT44(iStack_10c,uStack_110);
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (local_f8 == (long *)0x0) {
              free(local_118);
            }
            else {
              (**(code **)(*local_f8 + 0x18))();
            }
          }
        }
        if (piStack_c0 != (int *)0x0) {
          LOCK();
          *piStack_c0 = *piStack_c0 + -1;
          UNLOCK();
          if (*piStack_c0 == 0) {
            if (local_a8 == (Allocator *)0x0) {
              free(local_c8);
            }
            else {
              (*local_a8->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_0026f8a9;
      }
      iVar174 = (iVar138 * (this->super_Deconvolution).stride_h -
                (this->super_Deconvolution).stride_w * uVar157) * uVar151;
      if (uVar151 == 1) {
        if ((int)uVar157 < 1) {
          uVar157 = 0;
        }
        if ((int)uVar160 < 1) {
          uVar160 = 0;
        }
        uVar165 = 0;
        if (0 < iVar152) {
          uVar165 = uVar154;
        }
        lVar150 = (long)local_1e8.h * (long)local_1e8.w;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        bVar184 = (long)(this->super_Deconvolution).bias_data.c *
                  (this->super_Deconvolution).bias_data.cstep == 0;
        iVar139 = (this->super_Deconvolution).kernel_h;
        if (iVar139 < 1) {
          iVar139 = 0;
        }
        local_198 = CONCAT71((int7)(int3)((uint)iVar156 >> 8),bVar184 || pvVar14 == (void *)0x0);
        pvVar179 = local_1e8.data;
        for (uVar166 = 0; uVar166 != uVar165; uVar166 = uVar166 + 1) {
          iVar138 = (int)((local_1e8.elemsize * lVar150 + 0xf & 0xfffffffffffffff0) /
                         local_1e8.elemsize);
          if (local_1e8.dims == 4) {
            iVar138 = (int)lVar150;
          }
          uVar335 = 0;
          if (!bVar184 && pvVar14 != (void *)0x0) {
            uVar335 = *(undefined4 *)((long)pvVar14 + uVar166 * 4);
          }
          pfVar169 = (float *)(uVar166 * iStack_ec * local_108 * (long)iVar156 + (long)local_118);
          iVar138 = iVar138 * local_1e8.d;
          if (iVar138 < 1) {
            iVar138 = 0;
          }
          for (lVar155 = 0; iVar138 != (int)lVar155; lVar155 = lVar155 + 1) {
            *(undefined4 *)((long)pvVar179 + lVar155 * 4) = uVar335;
          }
          uVar158 = (this->super_Deconvolution).kernel_w;
          uVar178 = 0;
          uVar154 = (ulong)uVar158;
          if ((int)uVar158 < 1) {
            uVar154 = uVar178;
          }
          while (iVar138 = (int)uVar178, iVar138 != iVar139) {
            iVar152 = (this->super_Deconvolution).dilation_h;
            iVar153 = (this->super_Deconvolution).dilation_w;
            for (uVar178 = 0; uVar178 != uVar154; uVar178 = uVar178 + 1) {
              pfVar173 = (float *)((long)local_1e8.data +
                                  uVar178 * (long)iVar153 * 4 +
                                  (long)iVar138 * (long)iVar152 *
                                  (long)local_1e8.w * local_1e8.elemsize +
                                  local_1e8.cstep * local_1e8.elemsize * uVar166);
              for (uVar158 = 0; uVar158 != uVar160; uVar158 = uVar158 + 1) {
                iVar8 = (this->super_Deconvolution).stride_w;
                uVar151 = uVar157;
                while (bVar183 = uVar151 != 0, uVar151 = uVar151 - 1, bVar183) {
                  *pfVar173 = *pfVar173 + *pfVar169;
                  pfVar169 = pfVar169 + 1;
                  pfVar173 = pfVar173 + iVar8;
                }
                pfVar173 = pfVar173 + iVar174;
              }
            }
            uVar178 = (ulong)(iVar138 + 1);
          }
          pvVar179 = (void *)((long)pvVar179 + local_1e8.cstep * local_1e8.elemsize);
        }
      }
      else if (uVar151 == 0x10) {
        if ((int)uVar157 < 1) {
          uVar157 = 0;
        }
        if ((int)uVar160 < 1) {
          uVar160 = 0;
        }
        if (iVar152 < 1) {
          uVar154 = 0;
        }
        for (uVar165 = 0; uVar165 != uVar154; uVar165 = uVar165 + 1) {
          pauVar168 = (undefined1 (*) [64])
                      ((long)iStack_ec * uVar165 * (long)iVar156 * local_108 + (long)local_118);
          puVar172 = (undefined8 *)
                     (local_1e8.cstep * uVar165 * local_1e8.elemsize + (long)local_1e8.data);
          uVar178 = (long)local_1e8.h * (long)local_1e8.w;
          uVar166 = (local_1e8.elemsize * uVar178 + 0xf & 0xfffffffffffffff0) / local_1e8.elemsize;
          if (local_1e8.dims == 4) {
            uVar166 = uVar178;
          }
          pvVar14 = (this->super_Deconvolution).bias_data.data;
          if ((pvVar14 == (void *)0x0) ||
             ((long)(this->super_Deconvolution).bias_data.c *
              (this->super_Deconvolution).bias_data.cstep == 0)) {
            iVar139 = local_1e8.d * (int)uVar166;
            puVar147 = puVar172;
            if (iVar139 < 1) {
              iVar139 = 0;
            }
            while (iVar139 != 0) {
              *puVar147 = 0;
              puVar147[1] = 0;
              puVar147[2] = 0;
              puVar147[3] = 0;
              puVar147[4] = 0;
              puVar147[5] = 0;
              puVar147[6] = 0;
              puVar147[7] = 0;
              puVar147 = puVar147 + 8;
              iVar139 = iVar139 + -1;
            }
          }
          else {
            puVar147 = (undefined8 *)((long)pvVar14 + uVar165 * 0x40);
            uVar17 = *puVar147;
            uVar112 = puVar147[1];
            uVar113 = puVar147[2];
            uVar114 = puVar147[3];
            uVar115 = puVar147[4];
            uVar116 = puVar147[5];
            uVar117 = puVar147[6];
            uVar118 = puVar147[7];
            iVar139 = local_1e8.d * (int)uVar166;
            puVar147 = puVar172;
            if (iVar139 < 1) {
              iVar139 = 0;
            }
            while (iVar139 != 0) {
              *puVar147 = uVar17;
              puVar147[1] = uVar112;
              puVar147[2] = uVar113;
              puVar147[3] = uVar114;
              puVar147[4] = uVar115;
              puVar147[5] = uVar116;
              puVar147[6] = uVar117;
              puVar147[7] = uVar118;
              puVar147 = puVar147 + 8;
              iVar139 = iVar139 + -1;
            }
          }
          for (iVar139 = 0; iVar139 < (this->super_Deconvolution).kernel_h; iVar139 = iVar139 + 1) {
            for (iVar138 = 0; iVar138 < (this->super_Deconvolution).kernel_w; iVar138 = iVar138 + 1)
            {
              pauVar176 = (undefined1 (*) [64])
                          ((long)puVar172 +
                          (long)((this->super_Deconvolution).dilation_w * iVar138 * 0x10) * 4 +
                          (long)iVar139 * (long)(this->super_Deconvolution).dilation_h *
                          local_1e8.elemsize * (long)local_1e8.w);
              for (uVar158 = 0; uVar151 = uVar157, uVar158 != uVar160; uVar158 = uVar158 + 1) {
                while (uVar151 != 0) {
                  auVar333 = vaddps_avx512f(*pauVar168,*pauVar176);
                  *pauVar176 = auVar333;
                  pauVar176 = pauVar176 + (this->super_Deconvolution).stride_w;
                  pauVar168 = pauVar168 + 1;
                  uVar151 = uVar151 - 1;
                }
                pauVar176 = (undefined1 (*) [64])(*pauVar176 + (long)iVar174 * 4);
              }
            }
          }
        }
      }
      else if (uVar151 == 8) {
        uVar166 = 0;
        uVar165 = (ulong)uVar157;
        if ((int)uVar157 < 1) {
          uVar165 = uVar166;
        }
        if ((int)uVar160 < 1) {
          uVar160 = 0;
        }
        local_198 = (long)iVar156;
        if (iVar152 < 1) {
          uVar154 = uVar166;
        }
        for (uVar178 = 0; uVar178 != uVar154; uVar178 = uVar178 + 1) {
          pfVar169 = (float *)((long)iStack_ec * uVar178 * local_198 * local_108 + (long)local_118);
          pauVar162 = (undefined1 (*) [32])
                      (local_1e8.cstep * uVar178 * local_1e8.elemsize + (long)local_1e8.data);
          uVar177 = (long)local_1e8.h * (long)local_1e8.w;
          uVar146 = (local_1e8.elemsize * uVar177 + 0xf & 0xfffffffffffffff0) / local_1e8.elemsize;
          if (local_1e8.dims == 4) {
            uVar146 = uVar177;
          }
          pvVar14 = (this->super_Deconvolution).bias_data.data;
          if ((pvVar14 == (void *)0x0) ||
             ((long)(this->super_Deconvolution).bias_data.c *
              (this->super_Deconvolution).bias_data.cstep == 0)) {
            uVar157 = local_1e8.d * (int)uVar146;
            pauVar148 = pauVar162;
            uVar146 = (ulong)uVar157;
            if ((int)uVar157 < 1) {
              uVar146 = uVar166;
            }
            while ((int)uVar146 != 0) {
              *(undefined8 *)*pauVar148 = 0;
              *(undefined8 *)(*pauVar148 + 8) = 0;
              *(undefined8 *)(*pauVar148 + 0x10) = 0;
              *(undefined8 *)(*pauVar148 + 0x18) = 0;
              pauVar148 = pauVar148 + 1;
              uVar146 = (ulong)((int)uVar146 - 1);
            }
          }
          else {
            auVar241 = *(undefined1 (*) [32])((long)pvVar14 + uVar178 * 0x20);
            uVar157 = local_1e8.d * (int)uVar146;
            pauVar148 = pauVar162;
            uVar146 = (ulong)uVar157;
            if ((int)uVar157 < 1) {
              uVar146 = uVar166;
            }
            while ((int)uVar146 != 0) {
              *pauVar148 = auVar241;
              pauVar148 = pauVar148 + 1;
              uVar146 = (ulong)((int)uVar146 - 1);
            }
          }
          for (iVar139 = 0; iVar139 < (this->super_Deconvolution).kernel_h; iVar139 = iVar139 + 1) {
            for (iVar138 = 0; iVar138 < (this->super_Deconvolution).kernel_w; iVar138 = iVar138 + 1)
            {
              pauVar148 = (undefined1 (*) [32])
                          (*pauVar162 +
                          (long)((this->super_Deconvolution).dilation_w * iVar138 * 8) * 4 +
                          (long)iVar139 * (long)(this->super_Deconvolution).dilation_h *
                          local_1e8.elemsize * (long)local_1e8.w);
              for (uVar157 = 0; uVar146 = uVar165, uVar157 != uVar160; uVar157 = uVar157 + 1) {
                while ((int)uVar146 != 0) {
                  auVar241._0_4_ = *pfVar169 + *(float *)*pauVar148;
                  auVar241._4_4_ = pfVar169[1] + *(float *)(*pauVar148 + 4);
                  auVar241._8_4_ = pfVar169[2] + *(float *)(*pauVar148 + 8);
                  auVar241._12_4_ = pfVar169[3] + *(float *)(*pauVar148 + 0xc);
                  auVar241._16_4_ = pfVar169[4] + *(float *)(*pauVar148 + 0x10);
                  auVar241._20_4_ = pfVar169[5] + *(float *)(*pauVar148 + 0x14);
                  auVar241._24_4_ = pfVar169[6] + *(float *)(*pauVar148 + 0x18);
                  auVar241._28_4_ = pfVar169[7] + *(float *)(*pauVar148 + 0x1c);
                  *pauVar148 = auVar241;
                  pauVar148 = pauVar148 + (this->super_Deconvolution).stride_w;
                  pfVar169 = pfVar169 + 8;
                  uVar146 = (ulong)((int)uVar146 - 1);
                }
                pauVar148 = (undefined1 (*) [32])(*pauVar148 + (long)iVar174 * 4);
              }
            }
          }
        }
      }
      else if (uVar151 == 4) {
        if ((int)uVar157 < 1) {
          uVar157 = 0;
        }
        if ((int)uVar160 < 1) {
          uVar160 = 0;
        }
        uVar165 = 0;
        if (0 < iVar152) {
          uVar165 = uVar154;
        }
        for (uVar166 = 0; uVar166 != uVar165; uVar166 = uVar166 + 1) {
          pfVar169 = (float *)((long)iStack_ec * uVar166 * local_198 * local_108 + (long)local_118);
          pauVar163 = (undefined1 (*) [16])
                      (local_1e8.cstep * uVar166 * local_1e8.elemsize + (long)local_1e8.data);
          uVar178 = (long)local_1e8.h * (long)local_1e8.w;
          uVar154 = (local_1e8.elemsize * uVar178 + 0xf & 0xfffffffffffffff0) / local_1e8.elemsize;
          if (local_1e8.dims == 4) {
            uVar154 = uVar178;
          }
          pvVar14 = (this->super_Deconvolution).bias_data.data;
          if ((pvVar14 == (void *)0x0) ||
             ((long)(this->super_Deconvolution).bias_data.c *
              (this->super_Deconvolution).bias_data.cstep == 0)) {
            iVar139 = local_1e8.d * (int)uVar154;
            pauVar149 = pauVar163;
            if (iVar139 < 1) {
              iVar139 = 0;
            }
            while (iVar139 != 0) {
              *(undefined8 *)*pauVar149 = 0;
              *(undefined8 *)(*pauVar149 + 8) = 0;
              pauVar149 = pauVar149 + 1;
              iVar139 = iVar139 + -1;
            }
          }
          else {
            auVar185 = *(undefined1 (*) [16])((long)pvVar14 + uVar166 * 0x10);
            iVar139 = local_1e8.d * (int)uVar154;
            pauVar149 = pauVar163;
            if (iVar139 < 1) {
              iVar139 = 0;
            }
            while (iVar139 != 0) {
              *pauVar149 = auVar185;
              pauVar149 = pauVar149 + 1;
              iVar139 = iVar139 + -1;
            }
          }
          for (iVar139 = 0; iVar139 < (this->super_Deconvolution).kernel_h; iVar139 = iVar139 + 1) {
            for (iVar138 = 0; iVar138 < (this->super_Deconvolution).kernel_w; iVar138 = iVar138 + 1)
            {
              pauVar149 = (undefined1 (*) [16])
                          (*pauVar163 +
                          (long)((this->super_Deconvolution).dilation_w * iVar138 * 4) * 4 +
                          (long)(this->super_Deconvolution).dilation_h * (long)iVar139 *
                          local_1e8.elemsize * (long)local_1e8.w);
              for (uVar158 = 0; uVar151 = uVar157, uVar158 != uVar160; uVar158 = uVar158 + 1) {
                while (uVar151 != 0) {
                  auVar343._0_4_ = *pfVar169 + *(float *)*pauVar149;
                  auVar343._4_4_ = pfVar169[1] + *(float *)(*pauVar149 + 4);
                  auVar343._8_4_ = pfVar169[2] + *(float *)(*pauVar149 + 8);
                  auVar343._12_4_ = pfVar169[3] + *(float *)(*pauVar149 + 0xc);
                  *pauVar149 = auVar343;
                  pauVar149 = pauVar149 + (this->super_Deconvolution).stride_w;
                  pfVar169 = pfVar169 + 4;
                  uVar151 = uVar151 - 1;
                }
                pauVar149 = (undefined1 (*) [16])(*pauVar149 + (long)iVar174 * 4);
              }
            }
          }
        }
      }
      pLVar15 = this->activation;
      if (pLVar15 != (Layer *)0x0) {
        (*pLVar15->_vptr_Layer[9])(pLVar15,&local_1e8,local_188);
      }
      piVar9 = (int *)CONCAT44(iStack_10c,uStack_110);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_f8 == (long *)0x0) {
            free(local_118);
          }
          else {
            (**(code **)(*local_f8 + 0x18))();
          }
        }
      }
      if (piStack_c0 != (int *)0x0) {
        LOCK();
        *piStack_c0 = *piStack_c0 + -1;
        UNLOCK();
        if (*piStack_c0 == 0) {
          if (local_a8 == (Allocator *)0x0) {
            free(local_c8);
          }
          else {
            (*local_a8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      if ((iVar174 == 0x10) && (uVar151 == 0x10)) {
        iVar139 = (this->super_Deconvolution).dilation_w;
        iVar138 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar152 = (this->super_Deconvolution).stride_h;
        iVar153 = (this->super_Deconvolution).activation_type;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        auVar333 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar296 = vxorps_avx512dq(auVar333,(undefined1  [64])_ps512_cephes_log_q2);
        auVar297 = vxorps_avx512dq(auVar333,(undefined1  [64])_ps512_cephes_log_q1);
        auVar298 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        local_168 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar333);
        uVar165 = 0;
        if (0 < (int)uVar158) {
          uVar165 = (ulong)uVar158;
        }
        uVar166 = 0;
        if (0 < (int)uVar159) {
          uVar166 = (ulong)uVar159;
        }
        uVar157 = local_1e8.c;
        if (local_1e8.c < 1) {
          uVar157 = 0;
        }
        local_1a0 = (ulong)uVar157;
        uVar154 = 0;
        auVar185 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
        in_ZMM29 = ZEXT1664(auVar185);
        auVar333 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        for (; uVar154 != local_1a0; uVar154 = uVar154 + 1) {
          pauVar168 = (undefined1 (*) [64])
                      (local_1e8.cstep * uVar154 * local_1e8.elemsize + (long)local_1e8.data);
          iVar8 = bottom_blob->w;
          iVar7 = bottom_blob->h;
          uVar146 = 0;
          uVar178 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar178 = uVar146;
          }
          uVar157 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar157 = 0;
          }
          uVar160 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar160 = 0;
          }
          while (uVar180 = (uint)uVar146, uVar180 != uVar160) {
            iVar144 = (1 - uVar158) * iVar139;
            for (uVar142 = 0; uVar142 != uVar157; uVar142 = uVar142 + 1) {
              if (pvVar14 == (void *)0x0) {
                auVar315 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar315 = *(undefined1 (*) [64])((long)pvVar14 + uVar154 * 0x40);
              }
              pvVar179 = bottom_blob->data;
              lVar150 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar154 * (this->weight_data_tm).elemsize +
                        0x3c0;
              for (uVar146 = 0; uVar146 != uVar178; uVar146 = uVar146 + 1) {
                lVar155 = lVar150;
                for (uVar177 = 0; uVar177 != uVar166; uVar177 = uVar177 + 1) {
                  iVar140 = (((int)uVar177 - uVar159) + 1) * iVar138 + uVar180;
                  if (((-1 < iVar140) && (iVar141 = iVar140 / iVar152, iVar140 % iVar152 == 0)) &&
                     (iVar141 < iVar7)) {
                    lVar119 = (long)iVar141 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar146;
                    iVar140 = iVar144;
                    for (lVar164 = 0; uVar165 * 0x400 != lVar164; lVar164 = lVar164 + 0x400) {
                      if (((-1 < iVar140) && (iVar141 = iVar140 / iVar156, iVar140 % iVar156 == 0))
                         && (iVar141 < iVar8)) {
                        lVar145 = (long)(iVar141 << 4);
                        auVar299 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119)));
                        auVar300 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 4)));
                        auVar301 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 8)));
                        auVar302 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0xc)));
                        auVar303 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x10)));
                        auVar304 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x14)));
                        auVar305 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x18)));
                        auVar306 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x1c)));
                        auVar307 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x20)));
                        auVar308 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x24)));
                        auVar309 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x28)));
                        auVar310 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x2c)));
                        auVar311 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x30)));
                        auVar312 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x34)));
                        auVar313 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x38)));
                        auVar314 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x3c)));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar299,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x3c0 + lVar164));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar300,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x380 + lVar164));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar301,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x340 + lVar164));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar302,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x300 + lVar164));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar303,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x2c0 + lVar164));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar304,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x280 + lVar164));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar305,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x240 + lVar164));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar306,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x200 + lVar164));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar307,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x1c0 + lVar164));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar308,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x180 + lVar164));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar309,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x140 + lVar164));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar310,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x100 + lVar164));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar311,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0xc0 + lVar164));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar312,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x80 + lVar164));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar313,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x40 + lVar164));
                        auVar315 = vfmadd231ps_avx512f(auVar315,auVar314,
                                                       *(undefined1 (*) [64])(lVar155 + lVar164));
                      }
                      iVar140 = iVar140 + iVar139;
                    }
                  }
                  lVar155 = lVar155 + (long)(int)uVar158 * 0x400;
                }
                lVar150 = lVar150 + (long)(int)(uVar158 * uVar159 * 0x100) * 4;
              }
              switch(iVar153) {
              case 1:
                auVar315 = vmaxps_avx512f(auVar315,in_ZMM29);
                break;
              case 2:
                uVar146 = vcmpps_avx512f(auVar315,in_ZMM29,1);
                uVar335 = *(this->super_Deconvolution).activation_params.data;
                auVar308._4_4_ = uVar335;
                auVar308._0_4_ = uVar335;
                auVar308._8_4_ = uVar335;
                auVar308._12_4_ = uVar335;
                auVar308._16_4_ = uVar335;
                auVar308._20_4_ = uVar335;
                auVar308._24_4_ = uVar335;
                auVar308._28_4_ = uVar335;
                auVar308._32_4_ = uVar335;
                auVar308._36_4_ = uVar335;
                auVar308._40_4_ = uVar335;
                auVar308._44_4_ = uVar335;
                auVar308._48_4_ = uVar335;
                auVar308._52_4_ = uVar335;
                auVar308._56_4_ = uVar335;
                auVar308._60_4_ = uVar335;
                auVar299 = vmulps_avx512f(auVar315,auVar308);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar309._0_4_ = (uint)bVar184 * auVar299._0_4_ | (uint)!bVar184 * auVar315._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar309._4_4_ = (uint)bVar184 * auVar299._4_4_ | (uint)!bVar184 * auVar315._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar309._8_4_ = (uint)bVar184 * auVar299._8_4_ | (uint)!bVar184 * auVar315._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar309._12_4_ = (uint)bVar184 * auVar299._12_4_ | (uint)!bVar184 * auVar315._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar309._16_4_ = (uint)bVar184 * auVar299._16_4_ | (uint)!bVar184 * auVar315._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar309._20_4_ = (uint)bVar184 * auVar299._20_4_ | (uint)!bVar184 * auVar315._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar309._24_4_ = (uint)bVar184 * auVar299._24_4_ | (uint)!bVar184 * auVar315._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar309._28_4_ = (uint)bVar184 * auVar299._28_4_ | (uint)!bVar184 * auVar315._28_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 8) & 1);
                auVar309._32_4_ = (uint)bVar184 * auVar299._32_4_ | (uint)!bVar184 * auVar315._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar309._36_4_ = (uint)bVar184 * auVar299._36_4_ | (uint)!bVar184 * auVar315._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar309._40_4_ = (uint)bVar184 * auVar299._40_4_ | (uint)!bVar184 * auVar315._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar309._44_4_ = (uint)bVar184 * auVar299._44_4_ | (uint)!bVar184 * auVar315._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar309._48_4_ = (uint)bVar184 * auVar299._48_4_ | (uint)!bVar184 * auVar315._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar309._52_4_ = (uint)bVar184 * auVar299._52_4_ | (uint)!bVar184 * auVar315._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar309._56_4_ = (uint)bVar184 * auVar299._56_4_ | (uint)!bVar184 * auVar315._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar309._60_4_ = (uint)bVar184 * auVar299._60_4_ | (uint)!bVar184 * auVar315._60_4_
                ;
                auVar315 = auVar309;
                break;
              case 3:
                puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar335 = *puVar10;
                auVar307._4_4_ = uVar335;
                auVar307._0_4_ = uVar335;
                auVar307._8_4_ = uVar335;
                auVar307._12_4_ = uVar335;
                auVar307._16_4_ = uVar335;
                auVar307._20_4_ = uVar335;
                auVar307._24_4_ = uVar335;
                auVar307._28_4_ = uVar335;
                auVar307._32_4_ = uVar335;
                auVar307._36_4_ = uVar335;
                auVar307._40_4_ = uVar335;
                auVar307._44_4_ = uVar335;
                auVar307._48_4_ = uVar335;
                auVar307._52_4_ = uVar335;
                auVar307._56_4_ = uVar335;
                auVar307._60_4_ = uVar335;
                auVar299 = vmaxps_avx512f(auVar315,auVar307);
                uVar335 = puVar10[1];
                auVar315._4_4_ = uVar335;
                auVar315._0_4_ = uVar335;
                auVar315._8_4_ = uVar335;
                auVar315._12_4_ = uVar335;
                auVar315._16_4_ = uVar335;
                auVar315._20_4_ = uVar335;
                auVar315._24_4_ = uVar335;
                auVar315._28_4_ = uVar335;
                auVar315._32_4_ = uVar335;
                auVar315._36_4_ = uVar335;
                auVar315._40_4_ = uVar335;
                auVar315._44_4_ = uVar335;
                auVar315._48_4_ = uVar335;
                auVar315._52_4_ = uVar335;
                auVar315._56_4_ = uVar335;
                auVar315._60_4_ = uVar335;
                auVar315 = vminps_avx512f(auVar299,auVar315);
                break;
              case 4:
                auVar301._8_4_ = 0x80000000;
                auVar301._0_8_ = 0x8000000080000000;
                auVar301._12_4_ = 0x80000000;
                auVar301._16_4_ = 0x80000000;
                auVar301._20_4_ = 0x80000000;
                auVar301._24_4_ = 0x80000000;
                auVar301._28_4_ = 0x80000000;
                auVar301._32_4_ = 0x80000000;
                auVar301._36_4_ = 0x80000000;
                auVar301._40_4_ = 0x80000000;
                auVar301._44_4_ = 0x80000000;
                auVar301._48_4_ = 0x80000000;
                auVar301._52_4_ = 0x80000000;
                auVar301._56_4_ = 0x80000000;
                auVar301._60_4_ = 0x80000000;
                auVar315 = vxorps_avx512dq(auVar315,auVar301);
                auVar315 = vminps_avx512f(auVar315,(undefined1  [64])afVar121);
                auVar315 = vmaxps_avx512f(auVar315,(undefined1  [64])afVar122);
                auVar299 = vfmadd213ps_avx512f((undefined1  [64])afVar123,auVar315,
                                               (undefined1  [64])afVar129);
                auVar300 = vrndscaleps_avx512f(auVar299,1);
                uVar146 = vcmpps_avx512f(auVar299,auVar300,1);
                auVar299 = vsubps_avx512f(auVar300,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar306._0_4_ = (uint)bVar184 * auVar299._0_4_ | (uint)!bVar184 * auVar300._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar306._4_4_ = (uint)bVar184 * auVar299._4_4_ | (uint)!bVar184 * auVar300._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar306._8_4_ = (uint)bVar184 * auVar299._8_4_ | (uint)!bVar184 * auVar300._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar306._12_4_ = (uint)bVar184 * auVar299._12_4_ | (uint)!bVar184 * auVar300._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar306._16_4_ = (uint)bVar184 * auVar299._16_4_ | (uint)!bVar184 * auVar300._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar306._20_4_ = (uint)bVar184 * auVar299._20_4_ | (uint)!bVar184 * auVar300._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar306._24_4_ = (uint)bVar184 * auVar299._24_4_ | (uint)!bVar184 * auVar300._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar306._28_4_ = (uint)bVar184 * auVar299._28_4_ | (uint)!bVar184 * auVar300._28_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 8) & 1);
                auVar306._32_4_ = (uint)bVar184 * auVar299._32_4_ | (uint)!bVar184 * auVar300._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar306._36_4_ = (uint)bVar184 * auVar299._36_4_ | (uint)!bVar184 * auVar300._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar306._40_4_ = (uint)bVar184 * auVar299._40_4_ | (uint)!bVar184 * auVar300._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar306._44_4_ = (uint)bVar184 * auVar299._44_4_ | (uint)!bVar184 * auVar300._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar306._48_4_ = (uint)bVar184 * auVar299._48_4_ | (uint)!bVar184 * auVar300._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar306._52_4_ = (uint)bVar184 * auVar299._52_4_ | (uint)!bVar184 * auVar300._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar306._56_4_ = (uint)bVar184 * auVar299._56_4_ | (uint)!bVar184 * auVar300._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar306._60_4_ = (uint)bVar184 * auVar299._60_4_ | (uint)!bVar184 * auVar300._60_4_
                ;
                auVar315 = vfmadd231ps_avx512f(auVar315,auVar306,auVar296);
                auVar315 = vfmadd231ps_avx512f(auVar315,auVar306,auVar297);
                auVar299 = vmulps_avx512f(auVar315,auVar315);
                auVar300 = vfmadd213ps_avx512f(auVar315,(undefined1  [64])afVar124,
                                               (undefined1  [64])afVar125);
                auVar300 = vfmadd213ps_avx512f(auVar300,auVar315,(undefined1  [64])afVar126);
                auVar300 = vfmadd213ps_avx512f(auVar300,auVar315,(undefined1  [64])afVar127);
                auVar300 = vfmadd213ps_avx512f(auVar300,auVar315,(undefined1  [64])afVar128);
                auVar300 = vfmadd213ps_avx512f(auVar300,auVar315,(undefined1  [64])afVar129);
                auVar315 = vfmadd213ps_avx512f(auVar300,auVar299,auVar315);
                auVar315 = vaddps_avx512f(auVar315,(undefined1  [64])afVar120);
                auVar299 = vcvttps2dq_avx512f(auVar306);
                auVar299 = vpaddd_avx512f(auVar299,auVar298);
                auVar299 = vpslld_avx512f(auVar299,0x17);
                auVar315 = vfmadd213ps_avx512f(auVar299,auVar315,auVar333);
                auVar315 = vdivps_avx512f(auVar333,auVar315);
                break;
              case 5:
                auVar299 = vminps_avx512f(auVar315,(undefined1  [64])afVar121);
                auVar299 = vmaxps_avx512f(auVar299,(undefined1  [64])afVar122);
                auVar300 = vfmadd213ps_avx512f((undefined1  [64])afVar123,auVar299,
                                               (undefined1  [64])afVar129);
                auVar301 = vrndscaleps_avx512f(auVar300,1);
                uVar146 = vcmpps_avx512f(auVar300,auVar301,1);
                auVar302 = vsubps_avx512f(auVar301,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar300._0_4_ = (uint)bVar184 * auVar302._0_4_ | (uint)!bVar184 * auVar301._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar300._4_4_ = (uint)bVar184 * auVar302._4_4_ | (uint)!bVar184 * auVar301._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar300._8_4_ = (uint)bVar184 * auVar302._8_4_ | (uint)!bVar184 * auVar301._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar300._12_4_ = (uint)bVar184 * auVar302._12_4_ | (uint)!bVar184 * auVar301._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar300._16_4_ = (uint)bVar184 * auVar302._16_4_ | (uint)!bVar184 * auVar301._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar300._20_4_ = (uint)bVar184 * auVar302._20_4_ | (uint)!bVar184 * auVar301._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar300._24_4_ = (uint)bVar184 * auVar302._24_4_ | (uint)!bVar184 * auVar301._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar300._28_4_ = (uint)bVar184 * auVar302._28_4_ | (uint)!bVar184 * auVar301._28_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 8) & 1);
                auVar300._32_4_ = (uint)bVar184 * auVar302._32_4_ | (uint)!bVar184 * auVar301._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar300._36_4_ = (uint)bVar184 * auVar302._36_4_ | (uint)!bVar184 * auVar301._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar300._40_4_ = (uint)bVar184 * auVar302._40_4_ | (uint)!bVar184 * auVar301._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar300._44_4_ = (uint)bVar184 * auVar302._44_4_ | (uint)!bVar184 * auVar301._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar300._48_4_ = (uint)bVar184 * auVar302._48_4_ | (uint)!bVar184 * auVar301._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar300._52_4_ = (uint)bVar184 * auVar302._52_4_ | (uint)!bVar184 * auVar301._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar300._56_4_ = (uint)bVar184 * auVar302._56_4_ | (uint)!bVar184 * auVar301._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar300._60_4_ = (uint)bVar184 * auVar302._60_4_ | (uint)!bVar184 * auVar301._60_4_
                ;
                auVar299 = vfmadd231ps_avx512f(auVar299,auVar300,auVar296);
                auVar299 = vfmadd231ps_avx512f(auVar299,auVar300,auVar297);
                auVar301 = vmulps_avx512f(auVar299,auVar299);
                auVar302 = vfmadd213ps_avx512f(auVar299,(undefined1  [64])afVar124,
                                               (undefined1  [64])afVar125);
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar299,(undefined1  [64])afVar126);
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar299,(undefined1  [64])afVar127);
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar299,(undefined1  [64])afVar128);
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar299,(undefined1  [64])afVar129);
                auVar299 = vfmadd213ps_avx512f(auVar302,auVar301,auVar299);
                auVar299 = vaddps_avx512f(auVar299,(undefined1  [64])afVar120);
                auVar300 = vcvttps2dq_avx512f(auVar300);
                auVar300 = vpaddd_avx512f(auVar300,auVar298);
                auVar300 = vpslld_avx512f(auVar300,0x17);
                auVar299 = vfmadd213ps_avx512f(auVar300,auVar299,auVar333);
                auVar300 = vmaxps_avx512f(auVar299,(undefined1  [64])_ps512_min_norm_pos);
                auVar301 = vpsrld_avx512f(auVar300,0x17);
                auVar300 = vpternlogd_avx512f(auVar300,(undefined1  [64])afVar129,
                                              (undefined1  [64])_ps512_inv_mant_mask,0xec);
                uVar146 = vcmpps_avx512f(auVar300,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                auVar302 = vsubps_avx512f(auVar300,(undefined1  [64])afVar120);
                auVar300 = vaddps_avx512f(auVar302,auVar300);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar303._0_4_ = (uint)bVar184 * auVar300._0_4_ | (uint)!bVar184 * auVar302._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar303._4_4_ = (uint)bVar184 * auVar300._4_4_ | (uint)!bVar184 * auVar302._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar303._8_4_ = (uint)bVar184 * auVar300._8_4_ | (uint)!bVar184 * auVar302._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar303._12_4_ = (uint)bVar184 * auVar300._12_4_ | (uint)!bVar184 * auVar302._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar303._16_4_ = (uint)bVar184 * auVar300._16_4_ | (uint)!bVar184 * auVar302._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar303._20_4_ = (uint)bVar184 * auVar300._20_4_ | (uint)!bVar184 * auVar302._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar303._24_4_ = (uint)bVar184 * auVar300._24_4_ | (uint)!bVar184 * auVar302._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar303._28_4_ = (uint)bVar184 * auVar300._28_4_ | (uint)!bVar184 * auVar302._28_4_
                ;
                bVar16 = (byte)(uVar146 >> 8);
                bVar184 = (bool)(bVar16 & 1);
                auVar303._32_4_ = (uint)bVar184 * auVar300._32_4_ | (uint)!bVar184 * auVar302._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar303._36_4_ = (uint)bVar184 * auVar300._36_4_ | (uint)!bVar184 * auVar302._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar303._40_4_ = (uint)bVar184 * auVar300._40_4_ | (uint)!bVar184 * auVar302._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar303._44_4_ = (uint)bVar184 * auVar300._44_4_ | (uint)!bVar184 * auVar302._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar303._48_4_ = (uint)bVar184 * auVar300._48_4_ | (uint)!bVar184 * auVar302._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar303._52_4_ = (uint)bVar184 * auVar300._52_4_ | (uint)!bVar184 * auVar302._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar303._56_4_ = (uint)bVar184 * auVar300._56_4_ | (uint)!bVar184 * auVar302._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar303._60_4_ = (uint)bVar184 * auVar300._60_4_ | (uint)!bVar184 * auVar302._60_4_
                ;
                auVar300 = vmulps_avx512f(auVar303,auVar303);
                auVar302 = vfmadd132ps_avx512f(auVar303,(undefined1  [64])_ps512_cephes_log_p1,
                                               (undefined1  [64])_ps512_cephes_log_p0);
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar303,
                                               (undefined1  [64])_ps512_cephes_log_p2);
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar303,
                                               (undefined1  [64])_ps512_cephes_log_p3);
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar303,
                                               (undefined1  [64])_ps512_cephes_log_p4);
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar303,
                                               (undefined1  [64])_ps512_cephes_log_p5);
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar303,
                                               (undefined1  [64])_ps512_cephes_log_p6);
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar303,
                                               (undefined1  [64])_ps512_cephes_log_p7);
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar303,
                                               (undefined1  [64])_ps512_cephes_log_p8);
                auVar304 = vmulps_avx512f(auVar300,auVar303);
                auVar302 = vfmadd213ps_avx512f(auVar304,auVar302,auVar303);
                uVar177 = vcmpps_avx512f(auVar299,in_ZMM29,2);
                auVar299 = vpsubd_avx512f(auVar301,auVar298);
                auVar299 = vcvtdq2ps_avx512f(auVar299);
                auVar301 = vaddps_avx512f(auVar299,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar304._0_4_ = (uint)bVar184 * auVar299._0_4_ | (uint)!bVar184 * auVar301._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar304._4_4_ = (uint)bVar184 * auVar299._4_4_ | (uint)!bVar184 * auVar301._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar304._8_4_ = (uint)bVar184 * auVar299._8_4_ | (uint)!bVar184 * auVar301._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar304._12_4_ = (uint)bVar184 * auVar299._12_4_ | (uint)!bVar184 * auVar301._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar304._16_4_ = (uint)bVar184 * auVar299._16_4_ | (uint)!bVar184 * auVar301._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar304._20_4_ = (uint)bVar184 * auVar299._20_4_ | (uint)!bVar184 * auVar301._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar304._24_4_ = (uint)bVar184 * auVar299._24_4_ | (uint)!bVar184 * auVar301._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar304._28_4_ = (uint)bVar184 * auVar299._28_4_ | (uint)!bVar184 * auVar301._28_4_
                ;
                bVar184 = (bool)(bVar16 & 1);
                auVar304._32_4_ = (uint)bVar184 * auVar299._32_4_ | (uint)!bVar184 * auVar301._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar304._36_4_ = (uint)bVar184 * auVar299._36_4_ | (uint)!bVar184 * auVar301._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar304._40_4_ = (uint)bVar184 * auVar299._40_4_ | (uint)!bVar184 * auVar301._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar304._44_4_ = (uint)bVar184 * auVar299._44_4_ | (uint)!bVar184 * auVar301._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar304._48_4_ = (uint)bVar184 * auVar299._48_4_ | (uint)!bVar184 * auVar301._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar304._52_4_ = (uint)bVar184 * auVar299._52_4_ | (uint)!bVar184 * auVar301._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar304._56_4_ = (uint)bVar184 * auVar299._56_4_ | (uint)!bVar184 * auVar301._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar304._60_4_ = (uint)bVar184 * auVar299._60_4_ | (uint)!bVar184 * auVar301._60_4_
                ;
                auVar299 = vfmadd231ps_avx512f(auVar302,auVar304,
                                               (undefined1  [64])_ps512_cephes_log_q1);
                auVar299 = vfmadd231ps_avx512f(auVar299,auVar300,local_168);
                auVar299 = vfmadd231ps_avx512f(auVar299,auVar304,
                                               (undefined1  [64])_ps512_cephes_log_q2);
                auVar300 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
                auVar299 = vmulps_avx512f(auVar299,auVar300);
                auVar301 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar302._0_4_ = (uint)bVar184 * auVar301._0_4_ | (uint)!bVar184 * auVar299._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar302._4_4_ = (uint)bVar184 * auVar301._4_4_ | (uint)!bVar184 * auVar299._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar302._8_4_ = (uint)bVar184 * auVar301._8_4_ | (uint)!bVar184 * auVar299._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar302._12_4_ = (uint)bVar184 * auVar301._12_4_ | (uint)!bVar184 * auVar299._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar302._16_4_ = (uint)bVar184 * auVar301._16_4_ | (uint)!bVar184 * auVar299._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar302._20_4_ = (uint)bVar184 * auVar301._20_4_ | (uint)!bVar184 * auVar299._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar302._24_4_ = (uint)bVar184 * auVar301._24_4_ | (uint)!bVar184 * auVar299._24_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 7) & 1);
                auVar302._28_4_ = (uint)bVar184 * auVar301._28_4_ | (uint)!bVar184 * auVar299._28_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 8) & 1);
                auVar302._32_4_ = (uint)bVar184 * auVar301._32_4_ | (uint)!bVar184 * auVar299._32_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 9) & 1);
                auVar302._36_4_ = (uint)bVar184 * auVar301._36_4_ | (uint)!bVar184 * auVar299._36_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 10) & 1);
                auVar302._40_4_ = (uint)bVar184 * auVar301._40_4_ | (uint)!bVar184 * auVar299._40_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xb) & 1);
                auVar302._44_4_ = (uint)bVar184 * auVar301._44_4_ | (uint)!bVar184 * auVar299._44_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xc) & 1);
                auVar302._48_4_ = (uint)bVar184 * auVar301._48_4_ | (uint)!bVar184 * auVar299._48_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xd) & 1);
                auVar302._52_4_ = (uint)bVar184 * auVar301._52_4_ | (uint)!bVar184 * auVar299._52_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xe) & 1);
                auVar302._56_4_ = (uint)bVar184 * auVar301._56_4_ | (uint)!bVar184 * auVar299._56_4_
                ;
                bVar184 = SUB81(uVar177 >> 0xf,0);
                auVar302._60_4_ = (uint)bVar184 * auVar301._60_4_ | (uint)!bVar184 * auVar299._60_4_
                ;
                auVar299 = vminps_avx512f(auVar302,(undefined1  [64])afVar121);
                auVar299 = vmaxps_avx512f(auVar299,(undefined1  [64])afVar122);
                auVar301 = vfmadd213ps_avx512f((undefined1  [64])afVar123,auVar299,
                                               (undefined1  [64])afVar129);
                auVar302 = vrndscaleps_avx512f(auVar301,1);
                uVar146 = vcmpps_avx512f(auVar301,auVar302,1);
                auVar301 = vsubps_avx512f(auVar302,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar305._0_4_ = (uint)bVar184 * auVar301._0_4_ | (uint)!bVar184 * auVar302._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar305._4_4_ = (uint)bVar184 * auVar301._4_4_ | (uint)!bVar184 * auVar302._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar305._8_4_ = (uint)bVar184 * auVar301._8_4_ | (uint)!bVar184 * auVar302._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar305._12_4_ = (uint)bVar184 * auVar301._12_4_ | (uint)!bVar184 * auVar302._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar305._16_4_ = (uint)bVar184 * auVar301._16_4_ | (uint)!bVar184 * auVar302._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar305._20_4_ = (uint)bVar184 * auVar301._20_4_ | (uint)!bVar184 * auVar302._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar305._24_4_ = (uint)bVar184 * auVar301._24_4_ | (uint)!bVar184 * auVar302._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar305._28_4_ = (uint)bVar184 * auVar301._28_4_ | (uint)!bVar184 * auVar302._28_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 8) & 1);
                auVar305._32_4_ = (uint)bVar184 * auVar301._32_4_ | (uint)!bVar184 * auVar302._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar305._36_4_ = (uint)bVar184 * auVar301._36_4_ | (uint)!bVar184 * auVar302._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar305._40_4_ = (uint)bVar184 * auVar301._40_4_ | (uint)!bVar184 * auVar302._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar305._44_4_ = (uint)bVar184 * auVar301._44_4_ | (uint)!bVar184 * auVar302._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar305._48_4_ = (uint)bVar184 * auVar301._48_4_ | (uint)!bVar184 * auVar302._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar305._52_4_ = (uint)bVar184 * auVar301._52_4_ | (uint)!bVar184 * auVar302._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar305._56_4_ = (uint)bVar184 * auVar301._56_4_ | (uint)!bVar184 * auVar302._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar305._60_4_ = (uint)bVar184 * auVar301._60_4_ | (uint)!bVar184 * auVar302._60_4_
                ;
                auVar299 = vfmadd231ps_avx512f(auVar299,auVar305,auVar296);
                auVar299 = vfmadd231ps_avx512f(auVar299,auVar305,auVar297);
                auVar301 = vmulps_avx512f(auVar299,auVar299);
                auVar302 = vfmadd213ps_avx512f(auVar299,(undefined1  [64])afVar124,
                                               (undefined1  [64])afVar125);
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar299,(undefined1  [64])afVar126);
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar299,(undefined1  [64])afVar127);
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar299,(undefined1  [64])afVar128);
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar299,(undefined1  [64])afVar129);
                auVar299 = vfmadd213ps_avx512f(auVar302,auVar301,auVar299);
                auVar299 = vaddps_avx512f(auVar299,(undefined1  [64])afVar120);
                auVar301 = vcvttps2dq_avx512f(auVar305);
                auVar301 = vpaddd_avx512f(auVar301,auVar298);
                auVar301 = vpslld_avx512f(auVar301,0x17);
                auVar299 = vfmadd213ps_avx512f(auVar301,auVar299,auVar333);
                auVar299 = vdivps_avx512f(auVar333,auVar299);
                auVar299 = vfnmsub213ps_avx512f(auVar299,auVar300,auVar333);
                goto LAB_00268bbd;
              case 6:
                puVar11 = (uint *)(this->super_Deconvolution).activation_params.data;
                auVar300 = vbroadcastss_avx512f(ZEXT416(*puVar11));
                uVar170 = puVar11[1];
                auVar299._4_4_ = uVar170;
                auVar299._0_4_ = uVar170;
                auVar299._8_4_ = uVar170;
                auVar299._12_4_ = uVar170;
                auVar299._16_4_ = uVar170;
                auVar299._20_4_ = uVar170;
                auVar299._24_4_ = uVar170;
                auVar299._28_4_ = uVar170;
                auVar299._32_4_ = uVar170;
                auVar299._36_4_ = uVar170;
                auVar299._40_4_ = uVar170;
                auVar299._44_4_ = uVar170;
                auVar299._48_4_ = uVar170;
                auVar299._52_4_ = uVar170;
                auVar299._56_4_ = uVar170;
                auVar299._60_4_ = uVar170;
                auVar299 = vfmadd213ps_avx512f(auVar300,auVar315,auVar299);
                auVar299 = vmaxps_avx512f(auVar299,in_ZMM29);
                auVar299 = vminps_avx512f(auVar299,auVar333);
LAB_00268bbd:
                auVar315 = vmulps_avx512f(auVar299,auVar315);
              }
              *pauVar168 = auVar315;
              pauVar168 = pauVar168 + 1;
              iVar144 = iVar144 + 1;
            }
            uVar146 = (ulong)(uVar180 + 1);
          }
        }
      }
      afVar134 = _ps512_cephes_log_p8;
      afVar133 = _ps512_cephes_log_p7;
      afVar132 = _ps512_cephes_log_p6;
      afVar131 = _ps512_cephes_log_p5;
      afVar130 = _ps512_cephes_log_p4;
      afVar129 = ::_ps512_cephes_exp_p5;
      afVar128 = ::_ps512_cephes_exp_p4;
      afVar127 = ::_ps512_cephes_exp_p3;
      afVar126 = ::_ps512_cephes_exp_p2;
      afVar125 = ::_ps512_cephes_exp_p1;
      afVar124 = ::_ps512_cephes_exp_p0;
      afVar123 = ::_ps512_cephes_LOG2EF;
      afVar122 = ::_ps512_exp_lo;
      afVar121 = ::_ps512_exp_hi;
      afVar120 = ::_ps512_1;
      if ((iVar174 == 8) && (uVar151 == 0x10)) {
        uVar157 = (this->super_Deconvolution).kernel_w;
        uVar160 = (this->super_Deconvolution).kernel_h;
        iVar139 = (this->super_Deconvolution).dilation_w;
        iVar138 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar152 = (this->super_Deconvolution).stride_h;
        iVar153 = (this->super_Deconvolution).activation_type;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        auVar333 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar296 = vxorps_avx512dq(auVar333,(undefined1  [64])_ps512_cephes_log_q2);
        auVar297 = vxorps_avx512dq(auVar333,(undefined1  [64])_ps512_cephes_log_q1);
        auVar298 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar315 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar333);
        uVar165 = 0;
        if (0 < (int)uVar157) {
          uVar165 = (ulong)uVar157;
        }
        uVar166 = 0;
        if (0 < (int)uVar160) {
          uVar166 = (ulong)uVar160;
        }
        uVar154 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar154 = 0;
        }
        uVar178 = 0;
        auVar185 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
        in_ZMM29 = ZEXT1664(auVar185);
        auVar299 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar300 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
        for (; uVar178 != uVar154; uVar178 = uVar178 + 1) {
          local_2a8 = (undefined1 (*) [64])
                      (local_1e8.cstep * uVar178 * local_1e8.elemsize + (long)local_1e8.data);
          iVar8 = bottom_blob->w;
          iVar7 = bottom_blob->h;
          uVar159 = 0;
          uVar158 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar158 = uVar159;
          }
          uVar180 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar180 = 0;
          }
          uVar142 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar142 = 0;
          }
          local_168._0_4_ = uVar142;
          for (; uVar159 != uVar142; uVar159 = uVar159 + 1) {
            iVar144 = (1 - uVar157) * iVar139;
            for (uVar170 = 0; uVar170 != uVar180; uVar170 = uVar170 + 1) {
              if (pvVar14 == (void *)0x0) {
                auVar301 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar301 = *(undefined1 (*) [64])((long)pvVar14 + uVar178 * 0x40);
              }
              pvVar179 = bottom_blob->data;
              lVar150 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar178 * (this->weight_data_tm).elemsize +
                        0x1c0;
              for (uVar146 = 0; uVar146 != uVar158; uVar146 = uVar146 + 1) {
                lVar155 = lVar150;
                for (uVar177 = 0; uVar177 != uVar166; uVar177 = uVar177 + 1) {
                  iVar140 = (((int)uVar177 - uVar160) + 1) * iVar138 + uVar159;
                  if (((-1 < iVar140) && (iVar141 = iVar140 / iVar152, iVar140 % iVar152 == 0)) &&
                     (iVar141 < iVar7)) {
                    lVar119 = (long)iVar141 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar146;
                    iVar140 = iVar144;
                    for (lVar164 = 0; uVar165 * 0x200 != lVar164; lVar164 = lVar164 + 0x200) {
                      if (((-1 < iVar140) && (iVar141 = iVar140 / iVar156, iVar140 % iVar156 == 0))
                         && (iVar141 < iVar8)) {
                        lVar145 = (long)(iVar141 << 3);
                        auVar302 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119)));
                        auVar303 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 4)));
                        auVar304 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 8)));
                        auVar305 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0xc)));
                        auVar306 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x10)));
                        auVar307 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x14)));
                        auVar308 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x18)));
                        auVar309 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x1c)));
                        auVar301 = vfmadd231ps_avx512f(auVar301,auVar302,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x1c0 + lVar164));
                        auVar301 = vfmadd231ps_avx512f(auVar301,auVar303,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x180 + lVar164));
                        auVar301 = vfmadd231ps_avx512f(auVar301,auVar304,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x140 + lVar164));
                        auVar301 = vfmadd231ps_avx512f(auVar301,auVar305,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x100 + lVar164));
                        auVar301 = vfmadd231ps_avx512f(auVar301,auVar306,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0xc0 + lVar164));
                        auVar301 = vfmadd231ps_avx512f(auVar301,auVar307,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x80 + lVar164));
                        auVar301 = vfmadd231ps_avx512f(auVar301,auVar308,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x40 + lVar164));
                        auVar301 = vfmadd231ps_avx512f(auVar301,auVar309,
                                                       *(undefined1 (*) [64])(lVar155 + lVar164));
                      }
                      iVar140 = iVar140 + iVar139;
                    }
                  }
                  lVar155 = lVar155 + (long)(int)uVar157 * 0x200;
                }
                lVar150 = lVar150 + (long)(int)(uVar157 * uVar160 * 0x80) * 4;
              }
              auVar310 = auVar301;
              switch(iVar153) {
              case 1:
                auVar310 = vmaxps_avx512f(auVar301,in_ZMM29);
                break;
              case 2:
                uVar146 = vcmpps_avx512f(auVar301,in_ZMM29,1);
                uVar335 = *(this->super_Deconvolution).activation_params.data;
                auVar101._4_4_ = uVar335;
                auVar101._0_4_ = uVar335;
                auVar101._8_4_ = uVar335;
                auVar101._12_4_ = uVar335;
                auVar101._16_4_ = uVar335;
                auVar101._20_4_ = uVar335;
                auVar101._24_4_ = uVar335;
                auVar101._28_4_ = uVar335;
                auVar101._32_4_ = uVar335;
                auVar101._36_4_ = uVar335;
                auVar101._40_4_ = uVar335;
                auVar101._44_4_ = uVar335;
                auVar101._48_4_ = uVar335;
                auVar101._52_4_ = uVar335;
                auVar101._56_4_ = uVar335;
                auVar101._60_4_ = uVar335;
                auVar302 = vmulps_avx512f(auVar301,auVar101);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar310._0_4_ = (uint)bVar184 * auVar302._0_4_ | (uint)!bVar184 * auVar301._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar310._4_4_ = (uint)bVar184 * auVar302._4_4_ | (uint)!bVar184 * auVar301._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar310._8_4_ = (uint)bVar184 * auVar302._8_4_ | (uint)!bVar184 * auVar301._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar310._12_4_ = (uint)bVar184 * auVar302._12_4_ | (uint)!bVar184 * auVar301._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar310._16_4_ = (uint)bVar184 * auVar302._16_4_ | (uint)!bVar184 * auVar301._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar310._20_4_ = (uint)bVar184 * auVar302._20_4_ | (uint)!bVar184 * auVar301._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar310._24_4_ = (uint)bVar184 * auVar302._24_4_ | (uint)!bVar184 * auVar301._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar310._28_4_ = (uint)bVar184 * auVar302._28_4_ | (uint)!bVar184 * auVar301._28_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 8) & 1);
                auVar310._32_4_ = (uint)bVar184 * auVar302._32_4_ | (uint)!bVar184 * auVar301._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar310._36_4_ = (uint)bVar184 * auVar302._36_4_ | (uint)!bVar184 * auVar301._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar310._40_4_ = (uint)bVar184 * auVar302._40_4_ | (uint)!bVar184 * auVar301._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar310._44_4_ = (uint)bVar184 * auVar302._44_4_ | (uint)!bVar184 * auVar301._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar310._48_4_ = (uint)bVar184 * auVar302._48_4_ | (uint)!bVar184 * auVar301._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar310._52_4_ = (uint)bVar184 * auVar302._52_4_ | (uint)!bVar184 * auVar301._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar310._56_4_ = (uint)bVar184 * auVar302._56_4_ | (uint)!bVar184 * auVar301._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar310._60_4_ = (uint)bVar184 * auVar302._60_4_ | (uint)!bVar184 * auVar301._60_4_
                ;
                break;
              case 3:
                puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar335 = *puVar10;
                auVar99._4_4_ = uVar335;
                auVar99._0_4_ = uVar335;
                auVar99._8_4_ = uVar335;
                auVar99._12_4_ = uVar335;
                auVar99._16_4_ = uVar335;
                auVar99._20_4_ = uVar335;
                auVar99._24_4_ = uVar335;
                auVar99._28_4_ = uVar335;
                auVar99._32_4_ = uVar335;
                auVar99._36_4_ = uVar335;
                auVar99._40_4_ = uVar335;
                auVar99._44_4_ = uVar335;
                auVar99._48_4_ = uVar335;
                auVar99._52_4_ = uVar335;
                auVar99._56_4_ = uVar335;
                auVar99._60_4_ = uVar335;
                auVar301 = vmaxps_avx512f(auVar301,auVar99);
                uVar335 = puVar10[1];
                auVar100._4_4_ = uVar335;
                auVar100._0_4_ = uVar335;
                auVar100._8_4_ = uVar335;
                auVar100._12_4_ = uVar335;
                auVar100._16_4_ = uVar335;
                auVar100._20_4_ = uVar335;
                auVar100._24_4_ = uVar335;
                auVar100._28_4_ = uVar335;
                auVar100._32_4_ = uVar335;
                auVar100._36_4_ = uVar335;
                auVar100._40_4_ = uVar335;
                auVar100._44_4_ = uVar335;
                auVar100._48_4_ = uVar335;
                auVar100._52_4_ = uVar335;
                auVar100._56_4_ = uVar335;
                auVar100._60_4_ = uVar335;
                auVar310 = vminps_avx512f(auVar301,auVar100);
                break;
              case 4:
                auVar301 = vxorps_avx512dq(auVar301,auVar333);
                auVar301 = vminps_avx512f(auVar301,(undefined1  [64])afVar121);
                auVar301 = vmaxps_avx512f(auVar301,(undefined1  [64])afVar122);
                auVar302 = vfmadd213ps_avx512f((undefined1  [64])afVar123,auVar301,
                                               (undefined1  [64])afVar129);
                auVar303 = vrndscaleps_avx512f(auVar302,1);
                uVar146 = vcmpps_avx512f(auVar302,auVar303,1);
                auVar302 = vsubps_avx512f(auVar303,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar318._0_4_ = (uint)bVar184 * auVar302._0_4_ | (uint)!bVar184 * auVar303._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar318._4_4_ = (uint)bVar184 * auVar302._4_4_ | (uint)!bVar184 * auVar303._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar318._8_4_ = (uint)bVar184 * auVar302._8_4_ | (uint)!bVar184 * auVar303._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar318._12_4_ = (uint)bVar184 * auVar302._12_4_ | (uint)!bVar184 * auVar303._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar318._16_4_ = (uint)bVar184 * auVar302._16_4_ | (uint)!bVar184 * auVar303._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar318._20_4_ = (uint)bVar184 * auVar302._20_4_ | (uint)!bVar184 * auVar303._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar318._24_4_ = (uint)bVar184 * auVar302._24_4_ | (uint)!bVar184 * auVar303._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar318._28_4_ = (uint)bVar184 * auVar302._28_4_ | (uint)!bVar184 * auVar303._28_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 8) & 1);
                auVar318._32_4_ = (uint)bVar184 * auVar302._32_4_ | (uint)!bVar184 * auVar303._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar318._36_4_ = (uint)bVar184 * auVar302._36_4_ | (uint)!bVar184 * auVar303._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar318._40_4_ = (uint)bVar184 * auVar302._40_4_ | (uint)!bVar184 * auVar303._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar318._44_4_ = (uint)bVar184 * auVar302._44_4_ | (uint)!bVar184 * auVar303._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar318._48_4_ = (uint)bVar184 * auVar302._48_4_ | (uint)!bVar184 * auVar303._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar318._52_4_ = (uint)bVar184 * auVar302._52_4_ | (uint)!bVar184 * auVar303._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar318._56_4_ = (uint)bVar184 * auVar302._56_4_ | (uint)!bVar184 * auVar303._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar318._60_4_ = (uint)bVar184 * auVar302._60_4_ | (uint)!bVar184 * auVar303._60_4_
                ;
                auVar301 = vfmadd231ps_avx512f(auVar301,auVar318,auVar296);
                auVar301 = vfmadd231ps_avx512f(auVar301,auVar318,auVar297);
                auVar302 = vmulps_avx512f(auVar301,auVar301);
                auVar303 = vfmadd213ps_avx512f(auVar301,(undefined1  [64])afVar124,
                                               (undefined1  [64])afVar125);
                auVar303 = vfmadd213ps_avx512f(auVar303,auVar301,(undefined1  [64])afVar126);
                auVar303 = vfmadd213ps_avx512f(auVar303,auVar301,(undefined1  [64])afVar127);
                auVar303 = vfmadd213ps_avx512f(auVar303,auVar301,(undefined1  [64])afVar128);
                auVar303 = vfmadd213ps_avx512f(auVar303,auVar301,(undefined1  [64])afVar129);
                auVar301 = vfmadd213ps_avx512f(auVar303,auVar302,auVar301);
                auVar301 = vaddps_avx512f(auVar301,(undefined1  [64])afVar120);
                auVar302 = vcvttps2dq_avx512f(auVar318);
                auVar302 = vpaddd_avx512f(auVar302,auVar298);
                auVar302 = vpslld_avx512f(auVar302,0x17);
                auVar301 = vfmadd213ps_avx512f(auVar302,auVar301,auVar299);
                auVar310 = vdivps_avx512f(auVar299,auVar301);
                break;
              case 5:
                auVar302 = vminps_avx512f(auVar301,(undefined1  [64])afVar121);
                auVar302 = vmaxps_avx512f(auVar302,(undefined1  [64])afVar122);
                auVar303 = vfmadd213ps_avx512f((undefined1  [64])afVar123,auVar302,
                                               (undefined1  [64])afVar129);
                auVar304 = vrndscaleps_avx512f(auVar303,1);
                uVar146 = vcmpps_avx512f(auVar303,auVar304,1);
                auVar303 = vsubps_avx512f(auVar304,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar312._0_4_ = (uint)bVar184 * auVar303._0_4_ | (uint)!bVar184 * auVar304._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar312._4_4_ = (uint)bVar184 * auVar303._4_4_ | (uint)!bVar184 * auVar304._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar312._8_4_ = (uint)bVar184 * auVar303._8_4_ | (uint)!bVar184 * auVar304._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar312._12_4_ = (uint)bVar184 * auVar303._12_4_ | (uint)!bVar184 * auVar304._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar312._16_4_ = (uint)bVar184 * auVar303._16_4_ | (uint)!bVar184 * auVar304._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar312._20_4_ = (uint)bVar184 * auVar303._20_4_ | (uint)!bVar184 * auVar304._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar312._24_4_ = (uint)bVar184 * auVar303._24_4_ | (uint)!bVar184 * auVar304._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar312._28_4_ = (uint)bVar184 * auVar303._28_4_ | (uint)!bVar184 * auVar304._28_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 8) & 1);
                auVar312._32_4_ = (uint)bVar184 * auVar303._32_4_ | (uint)!bVar184 * auVar304._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar312._36_4_ = (uint)bVar184 * auVar303._36_4_ | (uint)!bVar184 * auVar304._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar312._40_4_ = (uint)bVar184 * auVar303._40_4_ | (uint)!bVar184 * auVar304._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar312._44_4_ = (uint)bVar184 * auVar303._44_4_ | (uint)!bVar184 * auVar304._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar312._48_4_ = (uint)bVar184 * auVar303._48_4_ | (uint)!bVar184 * auVar304._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar312._52_4_ = (uint)bVar184 * auVar303._52_4_ | (uint)!bVar184 * auVar304._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar312._56_4_ = (uint)bVar184 * auVar303._56_4_ | (uint)!bVar184 * auVar304._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar312._60_4_ = (uint)bVar184 * auVar303._60_4_ | (uint)!bVar184 * auVar304._60_4_
                ;
                auVar302 = vfmadd231ps_avx512f(auVar302,auVar312,auVar296);
                auVar302 = vfmadd231ps_avx512f(auVar302,auVar312,auVar297);
                auVar303 = vmulps_avx512f(auVar302,auVar302);
                auVar304 = vfmadd213ps_avx512f(auVar302,(undefined1  [64])afVar124,
                                               (undefined1  [64])afVar125);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar126);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar127);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar128);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar129);
                auVar302 = vfmadd213ps_avx512f(auVar304,auVar303,auVar302);
                auVar302 = vaddps_avx512f(auVar302,(undefined1  [64])afVar120);
                auVar303 = vcvttps2dq_avx512f(auVar312);
                auVar303 = vpaddd_avx512f(auVar303,auVar298);
                auVar303 = vpslld_avx512f(auVar303,0x17);
                auVar302 = vfmadd213ps_avx512f(auVar303,auVar302,auVar299);
                auVar303 = vmaxps_avx512f(auVar302,(undefined1  [64])_ps512_min_norm_pos);
                auVar304 = vpsrld_avx512f(auVar303,0x17);
                auVar303 = vpternlogd_avx512f(auVar303,(undefined1  [64])afVar129,
                                              (undefined1  [64])_ps512_inv_mant_mask,0xec);
                uVar146 = vcmpps_avx512f(auVar303,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                auVar305 = vsubps_avx512f(auVar303,(undefined1  [64])afVar120);
                auVar303 = vaddps_avx512f(auVar305,auVar303);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar313._0_4_ = (uint)bVar184 * auVar303._0_4_ | (uint)!bVar184 * auVar305._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar313._4_4_ = (uint)bVar184 * auVar303._4_4_ | (uint)!bVar184 * auVar305._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar313._8_4_ = (uint)bVar184 * auVar303._8_4_ | (uint)!bVar184 * auVar305._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar313._12_4_ = (uint)bVar184 * auVar303._12_4_ | (uint)!bVar184 * auVar305._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar313._16_4_ = (uint)bVar184 * auVar303._16_4_ | (uint)!bVar184 * auVar305._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar313._20_4_ = (uint)bVar184 * auVar303._20_4_ | (uint)!bVar184 * auVar305._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar313._24_4_ = (uint)bVar184 * auVar303._24_4_ | (uint)!bVar184 * auVar305._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar313._28_4_ = (uint)bVar184 * auVar303._28_4_ | (uint)!bVar184 * auVar305._28_4_
                ;
                bVar16 = (byte)(uVar146 >> 8);
                bVar184 = (bool)(bVar16 & 1);
                auVar313._32_4_ = (uint)bVar184 * auVar303._32_4_ | (uint)!bVar184 * auVar305._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar313._36_4_ = (uint)bVar184 * auVar303._36_4_ | (uint)!bVar184 * auVar305._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar313._40_4_ = (uint)bVar184 * auVar303._40_4_ | (uint)!bVar184 * auVar305._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar313._44_4_ = (uint)bVar184 * auVar303._44_4_ | (uint)!bVar184 * auVar305._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar313._48_4_ = (uint)bVar184 * auVar303._48_4_ | (uint)!bVar184 * auVar305._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar313._52_4_ = (uint)bVar184 * auVar303._52_4_ | (uint)!bVar184 * auVar305._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar313._56_4_ = (uint)bVar184 * auVar303._56_4_ | (uint)!bVar184 * auVar305._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar313._60_4_ = (uint)bVar184 * auVar303._60_4_ | (uint)!bVar184 * auVar305._60_4_
                ;
                auVar303 = vmulps_avx512f(auVar313,auVar313);
                auVar305 = vfmadd132ps_avx512f(auVar313,(undefined1  [64])_ps512_cephes_log_p1,
                                               (undefined1  [64])_ps512_cephes_log_p0);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar313,
                                               (undefined1  [64])_ps512_cephes_log_p2);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar313,
                                               (undefined1  [64])_ps512_cephes_log_p3);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar313,(undefined1  [64])afVar130);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar313,(undefined1  [64])afVar131);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar313,(undefined1  [64])afVar132);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar313,(undefined1  [64])afVar133);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar313,(undefined1  [64])afVar134);
                auVar306 = vmulps_avx512f(auVar303,auVar313);
                auVar305 = vfmadd213ps_avx512f(auVar306,auVar305,auVar313);
                uVar177 = vcmpps_avx512f(auVar302,in_ZMM29,2);
                auVar302 = vpsubd_avx512f(auVar304,auVar298);
                auVar302 = vcvtdq2ps_avx512f(auVar302);
                auVar304 = vaddps_avx512f(auVar302,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar314._0_4_ = (uint)bVar184 * auVar302._0_4_ | (uint)!bVar184 * auVar304._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar314._4_4_ = (uint)bVar184 * auVar302._4_4_ | (uint)!bVar184 * auVar304._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar314._8_4_ = (uint)bVar184 * auVar302._8_4_ | (uint)!bVar184 * auVar304._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar314._12_4_ = (uint)bVar184 * auVar302._12_4_ | (uint)!bVar184 * auVar304._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar314._16_4_ = (uint)bVar184 * auVar302._16_4_ | (uint)!bVar184 * auVar304._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar314._20_4_ = (uint)bVar184 * auVar302._20_4_ | (uint)!bVar184 * auVar304._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar314._24_4_ = (uint)bVar184 * auVar302._24_4_ | (uint)!bVar184 * auVar304._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar314._28_4_ = (uint)bVar184 * auVar302._28_4_ | (uint)!bVar184 * auVar304._28_4_
                ;
                bVar184 = (bool)(bVar16 & 1);
                auVar314._32_4_ = (uint)bVar184 * auVar302._32_4_ | (uint)!bVar184 * auVar304._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar314._36_4_ = (uint)bVar184 * auVar302._36_4_ | (uint)!bVar184 * auVar304._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar314._40_4_ = (uint)bVar184 * auVar302._40_4_ | (uint)!bVar184 * auVar304._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar314._44_4_ = (uint)bVar184 * auVar302._44_4_ | (uint)!bVar184 * auVar304._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar314._48_4_ = (uint)bVar184 * auVar302._48_4_ | (uint)!bVar184 * auVar304._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar314._52_4_ = (uint)bVar184 * auVar302._52_4_ | (uint)!bVar184 * auVar304._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar314._56_4_ = (uint)bVar184 * auVar302._56_4_ | (uint)!bVar184 * auVar304._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar314._60_4_ = (uint)bVar184 * auVar302._60_4_ | (uint)!bVar184 * auVar304._60_4_
                ;
                auVar302 = vfmadd231ps_avx512f(auVar305,auVar314,
                                               (undefined1  [64])_ps512_cephes_log_q1);
                auVar302 = vfmadd231ps_avx512f(auVar302,auVar315,auVar303);
                auVar302 = vfmadd231ps_avx512f(auVar302,auVar314,
                                               (undefined1  [64])_ps512_cephes_log_q2);
                auVar302 = vmulps_avx512f(auVar302,auVar300);
                auVar303 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar316._0_4_ = (uint)bVar184 * auVar303._0_4_ | (uint)!bVar184 * auVar302._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar316._4_4_ = (uint)bVar184 * auVar303._4_4_ | (uint)!bVar184 * auVar302._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar316._8_4_ = (uint)bVar184 * auVar303._8_4_ | (uint)!bVar184 * auVar302._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar316._12_4_ = (uint)bVar184 * auVar303._12_4_ | (uint)!bVar184 * auVar302._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar316._16_4_ = (uint)bVar184 * auVar303._16_4_ | (uint)!bVar184 * auVar302._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar316._20_4_ = (uint)bVar184 * auVar303._20_4_ | (uint)!bVar184 * auVar302._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar316._24_4_ = (uint)bVar184 * auVar303._24_4_ | (uint)!bVar184 * auVar302._24_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 7) & 1);
                auVar316._28_4_ = (uint)bVar184 * auVar303._28_4_ | (uint)!bVar184 * auVar302._28_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 8) & 1);
                auVar316._32_4_ = (uint)bVar184 * auVar303._32_4_ | (uint)!bVar184 * auVar302._32_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 9) & 1);
                auVar316._36_4_ = (uint)bVar184 * auVar303._36_4_ | (uint)!bVar184 * auVar302._36_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 10) & 1);
                auVar316._40_4_ = (uint)bVar184 * auVar303._40_4_ | (uint)!bVar184 * auVar302._40_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xb) & 1);
                auVar316._44_4_ = (uint)bVar184 * auVar303._44_4_ | (uint)!bVar184 * auVar302._44_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xc) & 1);
                auVar316._48_4_ = (uint)bVar184 * auVar303._48_4_ | (uint)!bVar184 * auVar302._48_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xd) & 1);
                auVar316._52_4_ = (uint)bVar184 * auVar303._52_4_ | (uint)!bVar184 * auVar302._52_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xe) & 1);
                auVar316._56_4_ = (uint)bVar184 * auVar303._56_4_ | (uint)!bVar184 * auVar302._56_4_
                ;
                bVar184 = SUB81(uVar177 >> 0xf,0);
                auVar316._60_4_ = (uint)bVar184 * auVar303._60_4_ | (uint)!bVar184 * auVar302._60_4_
                ;
                auVar302 = vminps_avx512f(auVar316,(undefined1  [64])afVar121);
                auVar302 = vmaxps_avx512f(auVar302,(undefined1  [64])afVar122);
                auVar303 = vfmadd213ps_avx512f((undefined1  [64])afVar123,auVar302,
                                               (undefined1  [64])afVar129);
                auVar304 = vrndscaleps_avx512f(auVar303,1);
                uVar146 = vcmpps_avx512f(auVar303,auVar304,1);
                auVar303 = vsubps_avx512f(auVar304,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar317._0_4_ = (uint)bVar184 * auVar303._0_4_ | (uint)!bVar184 * auVar304._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar317._4_4_ = (uint)bVar184 * auVar303._4_4_ | (uint)!bVar184 * auVar304._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar317._8_4_ = (uint)bVar184 * auVar303._8_4_ | (uint)!bVar184 * auVar304._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar317._12_4_ = (uint)bVar184 * auVar303._12_4_ | (uint)!bVar184 * auVar304._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar317._16_4_ = (uint)bVar184 * auVar303._16_4_ | (uint)!bVar184 * auVar304._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar317._20_4_ = (uint)bVar184 * auVar303._20_4_ | (uint)!bVar184 * auVar304._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar317._24_4_ = (uint)bVar184 * auVar303._24_4_ | (uint)!bVar184 * auVar304._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar317._28_4_ = (uint)bVar184 * auVar303._28_4_ | (uint)!bVar184 * auVar304._28_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 8) & 1);
                auVar317._32_4_ = (uint)bVar184 * auVar303._32_4_ | (uint)!bVar184 * auVar304._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar317._36_4_ = (uint)bVar184 * auVar303._36_4_ | (uint)!bVar184 * auVar304._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar317._40_4_ = (uint)bVar184 * auVar303._40_4_ | (uint)!bVar184 * auVar304._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar317._44_4_ = (uint)bVar184 * auVar303._44_4_ | (uint)!bVar184 * auVar304._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar317._48_4_ = (uint)bVar184 * auVar303._48_4_ | (uint)!bVar184 * auVar304._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar317._52_4_ = (uint)bVar184 * auVar303._52_4_ | (uint)!bVar184 * auVar304._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar317._56_4_ = (uint)bVar184 * auVar303._56_4_ | (uint)!bVar184 * auVar304._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar317._60_4_ = (uint)bVar184 * auVar303._60_4_ | (uint)!bVar184 * auVar304._60_4_
                ;
                auVar302 = vfmadd231ps_avx512f(auVar302,auVar317,auVar296);
                auVar302 = vfmadd231ps_avx512f(auVar302,auVar317,auVar297);
                auVar303 = vmulps_avx512f(auVar302,auVar302);
                auVar304 = vfmadd213ps_avx512f(auVar302,(undefined1  [64])afVar124,
                                               (undefined1  [64])afVar125);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar126);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar127);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar128);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar129);
                auVar302 = vfmadd213ps_avx512f(auVar304,auVar303,auVar302);
                auVar302 = vaddps_avx512f(auVar302,(undefined1  [64])afVar120);
                auVar303 = vcvttps2dq_avx512f(auVar317);
                auVar303 = vpaddd_avx512f(auVar303,auVar298);
                auVar303 = vpslld_avx512f(auVar303,0x17);
                auVar302 = vfmadd213ps_avx512f(auVar303,auVar302,auVar299);
                auVar302 = vdivps_avx512f(auVar299,auVar302);
                auVar302 = vfnmsub213ps_avx512f(auVar302,auVar300,auVar299);
                goto LAB_00269377;
              case 6:
                puVar11 = (uint *)(this->super_Deconvolution).activation_params.data;
                auVar302 = vbroadcastss_avx512f(ZEXT416(*puVar11));
                uVar1 = puVar11[1];
                auVar311._4_4_ = uVar1;
                auVar311._0_4_ = uVar1;
                auVar311._8_4_ = uVar1;
                auVar311._12_4_ = uVar1;
                auVar311._16_4_ = uVar1;
                auVar311._20_4_ = uVar1;
                auVar311._24_4_ = uVar1;
                auVar311._28_4_ = uVar1;
                auVar311._32_4_ = uVar1;
                auVar311._36_4_ = uVar1;
                auVar311._40_4_ = uVar1;
                auVar311._44_4_ = uVar1;
                auVar311._48_4_ = uVar1;
                auVar311._52_4_ = uVar1;
                auVar311._56_4_ = uVar1;
                auVar311._60_4_ = uVar1;
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar301,auVar311);
                auVar302 = vmaxps_avx512f(auVar302,in_ZMM29);
                auVar302 = vminps_avx512f(auVar302,auVar299);
LAB_00269377:
                auVar310 = vmulps_avx512f(auVar302,auVar301);
              }
              *local_2a8 = auVar310;
              local_2a8 = local_2a8 + 1;
              iVar144 = iVar144 + 1;
            }
          }
        }
      }
      if ((iVar174 == 0x10) && (uVar151 == 8)) {
        uVar157 = (this->super_Deconvolution).kernel_w;
        uVar160 = (this->super_Deconvolution).kernel_h;
        iVar139 = (this->super_Deconvolution).dilation_w;
        iVar138 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar152 = (this->super_Deconvolution).stride_h;
        iVar153 = (this->super_Deconvolution).activation_type;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        uVar166 = 0;
        uVar165 = 0;
        if (0 < (int)uVar157) {
          uVar165 = (ulong)uVar157;
        }
        uVar154 = 0;
        if (0 < (int)uVar160) {
          uVar154 = (ulong)uVar160;
        }
        uVar178 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar178 = uVar166;
        }
        auVar263._8_4_ = 0x42b0c0a5;
        auVar263._0_8_ = 0x42b0c0a542b0c0a5;
        auVar263._12_4_ = 0x42b0c0a5;
        auVar263._16_4_ = 0x42b0c0a5;
        auVar263._20_4_ = 0x42b0c0a5;
        auVar263._24_4_ = 0x42b0c0a5;
        auVar263._28_4_ = 0x42b0c0a5;
        auVar264._8_4_ = 0xc2b0c0a5;
        auVar264._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar264._12_4_ = 0xc2b0c0a5;
        auVar264._16_4_ = 0xc2b0c0a5;
        auVar264._20_4_ = 0xc2b0c0a5;
        auVar264._24_4_ = 0xc2b0c0a5;
        auVar264._28_4_ = 0xc2b0c0a5;
        auVar265._8_4_ = 0x3f000000;
        auVar265._0_8_ = 0x3f0000003f000000;
        auVar265._12_4_ = 0x3f000000;
        auVar265._16_4_ = 0x3f000000;
        auVar265._20_4_ = 0x3f000000;
        auVar265._24_4_ = 0x3f000000;
        auVar265._28_4_ = 0x3f000000;
        auVar266._8_4_ = 0x3fb8aa3b;
        auVar266._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar266._12_4_ = 0x3fb8aa3b;
        auVar266._16_4_ = 0x3fb8aa3b;
        auVar266._20_4_ = 0x3fb8aa3b;
        auVar266._24_4_ = 0x3fb8aa3b;
        auVar266._28_4_ = 0x3fb8aa3b;
        auVar267._8_4_ = 0x3f800000;
        auVar267._0_8_ = 0x3f8000003f800000;
        auVar267._12_4_ = 0x3f800000;
        auVar267._16_4_ = 0x3f800000;
        auVar267._20_4_ = 0x3f800000;
        auVar267._24_4_ = 0x3f800000;
        auVar267._28_4_ = 0x3f800000;
        auVar268._8_4_ = 0x3f318000;
        auVar268._0_8_ = 0x3f3180003f318000;
        auVar268._12_4_ = 0x3f318000;
        auVar268._16_4_ = 0x3f318000;
        auVar268._20_4_ = 0x3f318000;
        auVar268._24_4_ = 0x3f318000;
        auVar268._28_4_ = 0x3f318000;
        auVar241 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar269._8_4_ = 0x3ab743ce;
        auVar269._0_8_ = 0x3ab743ce3ab743ce;
        auVar269._12_4_ = 0x3ab743ce;
        auVar269._16_4_ = 0x3ab743ce;
        auVar269._20_4_ = 0x3ab743ce;
        auVar269._24_4_ = 0x3ab743ce;
        auVar269._28_4_ = 0x3ab743ce;
        auVar270._8_4_ = 0x3c088908;
        auVar270._0_8_ = 0x3c0889083c088908;
        auVar270._12_4_ = 0x3c088908;
        auVar270._16_4_ = 0x3c088908;
        auVar270._20_4_ = 0x3c088908;
        auVar270._24_4_ = 0x3c088908;
        auVar270._28_4_ = 0x3c088908;
        auVar271._8_4_ = 0x3d2aa9c1;
        auVar271._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar271._12_4_ = 0x3d2aa9c1;
        auVar271._16_4_ = 0x3d2aa9c1;
        auVar271._20_4_ = 0x3d2aa9c1;
        auVar271._24_4_ = 0x3d2aa9c1;
        auVar271._28_4_ = 0x3d2aa9c1;
        auVar272._8_4_ = 0x3e2aaaaa;
        auVar272._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar272._12_4_ = 0x3e2aaaaa;
        auVar272._16_4_ = 0x3e2aaaaa;
        auVar272._20_4_ = 0x3e2aaaaa;
        auVar272._24_4_ = 0x3e2aaaaa;
        auVar272._28_4_ = 0x3e2aaaaa;
        auVar273._8_4_ = 0x3f800000;
        auVar273._0_8_ = 0x3f8000003f800000;
        auVar273._12_4_ = 0x3f800000;
        auVar273._16_4_ = 0x3f800000;
        auVar273._20_4_ = 0x3f800000;
        auVar273._24_4_ = 0x3f800000;
        auVar273._28_4_ = 0x3f800000;
        auVar274._8_4_ = 0xb95e8083;
        auVar274._0_8_ = 0xb95e8083b95e8083;
        auVar274._12_4_ = 0xb95e8083;
        auVar274._16_4_ = 0xb95e8083;
        auVar274._20_4_ = 0xb95e8083;
        auVar274._24_4_ = 0xb95e8083;
        auVar274._28_4_ = 0xb95e8083;
        auVar242 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        for (; uVar166 != uVar178; uVar166 = uVar166 + 1) {
          local_288 = (undefined1 (*) [32])
                      (local_1e8.cstep * uVar166 * local_1e8.elemsize + (long)local_1e8.data);
          iVar8 = bottom_blob->w;
          iVar7 = bottom_blob->h;
          uVar159 = 0;
          uVar158 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar158 = uVar159;
          }
          uVar180 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar180 = uVar159;
          }
          uVar142 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar142 = uVar159;
          }
          local_168._0_4_ = uVar142;
          for (; uVar159 != uVar142; uVar159 = uVar159 + 1) {
            iVar144 = (1 - uVar157) * iVar139;
            for (uVar170 = 0; uVar170 != uVar180; uVar170 = uVar170 + 1) {
              if (pvVar14 == (void *)0x0) {
                auVar333 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar333 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar14 + uVar166 * 0x20));
              }
              pvVar179 = bottom_blob->data;
              lVar150 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar166 * (this->weight_data_tm).elemsize +
                        0x1e0;
              for (uVar146 = 0; uVar146 != uVar158; uVar146 = uVar146 + 1) {
                lVar155 = lVar150;
                for (uVar177 = 0; uVar177 != uVar154; uVar177 = uVar177 + 1) {
                  iVar140 = (((int)uVar177 - uVar160) + 1) * iVar138 + uVar159;
                  if (((-1 < iVar140) && (iVar141 = iVar140 / iVar152, iVar140 % iVar152 == 0)) &&
                     (iVar141 < iVar7)) {
                    lVar119 = (long)iVar141 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar146;
                    iVar140 = iVar144;
                    for (lVar164 = 0; uVar165 * 0x200 != lVar164; lVar164 = lVar164 + 0x200) {
                      if (((-1 < iVar140) && (iVar141 = iVar140 / iVar156, iVar140 % iVar156 == 0))
                         && (iVar141 < iVar8)) {
                        lVar145 = (long)(iVar141 << 4);
                        uVar335 = *(undefined4 *)((long)pvVar179 + lVar145 * 4 + lVar119);
                        auVar397._4_4_ = uVar335;
                        auVar397._0_4_ = uVar335;
                        auVar397._8_4_ = uVar335;
                        auVar397._12_4_ = uVar335;
                        auVar397._16_4_ = uVar335;
                        auVar397._20_4_ = uVar335;
                        auVar397._24_4_ = uVar335;
                        auVar397._28_4_ = uVar335;
                        uVar335 = *(undefined4 *)((long)pvVar179 + lVar145 * 4 + lVar119 + 4);
                        auVar419._4_4_ = uVar335;
                        auVar419._0_4_ = uVar335;
                        auVar419._8_4_ = uVar335;
                        auVar419._12_4_ = uVar335;
                        auVar419._16_4_ = uVar335;
                        auVar419._20_4_ = uVar335;
                        auVar419._24_4_ = uVar335;
                        auVar419._28_4_ = uVar335;
                        auVar243 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 8)));
                        auVar244 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0xc)));
                        auVar245 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x10)));
                        auVar246 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x14)));
                        auVar247 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x18)));
                        auVar248 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x1c)));
                        auVar249 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x20)));
                        auVar250 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x24)));
                        auVar251 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x28)));
                        auVar252 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x2c)));
                        auVar253 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x30)));
                        auVar254 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x34)));
                        in_ZMM29 = ZEXT3264(auVar254);
                        auVar255 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x38)));
                        auVar256 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x3c)));
                        auVar185 = vfmadd231ps_fma(auVar333._0_32_,auVar397,
                                                   *(undefined1 (*) [32])
                                                    (lVar155 + -0x1e0 + lVar164));
                        auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar419,
                                                   *(undefined1 (*) [32])
                                                    (lVar155 + -0x1c0 + lVar164));
                        auVar243 = vfmadd231ps_avx512vl
                                             (ZEXT1632(auVar185),auVar243,
                                              *(undefined1 (*) [32])(lVar155 + -0x1a0 + lVar164));
                        auVar243 = vfmadd231ps_avx512vl
                                             (auVar243,auVar244,
                                              *(undefined1 (*) [32])(lVar155 + -0x180 + lVar164));
                        auVar243 = vfmadd231ps_avx512vl
                                             (auVar243,auVar245,
                                              *(undefined1 (*) [32])(lVar155 + -0x160 + lVar164));
                        auVar243 = vfmadd231ps_avx512vl
                                             (auVar243,auVar246,
                                              *(undefined1 (*) [32])(lVar155 + -0x140 + lVar164));
                        auVar243 = vfmadd231ps_avx512vl
                                             (auVar243,auVar247,
                                              *(undefined1 (*) [32])(lVar155 + -0x120 + lVar164));
                        auVar243 = vfmadd231ps_avx512vl
                                             (auVar243,auVar248,
                                              *(undefined1 (*) [32])(lVar155 + -0x100 + lVar164));
                        auVar243 = vfmadd231ps_avx512vl
                                             (auVar243,auVar249,
                                              *(undefined1 (*) [32])(lVar155 + -0xe0 + lVar164));
                        auVar243 = vfmadd231ps_avx512vl
                                             (auVar243,auVar250,
                                              *(undefined1 (*) [32])(lVar155 + -0xc0 + lVar164));
                        auVar243 = vfmadd231ps_avx512vl
                                             (auVar243,auVar251,
                                              *(undefined1 (*) [32])(lVar155 + -0xa0 + lVar164));
                        auVar243 = vfmadd231ps_avx512vl
                                             (auVar243,auVar252,
                                              *(undefined1 (*) [32])(lVar155 + -0x80 + lVar164));
                        auVar243 = vfmadd231ps_avx512vl
                                             (auVar243,auVar253,
                                              *(undefined1 (*) [32])(lVar155 + -0x60 + lVar164));
                        auVar243 = vfmadd231ps_avx512vl
                                             (auVar243,auVar254,
                                              *(undefined1 (*) [32])(lVar155 + -0x40 + lVar164));
                        auVar243 = vfmadd231ps_avx512vl
                                             (auVar243,auVar255,
                                              *(undefined1 (*) [32])(lVar155 + -0x20 + lVar164));
                        auVar243 = vfmadd231ps_avx512vl
                                             (auVar243,auVar256,
                                              *(undefined1 (*) [32])(lVar155 + lVar164));
                        auVar333 = ZEXT3264(auVar243);
                      }
                      iVar140 = iVar140 + iVar139;
                    }
                  }
                  lVar155 = lVar155 + (long)(int)uVar157 * 0x200;
                }
                lVar150 = lVar150 + (long)(int)(uVar157 * uVar160 * 0x80) * 4;
              }
              auVar244 = auVar333._0_32_;
              auVar243 = auVar244;
              if (5 < iVar153 - 1U) goto switchD_00269856_caseD_1;
              auVar245 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              auVar243 = vmaxps_avx(auVar244,auVar245);
              switch(iVar153) {
              case 2:
                auVar244 = vminps_avx(auVar244,auVar245);
                uVar335 = *(this->super_Deconvolution).activation_params.data;
                auVar68._4_4_ = uVar335;
                auVar68._0_4_ = uVar335;
                auVar68._8_4_ = uVar335;
                auVar68._12_4_ = uVar335;
                auVar68._16_4_ = uVar335;
                auVar68._20_4_ = uVar335;
                auVar68._24_4_ = uVar335;
                auVar68._28_4_ = uVar335;
                auVar243 = vfmadd231ps_avx512vl(auVar243,auVar244,auVar68);
                break;
              case 3:
                puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar335 = *puVar10;
                auVar66._4_4_ = uVar335;
                auVar66._0_4_ = uVar335;
                auVar66._8_4_ = uVar335;
                auVar66._12_4_ = uVar335;
                auVar66._16_4_ = uVar335;
                auVar66._20_4_ = uVar335;
                auVar66._24_4_ = uVar335;
                auVar66._28_4_ = uVar335;
                auVar243 = vmaxps_avx512vl(auVar244,auVar66);
                uVar335 = puVar10[1];
                auVar67._4_4_ = uVar335;
                auVar67._0_4_ = uVar335;
                auVar67._8_4_ = uVar335;
                auVar67._12_4_ = uVar335;
                auVar67._16_4_ = uVar335;
                auVar67._20_4_ = uVar335;
                auVar67._24_4_ = uVar335;
                auVar67._28_4_ = uVar335;
                auVar243 = vminps_avx512vl(auVar243,auVar67);
                break;
              case 4:
                auVar64._8_4_ = 0x80000000;
                auVar64._0_8_ = 0x8000000080000000;
                auVar64._12_4_ = 0x80000000;
                auVar64._16_4_ = 0x80000000;
                auVar64._20_4_ = 0x80000000;
                auVar64._24_4_ = 0x80000000;
                auVar64._28_4_ = 0x80000000;
                auVar243 = vxorps_avx512vl(auVar244,auVar64);
                auVar243 = vminps_avx(auVar243,auVar263);
                auVar243 = vmaxps_avx(auVar243,auVar264);
                auVar185 = vfmadd231ps_fma(auVar265,auVar243,auVar266);
                auVar244 = vrndscaleps_avx512vl(ZEXT1632(auVar185),1);
                uVar146 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar244,1);
                auVar245 = vsubps_avx512vl(auVar244,auVar267);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar262._0_4_ = (uint)bVar184 * auVar245._0_4_ | (uint)!bVar184 * auVar244._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar262._4_4_ = (uint)bVar184 * auVar245._4_4_ | (uint)!bVar184 * auVar244._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar262._8_4_ = (uint)bVar184 * auVar245._8_4_ | (uint)!bVar184 * auVar244._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar262._12_4_ = (uint)bVar184 * auVar245._12_4_ | (uint)!bVar184 * auVar244._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar262._16_4_ = (uint)bVar184 * auVar245._16_4_ | (uint)!bVar184 * auVar244._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar262._20_4_ = (uint)bVar184 * auVar245._20_4_ | (uint)!bVar184 * auVar244._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar262._24_4_ = (uint)bVar184 * auVar245._24_4_ | (uint)!bVar184 * auVar244._24_4_
                ;
                bVar184 = SUB81(uVar146 >> 7,0);
                auVar262._28_4_ = (uint)bVar184 * auVar245._28_4_ | (uint)!bVar184 * auVar244._28_4_
                ;
                auVar243 = vfmsub231ps_avx512vl(auVar243,auVar262,auVar268);
                auVar65._8_4_ = 0x395e8083;
                auVar65._0_8_ = 0x395e8083395e8083;
                auVar65._12_4_ = 0x395e8083;
                auVar65._16_4_ = 0x395e8083;
                auVar65._20_4_ = 0x395e8083;
                auVar65._24_4_ = 0x395e8083;
                auVar65._28_4_ = 0x395e8083;
                auVar243 = vfmsub231ps_avx512vl(auVar243,auVar262,auVar65);
                auVar398._0_4_ = auVar243._0_4_ * auVar243._0_4_;
                auVar398._4_4_ = auVar243._4_4_ * auVar243._4_4_;
                auVar398._8_4_ = auVar243._8_4_ * auVar243._8_4_;
                auVar398._12_4_ = auVar243._12_4_ * auVar243._12_4_;
                auVar398._16_4_ = auVar243._16_4_ * auVar243._16_4_;
                auVar398._20_4_ = auVar243._20_4_ * auVar243._20_4_;
                auVar398._24_4_ = auVar243._24_4_ * auVar243._24_4_;
                auVar398._28_4_ = 0;
                auVar185 = vfmadd213ps_fma(auVar241,auVar243,auVar269);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar243,auVar270);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar243,auVar271);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar243,auVar272);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar243,auVar265);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar398,auVar243);
                auVar344._0_4_ = auVar185._0_4_ + 1.0;
                auVar344._4_4_ = auVar185._4_4_ + 1.0;
                auVar344._8_4_ = auVar185._8_4_ + 1.0;
                auVar344._12_4_ = auVar185._12_4_ + 1.0;
                auVar344._16_4_ = 0x3f800000;
                auVar344._20_4_ = 0x3f800000;
                auVar344._24_4_ = 0x3f800000;
                auVar344._28_4_ = 0x3f800000;
                auVar243 = vcvttps2dq_avx512vl(auVar262);
                auVar243 = vpslld_avx2(auVar243,0x17);
                auVar243 = vpaddd_avx2(auVar243,auVar273);
                auVar185 = vfmadd213ps_fma(auVar243,auVar344,auVar267);
                auVar243 = vdivps_avx(auVar267,ZEXT1632(auVar185));
                break;
              case 5:
                auVar243 = vminps_avx(auVar244,auVar263);
                auVar243 = vmaxps_avx(auVar243,auVar264);
                auVar185 = vfmadd213ps_fma(auVar266,auVar243,auVar265);
                auVar244 = vrndscaleps_avx512vl(ZEXT1632(auVar185),1);
                uVar146 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar244,1);
                auVar246 = vsubps_avx512vl(auVar244,auVar267);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar257._0_4_ = (uint)bVar184 * auVar246._0_4_ | (uint)!bVar184 * auVar244._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar257._4_4_ = (uint)bVar184 * auVar246._4_4_ | (uint)!bVar184 * auVar244._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar257._8_4_ = (uint)bVar184 * auVar246._8_4_ | (uint)!bVar184 * auVar244._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar257._12_4_ = (uint)bVar184 * auVar246._12_4_ | (uint)!bVar184 * auVar244._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar257._16_4_ = (uint)bVar184 * auVar246._16_4_ | (uint)!bVar184 * auVar244._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar257._20_4_ = (uint)bVar184 * auVar246._20_4_ | (uint)!bVar184 * auVar244._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar257._24_4_ = (uint)bVar184 * auVar246._24_4_ | (uint)!bVar184 * auVar244._24_4_
                ;
                bVar184 = SUB81(uVar146 >> 7,0);
                auVar257._28_4_ = (uint)bVar184 * auVar246._28_4_ | (uint)!bVar184 * auVar244._28_4_
                ;
                auVar243 = vfmsub231ps_avx512vl(auVar243,auVar257,auVar268);
                auVar243 = vfnmsub231ps_avx512vl(auVar243,auVar257,auVar274);
                auVar420._0_4_ = auVar243._0_4_ * auVar243._0_4_;
                auVar420._4_4_ = auVar243._4_4_ * auVar243._4_4_;
                auVar420._8_4_ = auVar243._8_4_ * auVar243._8_4_;
                auVar420._12_4_ = auVar243._12_4_ * auVar243._12_4_;
                auVar420._16_4_ = auVar243._16_4_ * auVar243._16_4_;
                auVar420._20_4_ = auVar243._20_4_ * auVar243._20_4_;
                auVar420._24_4_ = auVar243._24_4_ * auVar243._24_4_;
                auVar420._28_4_ = 0;
                auVar244 = vfmadd213ps_avx512vl(auVar241,auVar243,auVar269);
                auVar244 = vfmadd213ps_avx512vl(auVar244,auVar243,auVar270);
                auVar244 = vfmadd213ps_avx512vl(auVar244,auVar243,auVar271);
                auVar244 = vfmadd213ps_avx512vl(auVar244,auVar243,auVar272);
                auVar244 = vfmadd213ps_avx512vl(auVar244,auVar243,auVar265);
                auVar243 = vfmadd213ps_avx512vl(auVar244,auVar420,auVar243);
                auVar244 = vaddps_avx512vl(auVar243,auVar267);
                auVar243 = vcvttps2dq_avx512vl(auVar257);
                auVar243 = vpslld_avx2(auVar243,0x17);
                auVar243 = vpaddd_avx2(auVar243,auVar273);
                auVar185 = vfmadd213ps_fma(auVar243,auVar244,auVar267);
                uVar146 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar245,2);
                auVar244._8_4_ = 0x800000;
                auVar244._0_8_ = 0x80000000800000;
                auVar244._12_4_ = 0x800000;
                auVar244._16_4_ = 0x800000;
                auVar244._20_4_ = 0x800000;
                auVar244._24_4_ = 0x800000;
                auVar244._28_4_ = 0x800000;
                auVar243 = vmaxps_avx512vl(ZEXT1632(auVar185),auVar244);
                auVar247 = vpsrld_avx2(auVar243,0x17);
                auVar244 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                auVar245._8_4_ = 0x3f000000;
                auVar245._0_8_ = 0x3f0000003f000000;
                auVar245._12_4_ = 0x3f000000;
                auVar245._16_4_ = 0x3f000000;
                auVar245._20_4_ = 0x3f000000;
                auVar245._24_4_ = 0x3f000000;
                auVar245._28_4_ = 0x3f000000;
                auVar243 = vpternlogd_avx512vl(auVar243,auVar244,auVar245,0xea);
                auVar248._8_4_ = 0x3f3504f3;
                auVar248._0_8_ = 0x3f3504f33f3504f3;
                auVar248._12_4_ = 0x3f3504f3;
                auVar248._16_4_ = 0x3f3504f3;
                auVar248._20_4_ = 0x3f3504f3;
                auVar248._24_4_ = 0x3f3504f3;
                auVar248._28_4_ = 0x3f3504f3;
                uVar177 = vcmpps_avx512vl(auVar243,auVar248,1);
                auVar244 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
                auVar245 = vaddps_avx512vl(auVar243,auVar244);
                auVar243 = vaddps_avx512vl(auVar245,auVar243);
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar258._0_4_ = (uint)bVar184 * auVar243._0_4_ | (uint)!bVar184 * auVar245._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar258._4_4_ = (uint)bVar184 * auVar243._4_4_ | (uint)!bVar184 * auVar245._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar258._8_4_ = (uint)bVar184 * auVar243._8_4_ | (uint)!bVar184 * auVar245._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar258._12_4_ = (uint)bVar184 * auVar243._12_4_ | (uint)!bVar184 * auVar245._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar258._16_4_ = (uint)bVar184 * auVar243._16_4_ | (uint)!bVar184 * auVar245._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar258._20_4_ = (uint)bVar184 * auVar243._20_4_ | (uint)!bVar184 * auVar245._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar258._24_4_ = (uint)bVar184 * auVar243._24_4_ | (uint)!bVar184 * auVar245._24_4_
                ;
                bVar184 = SUB81(uVar177 >> 7,0);
                auVar258._28_4_ = (uint)bVar184 * auVar243._28_4_ | (uint)!bVar184 * auVar245._28_4_
                ;
                auVar245 = vmulps_avx512vl(auVar258,auVar258);
                auVar243 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                auVar249._8_4_ = 0xbdebd1b8;
                auVar249._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar249._12_4_ = 0xbdebd1b8;
                auVar249._16_4_ = 0xbdebd1b8;
                auVar249._20_4_ = 0xbdebd1b8;
                auVar249._24_4_ = 0xbdebd1b8;
                auVar249._28_4_ = 0xbdebd1b8;
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar258,auVar249);
                auVar250._8_4_ = 0x3def251a;
                auVar250._0_8_ = 0x3def251a3def251a;
                auVar250._12_4_ = 0x3def251a;
                auVar250._16_4_ = 0x3def251a;
                auVar250._20_4_ = 0x3def251a;
                auVar250._24_4_ = 0x3def251a;
                auVar250._28_4_ = 0x3def251a;
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar258,auVar250);
                auVar251._8_4_ = 0xbdfe5d4f;
                auVar251._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar251._12_4_ = 0xbdfe5d4f;
                auVar251._16_4_ = 0xbdfe5d4f;
                auVar251._20_4_ = 0xbdfe5d4f;
                auVar251._24_4_ = 0xbdfe5d4f;
                auVar251._28_4_ = 0xbdfe5d4f;
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar258,auVar251);
                auVar252._8_4_ = 0x3e11e9bf;
                auVar252._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar252._12_4_ = 0x3e11e9bf;
                auVar252._16_4_ = 0x3e11e9bf;
                auVar252._20_4_ = 0x3e11e9bf;
                auVar252._24_4_ = 0x3e11e9bf;
                auVar252._28_4_ = 0x3e11e9bf;
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar258,auVar252);
                auVar253._8_4_ = 0xbe2aae50;
                auVar253._0_8_ = 0xbe2aae50be2aae50;
                auVar253._12_4_ = 0xbe2aae50;
                auVar253._16_4_ = 0xbe2aae50;
                auVar253._20_4_ = 0xbe2aae50;
                auVar253._24_4_ = 0xbe2aae50;
                auVar253._28_4_ = 0xbe2aae50;
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar258,auVar253);
                auVar254._8_4_ = 0x3e4cceac;
                auVar254._0_8_ = 0x3e4cceac3e4cceac;
                auVar254._12_4_ = 0x3e4cceac;
                auVar254._16_4_ = 0x3e4cceac;
                auVar254._20_4_ = 0x3e4cceac;
                auVar254._24_4_ = 0x3e4cceac;
                auVar254._28_4_ = 0x3e4cceac;
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar258,auVar254);
                auVar255._8_4_ = 0xbe7ffffc;
                auVar255._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar255._12_4_ = 0xbe7ffffc;
                auVar255._16_4_ = 0xbe7ffffc;
                auVar255._20_4_ = 0xbe7ffffc;
                auVar255._24_4_ = 0xbe7ffffc;
                auVar255._28_4_ = 0xbe7ffffc;
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar258,auVar255);
                auVar256._8_4_ = 0x3eaaaaaa;
                auVar256._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar256._12_4_ = 0x3eaaaaaa;
                auVar256._16_4_ = 0x3eaaaaaa;
                auVar256._20_4_ = 0x3eaaaaaa;
                auVar256._24_4_ = 0x3eaaaaaa;
                auVar256._28_4_ = 0x3eaaaaaa;
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar258,auVar256);
                auVar246 = vmulps_avx512vl(auVar245,auVar258);
                auVar246 = vmulps_avx512vl(auVar246,auVar243);
                auVar63._8_4_ = 0xffffff82;
                auVar63._0_8_ = 0xffffff82ffffff82;
                auVar63._12_4_ = 0xffffff82;
                auVar63._16_4_ = 0xffffff82;
                auVar63._20_4_ = 0xffffff82;
                auVar63._24_4_ = 0xffffff82;
                auVar63._28_4_ = 0xffffff82;
                auVar243 = vpaddd_avx512vl(auVar247,auVar63);
                auVar243 = vcvtdq2ps_avx(auVar243);
                auVar247 = vsubps_avx512vl(auVar243,auVar267);
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar259._0_4_ = (uint)bVar184 * auVar247._0_4_ | (uint)!bVar184 * auVar243._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar259._4_4_ = (uint)bVar184 * auVar247._4_4_ | (uint)!bVar184 * auVar243._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar259._8_4_ = (uint)bVar184 * auVar247._8_4_ | (uint)!bVar184 * auVar243._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar259._12_4_ = (uint)bVar184 * auVar247._12_4_ | (uint)!bVar184 * auVar243._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar259._16_4_ = (uint)bVar184 * auVar247._16_4_ | (uint)!bVar184 * auVar243._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar259._20_4_ = (uint)bVar184 * auVar247._20_4_ | (uint)!bVar184 * auVar243._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar259._24_4_ = (uint)bVar184 * auVar247._24_4_ | (uint)!bVar184 * auVar243._24_4_
                ;
                bVar184 = SUB81(uVar177 >> 7,0);
                auVar259._28_4_ = (uint)bVar184 * auVar247._28_4_ | (uint)!bVar184 * auVar243._28_4_
                ;
                auVar243 = vfmadd231ps_avx512vl(auVar246,auVar259,auVar274);
                auVar243 = vfmsub231ps_avx512vl(auVar243,auVar265,auVar245);
                auVar243 = vsubps_avx512vl(auVar243,auVar258);
                auVar185 = vfmsub231ps_fma(auVar243,auVar268,auVar259);
                auVar243 = vmulps_avx512vl(ZEXT1632(auVar185),auVar242);
                auVar245 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar260._0_4_ = (uint)bVar184 * auVar245._0_4_ | (uint)!bVar184 * auVar243._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar260._4_4_ = (uint)bVar184 * auVar245._4_4_ | (uint)!bVar184 * auVar243._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar260._8_4_ = (uint)bVar184 * auVar245._8_4_ | (uint)!bVar184 * auVar243._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar260._12_4_ = (uint)bVar184 * auVar245._12_4_ | (uint)!bVar184 * auVar243._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar260._16_4_ = (uint)bVar184 * auVar245._16_4_ | (uint)!bVar184 * auVar243._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar260._20_4_ = (uint)bVar184 * auVar245._20_4_ | (uint)!bVar184 * auVar243._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar260._24_4_ = (uint)bVar184 * auVar245._24_4_ | (uint)!bVar184 * auVar243._24_4_
                ;
                bVar184 = SUB81(uVar146 >> 7,0);
                auVar260._28_4_ = (uint)bVar184 * auVar245._28_4_ | (uint)!bVar184 * auVar243._28_4_
                ;
                auVar243 = vminps_avx(auVar260,auVar263);
                auVar243 = vmaxps_avx(auVar243,auVar264);
                auVar185 = vfmadd213ps_fma(auVar266,auVar243,auVar265);
                auVar245 = vrndscaleps_avx512vl(ZEXT1632(auVar185),1);
                uVar146 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar245,1);
                auVar246 = vsubps_avx512vl(auVar245,auVar267);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar261._0_4_ = (uint)bVar184 * auVar246._0_4_ | (uint)!bVar184 * auVar245._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar261._4_4_ = (uint)bVar184 * auVar246._4_4_ | (uint)!bVar184 * auVar245._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar261._8_4_ = (uint)bVar184 * auVar246._8_4_ | (uint)!bVar184 * auVar245._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar261._12_4_ = (uint)bVar184 * auVar246._12_4_ | (uint)!bVar184 * auVar245._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar261._16_4_ = (uint)bVar184 * auVar246._16_4_ | (uint)!bVar184 * auVar245._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar261._20_4_ = (uint)bVar184 * auVar246._20_4_ | (uint)!bVar184 * auVar245._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar261._24_4_ = (uint)bVar184 * auVar246._24_4_ | (uint)!bVar184 * auVar245._24_4_
                ;
                bVar184 = SUB81(uVar146 >> 7,0);
                auVar261._28_4_ = (uint)bVar184 * auVar246._28_4_ | (uint)!bVar184 * auVar245._28_4_
                ;
                auVar243 = vfmsub231ps_avx512vl(auVar243,auVar261,auVar268);
                auVar243 = vfnmsub231ps_avx512vl(auVar243,auVar261,auVar274);
                auVar421._0_4_ = auVar243._0_4_ * auVar243._0_4_;
                auVar421._4_4_ = auVar243._4_4_ * auVar243._4_4_;
                auVar421._8_4_ = auVar243._8_4_ * auVar243._8_4_;
                auVar421._12_4_ = auVar243._12_4_ * auVar243._12_4_;
                auVar421._16_4_ = auVar243._16_4_ * auVar243._16_4_;
                auVar421._20_4_ = auVar243._20_4_ * auVar243._20_4_;
                auVar421._24_4_ = auVar243._24_4_ * auVar243._24_4_;
                auVar421._28_4_ = 0;
                auVar245 = vfmadd213ps_avx512vl(auVar241,auVar243,auVar269);
                auVar245 = vfmadd213ps_avx512vl(auVar245,auVar243,auVar270);
                auVar245 = vfmadd213ps_avx512vl(auVar245,auVar243,auVar271);
                auVar245 = vfmadd213ps_avx512vl(auVar245,auVar243,auVar272);
                auVar245 = vfmadd213ps_avx512vl(auVar245,auVar243,auVar265);
                auVar243 = vfmadd213ps_avx512vl(auVar245,auVar421,auVar243);
                auVar245 = vaddps_avx512vl(auVar243,auVar267);
                auVar243 = vcvttps2dq_avx512vl(auVar261);
                auVar243 = vpslld_avx2(auVar243,0x17);
                auVar243 = vpaddd_avx2(auVar243,auVar273);
                auVar185 = vfmadd213ps_fma(auVar243,auVar245,auVar267);
                auVar243 = vdivps_avx(auVar267,ZEXT1632(auVar185));
                auVar244 = vfnmadd213ps_avx512vl(auVar243,auVar242,auVar244);
                goto LAB_00269b36;
              case 6:
                puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar335 = *puVar10;
                auVar247._4_4_ = uVar335;
                auVar247._0_4_ = uVar335;
                auVar247._8_4_ = uVar335;
                auVar247._12_4_ = uVar335;
                auVar247._16_4_ = uVar335;
                auVar247._20_4_ = uVar335;
                auVar247._24_4_ = uVar335;
                auVar247._28_4_ = uVar335;
                uVar335 = puVar10[1];
                auVar246._4_4_ = uVar335;
                auVar246._0_4_ = uVar335;
                auVar246._8_4_ = uVar335;
                auVar246._12_4_ = uVar335;
                auVar246._16_4_ = uVar335;
                auVar246._20_4_ = uVar335;
                auVar246._24_4_ = uVar335;
                auVar246._28_4_ = uVar335;
                auVar243 = vfmadd213ps_avx512vl(auVar247,auVar244,auVar246);
                auVar243 = vmaxps_avx(auVar243,auVar245);
                auVar244 = vminps_avx(auVar243,auVar267);
LAB_00269b36:
                auVar243._4_4_ = auVar244._4_4_ * auVar333._4_4_;
                auVar243._0_4_ = auVar244._0_4_ * auVar333._0_4_;
                auVar243._8_4_ = auVar244._8_4_ * auVar333._8_4_;
                auVar243._12_4_ = auVar244._12_4_ * auVar333._12_4_;
                auVar243._16_4_ = auVar244._16_4_ * auVar333._16_4_;
                auVar243._20_4_ = auVar244._20_4_ * auVar333._20_4_;
                auVar243._24_4_ = auVar244._24_4_ * auVar333._24_4_;
                auVar243._28_4_ = auVar244._28_4_;
              }
switchD_00269856_caseD_1:
              *local_288 = auVar243;
              local_288 = local_288 + 1;
              iVar144 = iVar144 + 1;
            }
          }
        }
      }
      afVar136 = _ps512_cephes_log_p8;
      afVar135 = _ps512_cephes_log_p7;
      afVar134 = _ps512_cephes_log_p6;
      afVar133 = _ps512_cephes_log_p5;
      afVar132 = _ps512_cephes_log_p4;
      afVar131 = _ps512_cephes_log_p3;
      afVar130 = _ps512_cephes_log_p2;
      afVar129 = ::_ps512_cephes_exp_p5;
      afVar128 = ::_ps512_cephes_exp_p4;
      afVar127 = ::_ps512_cephes_exp_p3;
      afVar126 = ::_ps512_cephes_exp_p2;
      afVar125 = ::_ps512_cephes_exp_p1;
      afVar124 = ::_ps512_cephes_exp_p0;
      afVar123 = ::_ps512_cephes_LOG2EF;
      afVar122 = ::_ps512_exp_lo;
      afVar121 = ::_ps512_exp_hi;
      afVar120 = ::_ps512_1;
      if ((iVar174 == 4) && (uVar151 == 0x10)) {
        uVar157 = (this->super_Deconvolution).kernel_w;
        uVar160 = (this->super_Deconvolution).kernel_h;
        iVar139 = (this->super_Deconvolution).dilation_w;
        iVar138 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar152 = (this->super_Deconvolution).stride_h;
        iVar153 = (this->super_Deconvolution).activation_type;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        auVar333 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar296 = vxorps_avx512dq(auVar333,(undefined1  [64])_ps512_cephes_log_q2);
        auVar297 = vxorps_avx512dq(auVar333,(undefined1  [64])_ps512_cephes_log_q1);
        auVar298 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar315 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar333);
        uVar165 = 0;
        if (0 < (int)uVar157) {
          uVar165 = (ulong)uVar157;
        }
        uVar166 = 0;
        if (0 < (int)uVar160) {
          uVar166 = (ulong)uVar160;
        }
        uVar154 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar154 = 0;
        }
        uVar178 = 0;
        auVar185 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
        in_ZMM29 = ZEXT1664(auVar185);
        auVar299 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar300 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
        for (; uVar178 != uVar154; uVar178 = uVar178 + 1) {
          local_2a8 = (undefined1 (*) [64])
                      (local_1e8.cstep * uVar178 * local_1e8.elemsize + (long)local_1e8.data);
          iVar8 = bottom_blob->w;
          iVar7 = bottom_blob->h;
          uVar159 = 0;
          uVar158 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar158 = uVar159;
          }
          uVar180 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar180 = 0;
          }
          uVar142 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar142 = 0;
          }
          local_168._0_4_ = uVar142;
          for (; uVar159 != uVar142; uVar159 = uVar159 + 1) {
            iVar144 = (1 - uVar157) * iVar139;
            for (uVar170 = 0; uVar170 != uVar180; uVar170 = uVar170 + 1) {
              if (pvVar14 == (void *)0x0) {
                auVar301 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar301 = *(undefined1 (*) [64])((long)pvVar14 + uVar178 * 0x40);
              }
              pvVar179 = bottom_blob->data;
              lVar150 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar178 * (this->weight_data_tm).elemsize +
                        0xc0;
              for (uVar146 = 0; uVar146 != uVar158; uVar146 = uVar146 + 1) {
                lVar155 = lVar150;
                for (uVar177 = 0; uVar177 != uVar166; uVar177 = uVar177 + 1) {
                  iVar140 = (((int)uVar177 - uVar160) + 1) * iVar138 + uVar159;
                  if (((-1 < iVar140) && (iVar141 = iVar140 / iVar152, iVar140 % iVar152 == 0)) &&
                     (iVar141 < iVar7)) {
                    lVar119 = (long)iVar141 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar146;
                    iVar140 = iVar144;
                    for (lVar164 = 0; uVar165 * 0x100 != lVar164; lVar164 = lVar164 + 0x100) {
                      if (((-1 < iVar140) && (iVar141 = iVar140 / iVar156, iVar140 % iVar156 == 0))
                         && (iVar141 < iVar8)) {
                        lVar145 = (long)(iVar141 << 2);
                        auVar302 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119)));
                        auVar303 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 4)));
                        auVar304 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 8)));
                        auVar305 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0xc)));
                        auVar301 = vfmadd231ps_avx512f(auVar301,auVar302,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0xc0 + lVar164));
                        auVar301 = vfmadd231ps_avx512f(auVar301,auVar303,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x80 + lVar164));
                        auVar301 = vfmadd231ps_avx512f(auVar301,auVar304,
                                                       *(undefined1 (*) [64])
                                                        (lVar155 + -0x40 + lVar164));
                        auVar301 = vfmadd231ps_avx512f(auVar301,auVar305,
                                                       *(undefined1 (*) [64])(lVar155 + lVar164));
                      }
                      iVar140 = iVar140 + iVar139;
                    }
                  }
                  lVar155 = lVar155 + (long)(int)uVar157 * 0x100;
                }
                lVar150 = lVar150 + (long)(int)(uVar157 * uVar160 * 0x40) * 4;
              }
              auVar325 = auVar301;
              switch(iVar153) {
              case 1:
                auVar325 = vmaxps_avx512f(auVar301,in_ZMM29);
                break;
              case 2:
                uVar146 = vcmpps_avx512f(auVar301,in_ZMM29,1);
                uVar335 = *(this->super_Deconvolution).activation_params.data;
                auVar105._4_4_ = uVar335;
                auVar105._0_4_ = uVar335;
                auVar105._8_4_ = uVar335;
                auVar105._12_4_ = uVar335;
                auVar105._16_4_ = uVar335;
                auVar105._20_4_ = uVar335;
                auVar105._24_4_ = uVar335;
                auVar105._28_4_ = uVar335;
                auVar105._32_4_ = uVar335;
                auVar105._36_4_ = uVar335;
                auVar105._40_4_ = uVar335;
                auVar105._44_4_ = uVar335;
                auVar105._48_4_ = uVar335;
                auVar105._52_4_ = uVar335;
                auVar105._56_4_ = uVar335;
                auVar105._60_4_ = uVar335;
                auVar302 = vmulps_avx512f(auVar301,auVar105);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar325._0_4_ = (uint)bVar184 * auVar302._0_4_ | (uint)!bVar184 * auVar301._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar325._4_4_ = (uint)bVar184 * auVar302._4_4_ | (uint)!bVar184 * auVar301._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar325._8_4_ = (uint)bVar184 * auVar302._8_4_ | (uint)!bVar184 * auVar301._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar325._12_4_ = (uint)bVar184 * auVar302._12_4_ | (uint)!bVar184 * auVar301._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar325._16_4_ = (uint)bVar184 * auVar302._16_4_ | (uint)!bVar184 * auVar301._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar325._20_4_ = (uint)bVar184 * auVar302._20_4_ | (uint)!bVar184 * auVar301._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar325._24_4_ = (uint)bVar184 * auVar302._24_4_ | (uint)!bVar184 * auVar301._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar325._28_4_ = (uint)bVar184 * auVar302._28_4_ | (uint)!bVar184 * auVar301._28_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 8) & 1);
                auVar325._32_4_ = (uint)bVar184 * auVar302._32_4_ | (uint)!bVar184 * auVar301._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar325._36_4_ = (uint)bVar184 * auVar302._36_4_ | (uint)!bVar184 * auVar301._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar325._40_4_ = (uint)bVar184 * auVar302._40_4_ | (uint)!bVar184 * auVar301._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar325._44_4_ = (uint)bVar184 * auVar302._44_4_ | (uint)!bVar184 * auVar301._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar325._48_4_ = (uint)bVar184 * auVar302._48_4_ | (uint)!bVar184 * auVar301._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar325._52_4_ = (uint)bVar184 * auVar302._52_4_ | (uint)!bVar184 * auVar301._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar325._56_4_ = (uint)bVar184 * auVar302._56_4_ | (uint)!bVar184 * auVar301._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar325._60_4_ = (uint)bVar184 * auVar302._60_4_ | (uint)!bVar184 * auVar301._60_4_
                ;
                break;
              case 3:
                puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar335 = *puVar10;
                auVar103._4_4_ = uVar335;
                auVar103._0_4_ = uVar335;
                auVar103._8_4_ = uVar335;
                auVar103._12_4_ = uVar335;
                auVar103._16_4_ = uVar335;
                auVar103._20_4_ = uVar335;
                auVar103._24_4_ = uVar335;
                auVar103._28_4_ = uVar335;
                auVar103._32_4_ = uVar335;
                auVar103._36_4_ = uVar335;
                auVar103._40_4_ = uVar335;
                auVar103._44_4_ = uVar335;
                auVar103._48_4_ = uVar335;
                auVar103._52_4_ = uVar335;
                auVar103._56_4_ = uVar335;
                auVar103._60_4_ = uVar335;
                auVar301 = vmaxps_avx512f(auVar301,auVar103);
                uVar335 = puVar10[1];
                auVar104._4_4_ = uVar335;
                auVar104._0_4_ = uVar335;
                auVar104._8_4_ = uVar335;
                auVar104._12_4_ = uVar335;
                auVar104._16_4_ = uVar335;
                auVar104._20_4_ = uVar335;
                auVar104._24_4_ = uVar335;
                auVar104._28_4_ = uVar335;
                auVar104._32_4_ = uVar335;
                auVar104._36_4_ = uVar335;
                auVar104._40_4_ = uVar335;
                auVar104._44_4_ = uVar335;
                auVar104._48_4_ = uVar335;
                auVar104._52_4_ = uVar335;
                auVar104._56_4_ = uVar335;
                auVar104._60_4_ = uVar335;
                auVar325 = vminps_avx512f(auVar301,auVar104);
                break;
              case 4:
                auVar301 = vxorps_avx512dq(auVar301,auVar333);
                auVar301 = vminps_avx512f(auVar301,(undefined1  [64])afVar121);
                auVar301 = vmaxps_avx512f(auVar301,(undefined1  [64])afVar122);
                auVar302 = vfmadd213ps_avx512f((undefined1  [64])afVar123,auVar301,
                                               (undefined1  [64])afVar129);
                auVar303 = vrndscaleps_avx512f(auVar302,1);
                uVar146 = vcmpps_avx512f(auVar302,auVar303,1);
                auVar302 = vsubps_avx512f(auVar303,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar324._0_4_ = (uint)bVar184 * auVar302._0_4_ | (uint)!bVar184 * auVar303._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar324._4_4_ = (uint)bVar184 * auVar302._4_4_ | (uint)!bVar184 * auVar303._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar324._8_4_ = (uint)bVar184 * auVar302._8_4_ | (uint)!bVar184 * auVar303._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar324._12_4_ = (uint)bVar184 * auVar302._12_4_ | (uint)!bVar184 * auVar303._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar324._16_4_ = (uint)bVar184 * auVar302._16_4_ | (uint)!bVar184 * auVar303._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar324._20_4_ = (uint)bVar184 * auVar302._20_4_ | (uint)!bVar184 * auVar303._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar324._24_4_ = (uint)bVar184 * auVar302._24_4_ | (uint)!bVar184 * auVar303._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar324._28_4_ = (uint)bVar184 * auVar302._28_4_ | (uint)!bVar184 * auVar303._28_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 8) & 1);
                auVar324._32_4_ = (uint)bVar184 * auVar302._32_4_ | (uint)!bVar184 * auVar303._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar324._36_4_ = (uint)bVar184 * auVar302._36_4_ | (uint)!bVar184 * auVar303._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar324._40_4_ = (uint)bVar184 * auVar302._40_4_ | (uint)!bVar184 * auVar303._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar324._44_4_ = (uint)bVar184 * auVar302._44_4_ | (uint)!bVar184 * auVar303._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar324._48_4_ = (uint)bVar184 * auVar302._48_4_ | (uint)!bVar184 * auVar303._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar324._52_4_ = (uint)bVar184 * auVar302._52_4_ | (uint)!bVar184 * auVar303._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar324._56_4_ = (uint)bVar184 * auVar302._56_4_ | (uint)!bVar184 * auVar303._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar324._60_4_ = (uint)bVar184 * auVar302._60_4_ | (uint)!bVar184 * auVar303._60_4_
                ;
                auVar301 = vfmadd231ps_avx512f(auVar301,auVar324,auVar296);
                auVar301 = vfmadd231ps_avx512f(auVar301,auVar324,auVar297);
                auVar302 = vmulps_avx512f(auVar301,auVar301);
                auVar303 = vfmadd213ps_avx512f(auVar301,(undefined1  [64])afVar124,
                                               (undefined1  [64])afVar125);
                auVar303 = vfmadd213ps_avx512f(auVar303,auVar301,(undefined1  [64])afVar126);
                auVar303 = vfmadd213ps_avx512f(auVar303,auVar301,(undefined1  [64])afVar127);
                auVar303 = vfmadd213ps_avx512f(auVar303,auVar301,(undefined1  [64])afVar128);
                auVar303 = vfmadd213ps_avx512f(auVar303,auVar301,(undefined1  [64])afVar129);
                auVar301 = vfmadd213ps_avx512f(auVar303,auVar302,auVar301);
                auVar301 = vaddps_avx512f(auVar301,(undefined1  [64])afVar120);
                auVar302 = vcvttps2dq_avx512f(auVar324);
                auVar302 = vpaddd_avx512f(auVar302,auVar298);
                auVar302 = vpslld_avx512f(auVar302,0x17);
                auVar301 = vfmadd213ps_avx512f(auVar302,auVar301,auVar299);
                auVar325 = vdivps_avx512f(auVar299,auVar301);
                break;
              case 5:
                auVar302 = vminps_avx512f(auVar301,(undefined1  [64])afVar121);
                auVar302 = vmaxps_avx512f(auVar302,(undefined1  [64])afVar122);
                auVar303 = vfmadd213ps_avx512f((undefined1  [64])afVar123,auVar302,
                                               (undefined1  [64])afVar129);
                auVar304 = vrndscaleps_avx512f(auVar303,1);
                uVar146 = vcmpps_avx512f(auVar303,auVar304,1);
                auVar303 = vsubps_avx512f(auVar304,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar319._0_4_ = (uint)bVar184 * auVar303._0_4_ | (uint)!bVar184 * auVar304._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar319._4_4_ = (uint)bVar184 * auVar303._4_4_ | (uint)!bVar184 * auVar304._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar319._8_4_ = (uint)bVar184 * auVar303._8_4_ | (uint)!bVar184 * auVar304._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar319._12_4_ = (uint)bVar184 * auVar303._12_4_ | (uint)!bVar184 * auVar304._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar319._16_4_ = (uint)bVar184 * auVar303._16_4_ | (uint)!bVar184 * auVar304._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar319._20_4_ = (uint)bVar184 * auVar303._20_4_ | (uint)!bVar184 * auVar304._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar319._24_4_ = (uint)bVar184 * auVar303._24_4_ | (uint)!bVar184 * auVar304._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar319._28_4_ = (uint)bVar184 * auVar303._28_4_ | (uint)!bVar184 * auVar304._28_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 8) & 1);
                auVar319._32_4_ = (uint)bVar184 * auVar303._32_4_ | (uint)!bVar184 * auVar304._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar319._36_4_ = (uint)bVar184 * auVar303._36_4_ | (uint)!bVar184 * auVar304._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar319._40_4_ = (uint)bVar184 * auVar303._40_4_ | (uint)!bVar184 * auVar304._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar319._44_4_ = (uint)bVar184 * auVar303._44_4_ | (uint)!bVar184 * auVar304._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar319._48_4_ = (uint)bVar184 * auVar303._48_4_ | (uint)!bVar184 * auVar304._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar319._52_4_ = (uint)bVar184 * auVar303._52_4_ | (uint)!bVar184 * auVar304._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar319._56_4_ = (uint)bVar184 * auVar303._56_4_ | (uint)!bVar184 * auVar304._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar319._60_4_ = (uint)bVar184 * auVar303._60_4_ | (uint)!bVar184 * auVar304._60_4_
                ;
                auVar302 = vfmadd231ps_avx512f(auVar302,auVar319,auVar296);
                auVar302 = vfmadd231ps_avx512f(auVar302,auVar319,auVar297);
                auVar303 = vmulps_avx512f(auVar302,auVar302);
                auVar304 = vfmadd213ps_avx512f(auVar302,(undefined1  [64])afVar124,
                                               (undefined1  [64])afVar125);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar126);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar127);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar128);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar129);
                auVar302 = vfmadd213ps_avx512f(auVar304,auVar303,auVar302);
                auVar302 = vaddps_avx512f(auVar302,(undefined1  [64])afVar120);
                auVar303 = vcvttps2dq_avx512f(auVar319);
                auVar303 = vpaddd_avx512f(auVar303,auVar298);
                auVar303 = vpslld_avx512f(auVar303,0x17);
                auVar302 = vfmadd213ps_avx512f(auVar303,auVar302,auVar299);
                auVar303 = vmaxps_avx512f(auVar302,(undefined1  [64])_ps512_min_norm_pos);
                auVar304 = vpsrld_avx512f(auVar303,0x17);
                auVar303 = vpternlogd_avx512f(auVar303,(undefined1  [64])afVar129,
                                              (undefined1  [64])_ps512_inv_mant_mask,0xec);
                uVar146 = vcmpps_avx512f(auVar303,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                auVar305 = vsubps_avx512f(auVar303,(undefined1  [64])afVar120);
                auVar303 = vaddps_avx512f(auVar305,auVar303);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar320._0_4_ = (uint)bVar184 * auVar303._0_4_ | (uint)!bVar184 * auVar305._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar320._4_4_ = (uint)bVar184 * auVar303._4_4_ | (uint)!bVar184 * auVar305._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar320._8_4_ = (uint)bVar184 * auVar303._8_4_ | (uint)!bVar184 * auVar305._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar320._12_4_ = (uint)bVar184 * auVar303._12_4_ | (uint)!bVar184 * auVar305._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar320._16_4_ = (uint)bVar184 * auVar303._16_4_ | (uint)!bVar184 * auVar305._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar320._20_4_ = (uint)bVar184 * auVar303._20_4_ | (uint)!bVar184 * auVar305._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar320._24_4_ = (uint)bVar184 * auVar303._24_4_ | (uint)!bVar184 * auVar305._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar320._28_4_ = (uint)bVar184 * auVar303._28_4_ | (uint)!bVar184 * auVar305._28_4_
                ;
                bVar16 = (byte)(uVar146 >> 8);
                bVar184 = (bool)(bVar16 & 1);
                auVar320._32_4_ = (uint)bVar184 * auVar303._32_4_ | (uint)!bVar184 * auVar305._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar320._36_4_ = (uint)bVar184 * auVar303._36_4_ | (uint)!bVar184 * auVar305._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar320._40_4_ = (uint)bVar184 * auVar303._40_4_ | (uint)!bVar184 * auVar305._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar320._44_4_ = (uint)bVar184 * auVar303._44_4_ | (uint)!bVar184 * auVar305._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar320._48_4_ = (uint)bVar184 * auVar303._48_4_ | (uint)!bVar184 * auVar305._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar320._52_4_ = (uint)bVar184 * auVar303._52_4_ | (uint)!bVar184 * auVar305._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar320._56_4_ = (uint)bVar184 * auVar303._56_4_ | (uint)!bVar184 * auVar305._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar320._60_4_ = (uint)bVar184 * auVar303._60_4_ | (uint)!bVar184 * auVar305._60_4_
                ;
                auVar303 = vmulps_avx512f(auVar320,auVar320);
                auVar305 = vfmadd132ps_avx512f(auVar320,(undefined1  [64])_ps512_cephes_log_p1,
                                               (undefined1  [64])_ps512_cephes_log_p0);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar320,(undefined1  [64])afVar130);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar320,(undefined1  [64])afVar131);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar320,(undefined1  [64])afVar132);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar320,(undefined1  [64])afVar133);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar320,(undefined1  [64])afVar134);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar320,(undefined1  [64])afVar135);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar320,(undefined1  [64])afVar136);
                auVar306 = vmulps_avx512f(auVar303,auVar320);
                auVar305 = vfmadd213ps_avx512f(auVar306,auVar305,auVar320);
                uVar177 = vcmpps_avx512f(auVar302,in_ZMM29,2);
                auVar302 = vpsubd_avx512f(auVar304,auVar298);
                auVar302 = vcvtdq2ps_avx512f(auVar302);
                auVar304 = vaddps_avx512f(auVar302,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar321._0_4_ = (uint)bVar184 * auVar302._0_4_ | (uint)!bVar184 * auVar304._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar321._4_4_ = (uint)bVar184 * auVar302._4_4_ | (uint)!bVar184 * auVar304._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar321._8_4_ = (uint)bVar184 * auVar302._8_4_ | (uint)!bVar184 * auVar304._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar321._12_4_ = (uint)bVar184 * auVar302._12_4_ | (uint)!bVar184 * auVar304._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar321._16_4_ = (uint)bVar184 * auVar302._16_4_ | (uint)!bVar184 * auVar304._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar321._20_4_ = (uint)bVar184 * auVar302._20_4_ | (uint)!bVar184 * auVar304._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar321._24_4_ = (uint)bVar184 * auVar302._24_4_ | (uint)!bVar184 * auVar304._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar321._28_4_ = (uint)bVar184 * auVar302._28_4_ | (uint)!bVar184 * auVar304._28_4_
                ;
                bVar184 = (bool)(bVar16 & 1);
                auVar321._32_4_ = (uint)bVar184 * auVar302._32_4_ | (uint)!bVar184 * auVar304._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar321._36_4_ = (uint)bVar184 * auVar302._36_4_ | (uint)!bVar184 * auVar304._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar321._40_4_ = (uint)bVar184 * auVar302._40_4_ | (uint)!bVar184 * auVar304._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar321._44_4_ = (uint)bVar184 * auVar302._44_4_ | (uint)!bVar184 * auVar304._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar321._48_4_ = (uint)bVar184 * auVar302._48_4_ | (uint)!bVar184 * auVar304._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar321._52_4_ = (uint)bVar184 * auVar302._52_4_ | (uint)!bVar184 * auVar304._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar321._56_4_ = (uint)bVar184 * auVar302._56_4_ | (uint)!bVar184 * auVar304._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar321._60_4_ = (uint)bVar184 * auVar302._60_4_ | (uint)!bVar184 * auVar304._60_4_
                ;
                auVar302 = vfmadd231ps_avx512f(auVar305,auVar321,
                                               (undefined1  [64])_ps512_cephes_log_q1);
                auVar302 = vfmadd231ps_avx512f(auVar302,auVar315,auVar303);
                auVar302 = vfmadd231ps_avx512f(auVar302,auVar321,
                                               (undefined1  [64])_ps512_cephes_log_q2);
                auVar302 = vmulps_avx512f(auVar302,auVar300);
                auVar303 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar322._0_4_ = (uint)bVar184 * auVar303._0_4_ | (uint)!bVar184 * auVar302._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar322._4_4_ = (uint)bVar184 * auVar303._4_4_ | (uint)!bVar184 * auVar302._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar322._8_4_ = (uint)bVar184 * auVar303._8_4_ | (uint)!bVar184 * auVar302._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar322._12_4_ = (uint)bVar184 * auVar303._12_4_ | (uint)!bVar184 * auVar302._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar322._16_4_ = (uint)bVar184 * auVar303._16_4_ | (uint)!bVar184 * auVar302._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar322._20_4_ = (uint)bVar184 * auVar303._20_4_ | (uint)!bVar184 * auVar302._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar322._24_4_ = (uint)bVar184 * auVar303._24_4_ | (uint)!bVar184 * auVar302._24_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 7) & 1);
                auVar322._28_4_ = (uint)bVar184 * auVar303._28_4_ | (uint)!bVar184 * auVar302._28_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 8) & 1);
                auVar322._32_4_ = (uint)bVar184 * auVar303._32_4_ | (uint)!bVar184 * auVar302._32_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 9) & 1);
                auVar322._36_4_ = (uint)bVar184 * auVar303._36_4_ | (uint)!bVar184 * auVar302._36_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 10) & 1);
                auVar322._40_4_ = (uint)bVar184 * auVar303._40_4_ | (uint)!bVar184 * auVar302._40_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xb) & 1);
                auVar322._44_4_ = (uint)bVar184 * auVar303._44_4_ | (uint)!bVar184 * auVar302._44_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xc) & 1);
                auVar322._48_4_ = (uint)bVar184 * auVar303._48_4_ | (uint)!bVar184 * auVar302._48_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xd) & 1);
                auVar322._52_4_ = (uint)bVar184 * auVar303._52_4_ | (uint)!bVar184 * auVar302._52_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xe) & 1);
                auVar322._56_4_ = (uint)bVar184 * auVar303._56_4_ | (uint)!bVar184 * auVar302._56_4_
                ;
                bVar184 = SUB81(uVar177 >> 0xf,0);
                auVar322._60_4_ = (uint)bVar184 * auVar303._60_4_ | (uint)!bVar184 * auVar302._60_4_
                ;
                auVar302 = vminps_avx512f(auVar322,(undefined1  [64])afVar121);
                auVar302 = vmaxps_avx512f(auVar302,(undefined1  [64])afVar122);
                auVar303 = vfmadd213ps_avx512f((undefined1  [64])afVar123,auVar302,
                                               (undefined1  [64])afVar129);
                auVar304 = vrndscaleps_avx512f(auVar303,1);
                uVar146 = vcmpps_avx512f(auVar303,auVar304,1);
                auVar303 = vsubps_avx512f(auVar304,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar323._0_4_ = (uint)bVar184 * auVar303._0_4_ | (uint)!bVar184 * auVar304._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar323._4_4_ = (uint)bVar184 * auVar303._4_4_ | (uint)!bVar184 * auVar304._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar323._8_4_ = (uint)bVar184 * auVar303._8_4_ | (uint)!bVar184 * auVar304._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar323._12_4_ = (uint)bVar184 * auVar303._12_4_ | (uint)!bVar184 * auVar304._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar323._16_4_ = (uint)bVar184 * auVar303._16_4_ | (uint)!bVar184 * auVar304._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar323._20_4_ = (uint)bVar184 * auVar303._20_4_ | (uint)!bVar184 * auVar304._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar323._24_4_ = (uint)bVar184 * auVar303._24_4_ | (uint)!bVar184 * auVar304._24_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 7) & 1);
                auVar323._28_4_ = (uint)bVar184 * auVar303._28_4_ | (uint)!bVar184 * auVar304._28_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 8) & 1);
                auVar323._32_4_ = (uint)bVar184 * auVar303._32_4_ | (uint)!bVar184 * auVar304._32_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 9) & 1);
                auVar323._36_4_ = (uint)bVar184 * auVar303._36_4_ | (uint)!bVar184 * auVar304._36_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 10) & 1);
                auVar323._40_4_ = (uint)bVar184 * auVar303._40_4_ | (uint)!bVar184 * auVar304._40_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xb) & 1);
                auVar323._44_4_ = (uint)bVar184 * auVar303._44_4_ | (uint)!bVar184 * auVar304._44_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xc) & 1);
                auVar323._48_4_ = (uint)bVar184 * auVar303._48_4_ | (uint)!bVar184 * auVar304._48_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xd) & 1);
                auVar323._52_4_ = (uint)bVar184 * auVar303._52_4_ | (uint)!bVar184 * auVar304._52_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 0xe) & 1);
                auVar323._56_4_ = (uint)bVar184 * auVar303._56_4_ | (uint)!bVar184 * auVar304._56_4_
                ;
                bVar184 = SUB81(uVar146 >> 0xf,0);
                auVar323._60_4_ = (uint)bVar184 * auVar303._60_4_ | (uint)!bVar184 * auVar304._60_4_
                ;
                auVar302 = vfmadd231ps_avx512f(auVar302,auVar323,auVar296);
                auVar302 = vfmadd231ps_avx512f(auVar302,auVar323,auVar297);
                auVar303 = vmulps_avx512f(auVar302,auVar302);
                auVar304 = vfmadd213ps_avx512f(auVar302,(undefined1  [64])afVar124,
                                               (undefined1  [64])afVar125);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar126);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar127);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar128);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar129);
                auVar302 = vfmadd213ps_avx512f(auVar304,auVar303,auVar302);
                auVar302 = vaddps_avx512f(auVar302,(undefined1  [64])afVar120);
                auVar303 = vcvttps2dq_avx512f(auVar323);
                auVar303 = vpaddd_avx512f(auVar303,auVar298);
                auVar303 = vpslld_avx512f(auVar303,0x17);
                auVar302 = vfmadd213ps_avx512f(auVar303,auVar302,auVar299);
                auVar302 = vdivps_avx512f(auVar299,auVar302);
                auVar302 = vfnmsub213ps_avx512f(auVar302,auVar300,auVar299);
                goto LAB_0026a2b7;
              case 6:
                puVar11 = (uint *)(this->super_Deconvolution).activation_params.data;
                auVar302 = vbroadcastss_avx512f(ZEXT416(*puVar11));
                uVar1 = puVar11[1];
                auVar102._4_4_ = uVar1;
                auVar102._0_4_ = uVar1;
                auVar102._8_4_ = uVar1;
                auVar102._12_4_ = uVar1;
                auVar102._16_4_ = uVar1;
                auVar102._20_4_ = uVar1;
                auVar102._24_4_ = uVar1;
                auVar102._28_4_ = uVar1;
                auVar102._32_4_ = uVar1;
                auVar102._36_4_ = uVar1;
                auVar102._40_4_ = uVar1;
                auVar102._44_4_ = uVar1;
                auVar102._48_4_ = uVar1;
                auVar102._52_4_ = uVar1;
                auVar102._56_4_ = uVar1;
                auVar102._60_4_ = uVar1;
                auVar302 = vfmadd213ps_avx512f(auVar302,auVar301,auVar102);
                auVar302 = vmaxps_avx512f(auVar302,in_ZMM29);
                auVar302 = vminps_avx512f(auVar302,auVar299);
LAB_0026a2b7:
                auVar325 = vmulps_avx512f(auVar302,auVar301);
              }
              *local_2a8 = auVar325;
              local_2a8 = local_2a8 + 1;
              iVar144 = iVar144 + 1;
            }
          }
        }
      }
      auVar185 = in_ZMM29._0_16_;
      if ((iVar174 == 0x10) && (uVar151 == 4)) {
        uVar157 = (this->super_Deconvolution).kernel_w;
        uVar160 = (this->super_Deconvolution).kernel_h;
        iVar139 = (this->super_Deconvolution).dilation_w;
        iVar138 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar152 = (this->super_Deconvolution).stride_h;
        iVar153 = (this->super_Deconvolution).activation_type;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        uVar166 = 0;
        uVar165 = 0;
        if (0 < (int)uVar157) {
          uVar165 = (ulong)uVar157;
        }
        uVar154 = 0;
        if (0 < (int)uVar160) {
          uVar154 = (ulong)uVar160;
        }
        uVar178 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar178 = uVar166;
        }
        auVar208._8_4_ = 0x42b0c0a5;
        auVar208._0_8_ = 0x42b0c0a542b0c0a5;
        auVar208._12_4_ = 0x42b0c0a5;
        auVar209._8_4_ = 0xc2b0c0a5;
        auVar209._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar209._12_4_ = 0xc2b0c0a5;
        auVar210._8_4_ = 0x3f000000;
        auVar210._0_8_ = 0x3f0000003f000000;
        auVar210._12_4_ = 0x3f000000;
        auVar211._8_4_ = 0x3fb8aa3b;
        auVar211._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar211._12_4_ = 0x3fb8aa3b;
        auVar212._8_4_ = 0x3f800000;
        auVar212._0_8_ = 0x3f8000003f800000;
        auVar212._12_4_ = 0x3f800000;
        auVar213._8_4_ = 0x3f318000;
        auVar213._0_8_ = 0x3f3180003f318000;
        auVar213._12_4_ = 0x3f318000;
        auVar186 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar214._8_4_ = 0x3ab743ce;
        auVar214._0_8_ = 0x3ab743ce3ab743ce;
        auVar214._12_4_ = 0x3ab743ce;
        auVar219._8_4_ = 0x3c088908;
        auVar219._0_8_ = 0x3c0889083c088908;
        auVar219._12_4_ = 0x3c088908;
        auVar215._8_4_ = 0x3d2aa9c1;
        auVar215._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar215._12_4_ = 0x3d2aa9c1;
        auVar216._8_4_ = 0x3e2aaaaa;
        auVar216._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar216._12_4_ = 0x3e2aaaaa;
        auVar217._8_4_ = 0x3f800000;
        auVar217._0_8_ = 0x3f8000003f800000;
        auVar217._12_4_ = 0x3f800000;
        auVar218._8_4_ = 0xb95e8083;
        auVar218._0_8_ = 0xb95e8083b95e8083;
        auVar218._12_4_ = 0xb95e8083;
        auVar187 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        for (; auVar185 = in_ZMM29._0_16_, uVar166 != uVar178; uVar166 = uVar166 + 1) {
          local_288 = (undefined1 (*) [32])
                      (local_1e8.cstep * uVar166 * local_1e8.elemsize + (long)local_1e8.data);
          iVar8 = bottom_blob->w;
          iVar7 = bottom_blob->h;
          uVar159 = 0;
          uVar158 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar158 = uVar159;
          }
          uVar180 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar180 = uVar159;
          }
          uVar142 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar142 = uVar159;
          }
          local_168._0_4_ = uVar142;
          for (; uVar159 != uVar142; uVar159 = uVar159 + 1) {
            iVar144 = (1 - uVar157) * iVar139;
            for (uVar170 = 0; uVar170 != uVar180; uVar170 = uVar170 + 1) {
              if (pvVar14 == (void *)0x0) {
                auVar185 = ZEXT816(0) << 0x40;
              }
              else {
                auVar185 = *(undefined1 (*) [16])((long)pvVar14 + uVar166 * 0x10);
              }
              auVar333 = ZEXT1664(auVar185);
              pvVar179 = bottom_blob->data;
              lVar150 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar166 * (this->weight_data_tm).elemsize +
                        0xf0;
              for (uVar146 = 0; uVar146 != uVar158; uVar146 = uVar146 + 1) {
                lVar155 = lVar150;
                for (uVar177 = 0; uVar177 != uVar154; uVar177 = uVar177 + 1) {
                  iVar140 = (((int)uVar177 - uVar160) + 1) * iVar138 + uVar159;
                  if (((-1 < iVar140) && (iVar141 = iVar140 / iVar152, iVar140 % iVar152 == 0)) &&
                     (iVar141 < iVar7)) {
                    lVar119 = (long)iVar141 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar146;
                    iVar140 = iVar144;
                    for (lVar164 = 0; uVar165 * 0x100 != lVar164; lVar164 = lVar164 + 0x100) {
                      if (((-1 < iVar140) && (iVar141 = iVar140 / iVar156, iVar140 % iVar156 == 0))
                         && (iVar141 < iVar8)) {
                        lVar145 = (long)(iVar141 << 4);
                        uVar335 = *(undefined4 *)((long)pvVar179 + lVar145 * 4 + lVar119);
                        auVar386._4_4_ = uVar335;
                        auVar386._0_4_ = uVar335;
                        auVar386._8_4_ = uVar335;
                        auVar386._12_4_ = uVar335;
                        uVar335 = *(undefined4 *)((long)pvVar179 + lVar145 * 4 + lVar119 + 4);
                        auVar408._4_4_ = uVar335;
                        auVar408._0_4_ = uVar335;
                        auVar408._8_4_ = uVar335;
                        auVar408._12_4_ = uVar335;
                        auVar188 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 8)));
                        auVar189 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0xc)));
                        auVar190 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x10)));
                        auVar191 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x14)));
                        auVar192 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x18)));
                        auVar193 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x1c)));
                        auVar194 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x20)));
                        auVar195 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x24)));
                        auVar196 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x28)));
                        auVar197 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x2c)));
                        auVar198 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x30)));
                        auVar199 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x34)));
                        auVar200 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x38)));
                        in_ZMM29 = ZEXT1664(auVar200);
                        auVar201 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x3c)));
                        auVar185 = vfmadd231ps_fma(auVar333._0_16_,auVar386,
                                                   *(undefined1 (*) [16])(lVar155 + -0xf0 + lVar164)
                                                  );
                        auVar185 = vfmadd231ps_fma(auVar185,auVar408,
                                                   *(undefined1 (*) [16])(lVar155 + -0xe0 + lVar164)
                                                  );
                        auVar185 = vfmadd231ps_avx512vl
                                             (auVar185,auVar188,
                                              *(undefined1 (*) [16])(lVar155 + -0xd0 + lVar164));
                        auVar185 = vfmadd231ps_avx512vl
                                             (auVar185,auVar189,
                                              *(undefined1 (*) [16])(lVar155 + -0xc0 + lVar164));
                        auVar185 = vfmadd231ps_avx512vl
                                             (auVar185,auVar190,
                                              *(undefined1 (*) [16])(lVar155 + -0xb0 + lVar164));
                        auVar185 = vfmadd231ps_avx512vl
                                             (auVar185,auVar191,
                                              *(undefined1 (*) [16])(lVar155 + -0xa0 + lVar164));
                        auVar185 = vfmadd231ps_avx512vl
                                             (auVar185,auVar192,
                                              *(undefined1 (*) [16])(lVar155 + -0x90 + lVar164));
                        auVar185 = vfmadd231ps_avx512vl
                                             (auVar185,auVar193,
                                              *(undefined1 (*) [16])(lVar155 + -0x80 + lVar164));
                        auVar185 = vfmadd231ps_avx512vl
                                             (auVar185,auVar194,
                                              *(undefined1 (*) [16])(lVar155 + -0x70 + lVar164));
                        auVar185 = vfmadd231ps_avx512vl
                                             (auVar185,auVar195,
                                              *(undefined1 (*) [16])(lVar155 + -0x60 + lVar164));
                        auVar185 = vfmadd231ps_avx512vl
                                             (auVar185,auVar196,
                                              *(undefined1 (*) [16])(lVar155 + -0x50 + lVar164));
                        auVar185 = vfmadd231ps_avx512vl
                                             (auVar185,auVar197,
                                              *(undefined1 (*) [16])(lVar155 + -0x40 + lVar164));
                        auVar185 = vfmadd231ps_avx512vl
                                             (auVar185,auVar198,
                                              *(undefined1 (*) [16])(lVar155 + -0x30 + lVar164));
                        auVar185 = vfmadd231ps_avx512vl
                                             (auVar185,auVar199,
                                              *(undefined1 (*) [16])(lVar155 + -0x20 + lVar164));
                        auVar185 = vfmadd231ps_avx512vl
                                             (auVar185,auVar200,
                                              *(undefined1 (*) [16])(lVar155 + -0x10 + lVar164));
                        auVar185 = vfmadd231ps_avx512vl
                                             (auVar185,auVar201,
                                              *(undefined1 (*) [16])(lVar155 + lVar164));
                        auVar333 = ZEXT1664(auVar185);
                      }
                      iVar140 = iVar140 + iVar139;
                    }
                  }
                  lVar155 = lVar155 + (long)(int)uVar157 * 0x100;
                }
                lVar150 = lVar150 + (long)(int)(uVar157 * uVar160 * 0x40) * 4;
              }
              auVar185 = auVar333._0_16_;
              auVar188 = auVar185;
              if (iVar153 - 1U < 6) {
                auVar188 = vmaxps_avx(auVar185,(undefined1  [16])0x0);
                switch(iVar153) {
                case 2:
                  auVar185 = vminps_avx(auVar185,(undefined1  [16])0x0);
                  uVar335 = *(this->super_Deconvolution).activation_params.data;
                  auVar24._4_4_ = uVar335;
                  auVar24._0_4_ = uVar335;
                  auVar24._8_4_ = uVar335;
                  auVar24._12_4_ = uVar335;
                  auVar188 = vfmadd231ps_avx512vl(auVar188,auVar185,auVar24);
                  break;
                case 3:
                  puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar335 = *puVar10;
                  auVar22._4_4_ = uVar335;
                  auVar22._0_4_ = uVar335;
                  auVar22._8_4_ = uVar335;
                  auVar22._12_4_ = uVar335;
                  auVar185 = vmaxps_avx512vl(auVar185,auVar22);
                  uVar335 = puVar10[1];
                  auVar23._4_4_ = uVar335;
                  auVar23._0_4_ = uVar335;
                  auVar23._8_4_ = uVar335;
                  auVar23._12_4_ = uVar335;
                  auVar188 = vminps_avx512vl(auVar185,auVar23);
                  break;
                case 4:
                  auVar20._8_4_ = 0x80000000;
                  auVar20._0_8_ = 0x8000000080000000;
                  auVar20._12_4_ = 0x80000000;
                  auVar185 = vxorps_avx512vl(auVar185,auVar20);
                  auVar185 = vminps_avx(auVar185,auVar208);
                  auVar185 = vmaxps_avx(auVar185,auVar209);
                  auVar188 = vfmadd231ps_fma(auVar210,auVar185,auVar211);
                  auVar189 = vcvttps2dq_avx512vl(auVar188);
                  auVar189 = vcvtdq2ps_avx512vl(auVar189);
                  uVar146 = vcmpps_avx512vl(auVar188,auVar189,1);
                  auVar188 = vsubps_avx512vl(auVar189,auVar212);
                  bVar184 = (bool)((byte)uVar146 & 1);
                  auVar207._0_4_ = (uint)bVar184 * auVar188._0_4_ | (uint)!bVar184 * auVar189._0_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                  auVar207._4_4_ = (uint)bVar184 * auVar188._4_4_ | (uint)!bVar184 * auVar189._4_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                  auVar207._8_4_ = (uint)bVar184 * auVar188._8_4_ | (uint)!bVar184 * auVar189._8_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                  auVar207._12_4_ =
                       (uint)bVar184 * auVar188._12_4_ | (uint)!bVar184 * auVar189._12_4_;
                  auVar185 = vfmsub231ps_avx512vl(auVar185,auVar207,auVar213);
                  auVar21._8_4_ = 0x395e8083;
                  auVar21._0_8_ = 0x395e8083395e8083;
                  auVar21._12_4_ = 0x395e8083;
                  auVar188 = vfmsub231ps_avx512vl(auVar185,auVar207,auVar21);
                  auVar387._0_4_ = auVar188._0_4_ * auVar188._0_4_;
                  auVar387._4_4_ = auVar188._4_4_ * auVar188._4_4_;
                  auVar387._8_4_ = auVar188._8_4_ * auVar188._8_4_;
                  auVar387._12_4_ = auVar188._12_4_ * auVar188._12_4_;
                  auVar185 = vfmadd213ps_fma(auVar186,auVar188,auVar214);
                  auVar185 = vfmadd213ps_fma(auVar185,auVar188,auVar219);
                  auVar185 = vfmadd213ps_fma(auVar185,auVar188,auVar215);
                  auVar185 = vfmadd213ps_fma(auVar185,auVar188,auVar216);
                  auVar185 = vfmadd213ps_fma(auVar185,auVar188,auVar210);
                  auVar185 = vfmadd213ps_fma(auVar185,auVar387,auVar188);
                  auVar336._0_4_ = auVar185._0_4_ + 1.0;
                  auVar336._4_4_ = auVar185._4_4_ + 1.0;
                  auVar336._8_4_ = auVar185._8_4_ + 1.0;
                  auVar336._12_4_ = auVar185._12_4_ + 1.0;
                  auVar185 = vcvttps2dq_avx512vl(auVar207);
                  auVar185 = vpslld_avx(auVar185,0x17);
                  auVar185 = vpaddd_avx(auVar185,auVar217);
                  auVar185 = vfmadd213ps_fma(auVar185,auVar336,auVar212);
                  auVar188 = vdivps_avx(auVar212,auVar185);
                  break;
                case 5:
                  auVar188 = vminps_avx(auVar185,auVar208);
                  auVar188 = vmaxps_avx(auVar188,auVar209);
                  auVar189 = vfmadd213ps_fma(auVar211,auVar188,auVar210);
                  auVar190 = vcvttps2dq_avx512vl(auVar189);
                  auVar190 = vcvtdq2ps_avx512vl(auVar190);
                  uVar146 = vcmpps_avx512vl(auVar189,auVar190,1);
                  auVar189 = vsubps_avx512vl(auVar190,auVar212);
                  bVar184 = (bool)((byte)uVar146 & 1);
                  auVar202._0_4_ = (uint)bVar184 * auVar189._0_4_ | (uint)!bVar184 * auVar190._0_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                  auVar202._4_4_ = (uint)bVar184 * auVar189._4_4_ | (uint)!bVar184 * auVar190._4_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                  auVar202._8_4_ = (uint)bVar184 * auVar189._8_4_ | (uint)!bVar184 * auVar190._8_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                  auVar202._12_4_ =
                       (uint)bVar184 * auVar189._12_4_ | (uint)!bVar184 * auVar190._12_4_;
                  auVar188 = vfmsub231ps_avx512vl(auVar188,auVar202,auVar213);
                  auVar188 = vfnmsub231ps_avx512vl(auVar188,auVar202,auVar218);
                  auVar409._0_4_ = auVar188._0_4_ * auVar188._0_4_;
                  auVar409._4_4_ = auVar188._4_4_ * auVar188._4_4_;
                  auVar409._8_4_ = auVar188._8_4_ * auVar188._8_4_;
                  auVar409._12_4_ = auVar188._12_4_ * auVar188._12_4_;
                  auVar189 = vfmadd213ps_avx512vl(auVar186,auVar188,auVar214);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar188,auVar219);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar188,auVar215);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar188,auVar216);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar188,auVar210);
                  auVar188 = vfmadd213ps_avx512vl(auVar189,auVar409,auVar188);
                  auVar189 = vaddps_avx512vl(auVar188,auVar212);
                  auVar188 = vcvttps2dq_avx512vl(auVar202);
                  auVar188 = vpslld_avx(auVar188,0x17);
                  auVar188 = vpaddd_avx(auVar188,auVar217);
                  auVar188 = vfmadd213ps_fma(auVar188,auVar189,auVar212);
                  uVar146 = vcmpps_avx512vl(auVar188,(undefined1  [16])0x0,2);
                  auVar191._8_4_ = 0x800000;
                  auVar191._0_8_ = 0x80000000800000;
                  auVar191._12_4_ = 0x800000;
                  auVar188 = vmaxps_avx512vl(auVar188,auVar191);
                  auVar191 = vpsrld_avx(auVar188,0x17);
                  auVar189 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar192._8_4_ = 0x3f000000;
                  auVar192._0_8_ = 0x3f0000003f000000;
                  auVar192._12_4_ = 0x3f000000;
                  auVar188 = vpternlogd_avx512vl(auVar188,auVar189,auVar192,0xea);
                  auVar193._8_4_ = 0x3f3504f3;
                  auVar193._0_8_ = 0x3f3504f33f3504f3;
                  auVar193._12_4_ = 0x3f3504f3;
                  uVar177 = vcmpps_avx512vl(auVar188,auVar193,1);
                  auVar194._8_4_ = 0xbf800000;
                  auVar194._0_8_ = 0xbf800000bf800000;
                  auVar194._12_4_ = 0xbf800000;
                  auVar189 = vaddps_avx512vl(auVar188,auVar194);
                  auVar188 = vaddps_avx512vl(auVar189,auVar188);
                  bVar184 = (bool)((byte)uVar177 & 1);
                  auVar203._0_4_ = (uint)bVar184 * auVar188._0_4_ | (uint)!bVar184 * auVar189._0_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                  auVar203._4_4_ = (uint)bVar184 * auVar188._4_4_ | (uint)!bVar184 * auVar189._4_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                  auVar203._8_4_ = (uint)bVar184 * auVar188._8_4_ | (uint)!bVar184 * auVar189._8_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                  auVar203._12_4_ =
                       (uint)bVar184 * auVar188._12_4_ | (uint)!bVar184 * auVar189._12_4_;
                  auVar189 = vmulps_avx512vl(auVar203,auVar203);
                  auVar188 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                  auVar195._8_4_ = 0xbdebd1b8;
                  auVar195._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar195._12_4_ = 0xbdebd1b8;
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar203,auVar195);
                  auVar196._8_4_ = 0x3def251a;
                  auVar196._0_8_ = 0x3def251a3def251a;
                  auVar196._12_4_ = 0x3def251a;
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar203,auVar196);
                  auVar197._8_4_ = 0xbdfe5d4f;
                  auVar197._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar197._12_4_ = 0xbdfe5d4f;
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar203,auVar197);
                  auVar198._8_4_ = 0x3e11e9bf;
                  auVar198._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar198._12_4_ = 0x3e11e9bf;
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar203,auVar198);
                  auVar199._8_4_ = 0xbe2aae50;
                  auVar199._0_8_ = 0xbe2aae50be2aae50;
                  auVar199._12_4_ = 0xbe2aae50;
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar203,auVar199);
                  auVar200._8_4_ = 0x3e4cceac;
                  auVar200._0_8_ = 0x3e4cceac3e4cceac;
                  auVar200._12_4_ = 0x3e4cceac;
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar203,auVar200);
                  auVar201._8_4_ = 0xbe7ffffc;
                  auVar201._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar201._12_4_ = 0xbe7ffffc;
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar203,auVar201);
                  auVar18._8_4_ = 0x3eaaaaaa;
                  auVar18._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar18._12_4_ = 0x3eaaaaaa;
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar203,auVar18);
                  auVar190 = vmulps_avx512vl(auVar189,auVar203);
                  auVar190 = vmulps_avx512vl(auVar190,auVar188);
                  auVar19._8_4_ = 0xffffff82;
                  auVar19._0_8_ = 0xffffff82ffffff82;
                  auVar19._12_4_ = 0xffffff82;
                  auVar188 = vpaddd_avx512vl(auVar191,auVar19);
                  auVar188 = vcvtdq2ps_avx(auVar188);
                  auVar191 = vsubps_avx512vl(auVar188,auVar212);
                  bVar184 = (bool)((byte)uVar177 & 1);
                  auVar204._0_4_ = (uint)bVar184 * auVar191._0_4_ | (uint)!bVar184 * auVar188._0_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                  auVar204._4_4_ = (uint)bVar184 * auVar191._4_4_ | (uint)!bVar184 * auVar188._4_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                  auVar204._8_4_ = (uint)bVar184 * auVar191._8_4_ | (uint)!bVar184 * auVar188._8_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                  auVar204._12_4_ =
                       (uint)bVar184 * auVar191._12_4_ | (uint)!bVar184 * auVar188._12_4_;
                  auVar188 = vfmadd231ps_avx512vl(auVar190,auVar204,auVar218);
                  auVar188 = vfmsub231ps_avx512vl(auVar188,auVar210,auVar189);
                  auVar188 = vsubps_avx512vl(auVar188,auVar203);
                  auVar188 = vfnmadd231ps_fma(auVar188,auVar213,auVar204);
                  auVar189 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar184 = (bool)((byte)uVar146 & 1);
                  auVar205._0_4_ =
                       (uint)bVar184 * auVar189._0_4_ |
                       (uint)!bVar184 * (int)(auVar188._0_4_ + auVar188._0_4_);
                  bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                  auVar205._4_4_ =
                       (uint)bVar184 * auVar189._4_4_ |
                       (uint)!bVar184 * (int)(auVar188._4_4_ + auVar188._4_4_);
                  bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                  auVar205._8_4_ =
                       (uint)bVar184 * auVar189._8_4_ |
                       (uint)!bVar184 * (int)(auVar188._8_4_ + auVar188._8_4_);
                  bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                  auVar205._12_4_ =
                       (uint)bVar184 * auVar189._12_4_ |
                       (uint)!bVar184 * (int)(auVar188._12_4_ + auVar188._12_4_);
                  auVar188 = vminps_avx(auVar205,auVar208);
                  auVar188 = vmaxps_avx(auVar188,auVar209);
                  auVar189 = vfmadd213ps_fma(auVar211,auVar188,auVar210);
                  auVar190 = vcvttps2dq_avx512vl(auVar189);
                  auVar190 = vcvtdq2ps_avx512vl(auVar190);
                  uVar146 = vcmpps_avx512vl(auVar189,auVar190,1);
                  auVar189 = vsubps_avx512vl(auVar190,auVar212);
                  bVar184 = (bool)((byte)uVar146 & 1);
                  auVar206._0_4_ = (uint)bVar184 * auVar189._0_4_ | (uint)!bVar184 * auVar190._0_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                  auVar206._4_4_ = (uint)bVar184 * auVar189._4_4_ | (uint)!bVar184 * auVar190._4_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                  auVar206._8_4_ = (uint)bVar184 * auVar189._8_4_ | (uint)!bVar184 * auVar190._8_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                  auVar206._12_4_ =
                       (uint)bVar184 * auVar189._12_4_ | (uint)!bVar184 * auVar190._12_4_;
                  auVar188 = vfmsub231ps_avx512vl(auVar188,auVar206,auVar213);
                  auVar188 = vfnmsub231ps_avx512vl(auVar188,auVar206,auVar218);
                  auVar410._0_4_ = auVar188._0_4_ * auVar188._0_4_;
                  auVar410._4_4_ = auVar188._4_4_ * auVar188._4_4_;
                  auVar410._8_4_ = auVar188._8_4_ * auVar188._8_4_;
                  auVar410._12_4_ = auVar188._12_4_ * auVar188._12_4_;
                  auVar189 = vfmadd213ps_avx512vl(auVar186,auVar188,auVar214);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar188,auVar219);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar188,auVar215);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar188,auVar216);
                  auVar189 = vfmadd213ps_avx512vl(auVar189,auVar188,auVar210);
                  auVar188 = vfmadd213ps_avx512vl(auVar189,auVar410,auVar188);
                  auVar189 = vaddps_avx512vl(auVar188,auVar212);
                  auVar188 = vcvttps2dq_avx512vl(auVar206);
                  auVar188 = vpslld_avx(auVar188,0x17);
                  auVar188 = vpaddd_avx(auVar188,auVar217);
                  auVar188 = vfmadd213ps_fma(auVar188,auVar189,auVar212);
                  auVar188 = vdivps_avx512vl(auVar187,auVar188);
                  auVar188 = vfmsub213ps_fma(auVar188,auVar185,auVar185);
                  break;
                case 6:
                  puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar335 = *puVar10;
                  auVar190._4_4_ = uVar335;
                  auVar190._0_4_ = uVar335;
                  auVar190._8_4_ = uVar335;
                  auVar190._12_4_ = uVar335;
                  uVar335 = puVar10[1];
                  auVar189._4_4_ = uVar335;
                  auVar189._0_4_ = uVar335;
                  auVar189._8_4_ = uVar335;
                  auVar189._12_4_ = uVar335;
                  auVar185 = vfmadd213ps_avx512vl(auVar190,auVar185,auVar189);
                  auVar185 = vmaxps_avx(auVar185,(undefined1  [16])0x0);
                  auVar185 = vminps_avx(auVar185,auVar212);
                  auVar188._0_4_ = auVar185._0_4_ * auVar333._0_4_;
                  auVar188._4_4_ = auVar185._4_4_ * auVar333._4_4_;
                  auVar188._8_4_ = auVar185._8_4_ * auVar333._8_4_;
                  auVar188._12_4_ = auVar185._12_4_ * auVar333._12_4_;
                }
              }
              *(undefined1 (*) [16])local_288 = auVar188;
              local_288 = (undefined1 (*) [32])((long)local_288 + 0x10);
              iVar144 = iVar144 + 1;
            }
          }
        }
      }
      afVar136 = _ps512_cephes_log_p8;
      afVar135 = _ps512_cephes_log_p7;
      afVar134 = _ps512_cephes_log_p6;
      afVar133 = _ps512_cephes_log_p5;
      afVar132 = _ps512_cephes_log_p4;
      afVar131 = _ps512_cephes_log_p3;
      afVar130 = _ps512_cephes_log_p2;
      afVar129 = ::_ps512_cephes_exp_p5;
      afVar128 = ::_ps512_cephes_exp_p4;
      afVar127 = ::_ps512_cephes_exp_p3;
      afVar126 = ::_ps512_cephes_exp_p2;
      afVar125 = ::_ps512_cephes_exp_p1;
      afVar124 = ::_ps512_cephes_exp_p0;
      afVar123 = ::_ps512_cephes_LOG2EF;
      afVar122 = ::_ps512_exp_lo;
      afVar121 = ::_ps512_exp_hi;
      afVar120 = ::_ps512_1;
      if ((iVar174 == 1) && (uVar151 == 0x10)) {
        uVar157 = (this->super_Deconvolution).kernel_w;
        uVar160 = (this->super_Deconvolution).kernel_h;
        iVar139 = (this->super_Deconvolution).dilation_w;
        iVar138 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar152 = (this->super_Deconvolution).stride_h;
        iVar153 = (this->super_Deconvolution).activation_type;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        auVar333 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar296 = vxorps_avx512dq(auVar333,(undefined1  [64])_ps512_cephes_log_q2);
        auVar297 = vxorps_avx512dq(auVar333,(undefined1  [64])_ps512_cephes_log_q1);
        auVar298 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar315 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar333);
        uVar165 = 0;
        if (0 < (int)uVar157) {
          uVar165 = (ulong)uVar157;
        }
        uVar166 = 0;
        if (0 < (int)uVar160) {
          uVar166 = (ulong)uVar160;
        }
        uVar154 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar154 = 0;
        }
        uVar178 = 0;
        auVar185 = vxorps_avx512vl(auVar185,auVar185);
        auVar301 = ZEXT1664(auVar185);
        auVar299 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar300 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
        for (; uVar178 != uVar154; uVar178 = uVar178 + 1) {
          local_2a8 = (undefined1 (*) [64])
                      (local_1e8.cstep * uVar178 * local_1e8.elemsize + (long)local_1e8.data);
          iVar8 = bottom_blob->w;
          iVar7 = bottom_blob->h;
          uVar177 = 0;
          uVar146 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar146 = uVar177;
          }
          uVar158 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar158 = 0;
          }
          uVar159 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar159 = 0;
          }
          local_168._0_4_ = uVar159;
          while (uVar180 = (uint)uVar177, uVar180 != uVar159) {
            iVar144 = (1 - uVar157) * iVar139;
            for (uVar142 = 0; uVar142 != uVar158; uVar142 = uVar142 + 1) {
              if (pvVar14 == (void *)0x0) {
                auVar302 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar302 = *(undefined1 (*) [64])((long)pvVar14 + uVar178 * 0x40);
              }
              pvVar179 = (void *)((this->weight_data_tm).cstep * uVar178 *
                                  (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              for (uVar177 = 0; uVar177 != uVar146; uVar177 = uVar177 + 1) {
                pvVar171 = pvVar179;
                for (uVar181 = 0; uVar181 != uVar166; uVar181 = uVar181 + 1) {
                  iVar140 = (((int)uVar181 - uVar160) + 1) * iVar138 + uVar180;
                  if (((-1 < iVar140) && (iVar141 = iVar140 / iVar152, iVar140 % iVar152 == 0)) &&
                     (iVar141 < iVar7)) {
                    iVar140 = iVar144;
                    for (lVar150 = 0; uVar165 * 0x40 != lVar150; lVar150 = lVar150 + 0x40) {
                      if (((-1 < iVar140) && (iVar143 = iVar140 / iVar156, iVar140 % iVar156 == 0))
                         && (iVar143 < iVar8)) {
                        auVar303 = vbroadcastss_avx512f
                                             (ZEXT416(*(uint *)((long)bottom_blob->data +
                                                               (long)iVar143 * 4 +
                                                               (long)iVar141 *
                                                               (long)bottom_blob->w *
                                                               bottom_blob->elemsize +
                                                               bottom_blob->cstep *
                                                               bottom_blob->elemsize * uVar177)));
                        auVar302 = vfmadd231ps_avx512f(auVar302,auVar303,
                                                       *(undefined1 (*) [64])
                                                        ((long)pvVar171 + lVar150));
                      }
                      iVar140 = iVar140 + iVar139;
                    }
                  }
                  pvVar171 = (void *)((long)pvVar171 + (long)(int)uVar157 * 0x40);
                }
                pvVar179 = (void *)((long)pvVar179 + (long)(int)(uVar157 * uVar160 * 0x10) * 4);
              }
              auVar332 = auVar302;
              switch(iVar153) {
              case 1:
                auVar332 = vmaxps_avx512f(auVar302,auVar301);
                break;
              case 2:
                uVar177 = vcmpps_avx512f(auVar302,auVar301,1);
                uVar335 = *(this->super_Deconvolution).activation_params.data;
                auVar109._4_4_ = uVar335;
                auVar109._0_4_ = uVar335;
                auVar109._8_4_ = uVar335;
                auVar109._12_4_ = uVar335;
                auVar109._16_4_ = uVar335;
                auVar109._20_4_ = uVar335;
                auVar109._24_4_ = uVar335;
                auVar109._28_4_ = uVar335;
                auVar109._32_4_ = uVar335;
                auVar109._36_4_ = uVar335;
                auVar109._40_4_ = uVar335;
                auVar109._44_4_ = uVar335;
                auVar109._48_4_ = uVar335;
                auVar109._52_4_ = uVar335;
                auVar109._56_4_ = uVar335;
                auVar109._60_4_ = uVar335;
                auVar303 = vmulps_avx512f(auVar302,auVar109);
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar332._0_4_ = (uint)bVar184 * auVar303._0_4_ | (uint)!bVar184 * auVar302._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar332._4_4_ = (uint)bVar184 * auVar303._4_4_ | (uint)!bVar184 * auVar302._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar332._8_4_ = (uint)bVar184 * auVar303._8_4_ | (uint)!bVar184 * auVar302._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar332._12_4_ = (uint)bVar184 * auVar303._12_4_ | (uint)!bVar184 * auVar302._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar332._16_4_ = (uint)bVar184 * auVar303._16_4_ | (uint)!bVar184 * auVar302._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar332._20_4_ = (uint)bVar184 * auVar303._20_4_ | (uint)!bVar184 * auVar302._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar332._24_4_ = (uint)bVar184 * auVar303._24_4_ | (uint)!bVar184 * auVar302._24_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 7) & 1);
                auVar332._28_4_ = (uint)bVar184 * auVar303._28_4_ | (uint)!bVar184 * auVar302._28_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 8) & 1);
                auVar332._32_4_ = (uint)bVar184 * auVar303._32_4_ | (uint)!bVar184 * auVar302._32_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 9) & 1);
                auVar332._36_4_ = (uint)bVar184 * auVar303._36_4_ | (uint)!bVar184 * auVar302._36_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 10) & 1);
                auVar332._40_4_ = (uint)bVar184 * auVar303._40_4_ | (uint)!bVar184 * auVar302._40_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xb) & 1);
                auVar332._44_4_ = (uint)bVar184 * auVar303._44_4_ | (uint)!bVar184 * auVar302._44_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xc) & 1);
                auVar332._48_4_ = (uint)bVar184 * auVar303._48_4_ | (uint)!bVar184 * auVar302._48_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xd) & 1);
                auVar332._52_4_ = (uint)bVar184 * auVar303._52_4_ | (uint)!bVar184 * auVar302._52_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xe) & 1);
                auVar332._56_4_ = (uint)bVar184 * auVar303._56_4_ | (uint)!bVar184 * auVar302._56_4_
                ;
                bVar184 = SUB81(uVar177 >> 0xf,0);
                auVar332._60_4_ = (uint)bVar184 * auVar303._60_4_ | (uint)!bVar184 * auVar302._60_4_
                ;
                break;
              case 3:
                puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar335 = *puVar10;
                auVar107._4_4_ = uVar335;
                auVar107._0_4_ = uVar335;
                auVar107._8_4_ = uVar335;
                auVar107._12_4_ = uVar335;
                auVar107._16_4_ = uVar335;
                auVar107._20_4_ = uVar335;
                auVar107._24_4_ = uVar335;
                auVar107._28_4_ = uVar335;
                auVar107._32_4_ = uVar335;
                auVar107._36_4_ = uVar335;
                auVar107._40_4_ = uVar335;
                auVar107._44_4_ = uVar335;
                auVar107._48_4_ = uVar335;
                auVar107._52_4_ = uVar335;
                auVar107._56_4_ = uVar335;
                auVar107._60_4_ = uVar335;
                auVar302 = vmaxps_avx512f(auVar302,auVar107);
                uVar335 = puVar10[1];
                auVar108._4_4_ = uVar335;
                auVar108._0_4_ = uVar335;
                auVar108._8_4_ = uVar335;
                auVar108._12_4_ = uVar335;
                auVar108._16_4_ = uVar335;
                auVar108._20_4_ = uVar335;
                auVar108._24_4_ = uVar335;
                auVar108._28_4_ = uVar335;
                auVar108._32_4_ = uVar335;
                auVar108._36_4_ = uVar335;
                auVar108._40_4_ = uVar335;
                auVar108._44_4_ = uVar335;
                auVar108._48_4_ = uVar335;
                auVar108._52_4_ = uVar335;
                auVar108._56_4_ = uVar335;
                auVar108._60_4_ = uVar335;
                auVar332 = vminps_avx512f(auVar302,auVar108);
                break;
              case 4:
                auVar302 = vxorps_avx512dq(auVar302,auVar333);
                auVar302 = vminps_avx512f(auVar302,(undefined1  [64])afVar121);
                auVar302 = vmaxps_avx512f(auVar302,(undefined1  [64])afVar122);
                auVar303 = vfmadd213ps_avx512f((undefined1  [64])afVar123,auVar302,
                                               (undefined1  [64])afVar129);
                auVar304 = vrndscaleps_avx512f(auVar303,1);
                uVar177 = vcmpps_avx512f(auVar303,auVar304,1);
                auVar303 = vsubps_avx512f(auVar304,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar331._0_4_ = (uint)bVar184 * auVar303._0_4_ | (uint)!bVar184 * auVar304._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar331._4_4_ = (uint)bVar184 * auVar303._4_4_ | (uint)!bVar184 * auVar304._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar331._8_4_ = (uint)bVar184 * auVar303._8_4_ | (uint)!bVar184 * auVar304._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar331._12_4_ = (uint)bVar184 * auVar303._12_4_ | (uint)!bVar184 * auVar304._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar331._16_4_ = (uint)bVar184 * auVar303._16_4_ | (uint)!bVar184 * auVar304._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar331._20_4_ = (uint)bVar184 * auVar303._20_4_ | (uint)!bVar184 * auVar304._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar331._24_4_ = (uint)bVar184 * auVar303._24_4_ | (uint)!bVar184 * auVar304._24_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 7) & 1);
                auVar331._28_4_ = (uint)bVar184 * auVar303._28_4_ | (uint)!bVar184 * auVar304._28_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 8) & 1);
                auVar331._32_4_ = (uint)bVar184 * auVar303._32_4_ | (uint)!bVar184 * auVar304._32_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 9) & 1);
                auVar331._36_4_ = (uint)bVar184 * auVar303._36_4_ | (uint)!bVar184 * auVar304._36_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 10) & 1);
                auVar331._40_4_ = (uint)bVar184 * auVar303._40_4_ | (uint)!bVar184 * auVar304._40_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xb) & 1);
                auVar331._44_4_ = (uint)bVar184 * auVar303._44_4_ | (uint)!bVar184 * auVar304._44_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xc) & 1);
                auVar331._48_4_ = (uint)bVar184 * auVar303._48_4_ | (uint)!bVar184 * auVar304._48_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xd) & 1);
                auVar331._52_4_ = (uint)bVar184 * auVar303._52_4_ | (uint)!bVar184 * auVar304._52_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xe) & 1);
                auVar331._56_4_ = (uint)bVar184 * auVar303._56_4_ | (uint)!bVar184 * auVar304._56_4_
                ;
                bVar184 = SUB81(uVar177 >> 0xf,0);
                auVar331._60_4_ = (uint)bVar184 * auVar303._60_4_ | (uint)!bVar184 * auVar304._60_4_
                ;
                auVar302 = vfmadd231ps_avx512f(auVar302,auVar331,auVar296);
                auVar302 = vfmadd231ps_avx512f(auVar302,auVar331,auVar297);
                auVar303 = vmulps_avx512f(auVar302,auVar302);
                auVar304 = vfmadd213ps_avx512f(auVar302,(undefined1  [64])afVar124,
                                               (undefined1  [64])afVar125);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar126);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar127);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar128);
                auVar304 = vfmadd213ps_avx512f(auVar304,auVar302,(undefined1  [64])afVar129);
                auVar302 = vfmadd213ps_avx512f(auVar304,auVar303,auVar302);
                auVar302 = vaddps_avx512f(auVar302,(undefined1  [64])afVar120);
                auVar303 = vcvttps2dq_avx512f(auVar331);
                auVar303 = vpaddd_avx512f(auVar303,auVar298);
                auVar303 = vpslld_avx512f(auVar303,0x17);
                auVar302 = vfmadd213ps_avx512f(auVar303,auVar302,auVar299);
                auVar332 = vdivps_avx512f(auVar299,auVar302);
                break;
              case 5:
                auVar303 = vminps_avx512f(auVar302,(undefined1  [64])afVar121);
                auVar303 = vmaxps_avx512f(auVar303,(undefined1  [64])afVar122);
                auVar304 = vfmadd213ps_avx512f((undefined1  [64])afVar123,auVar303,
                                               (undefined1  [64])afVar129);
                auVar305 = vrndscaleps_avx512f(auVar304,1);
                uVar177 = vcmpps_avx512f(auVar304,auVar305,1);
                auVar304 = vsubps_avx512f(auVar305,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar326._0_4_ = (uint)bVar184 * auVar304._0_4_ | (uint)!bVar184 * auVar305._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar326._4_4_ = (uint)bVar184 * auVar304._4_4_ | (uint)!bVar184 * auVar305._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar326._8_4_ = (uint)bVar184 * auVar304._8_4_ | (uint)!bVar184 * auVar305._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar326._12_4_ = (uint)bVar184 * auVar304._12_4_ | (uint)!bVar184 * auVar305._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar326._16_4_ = (uint)bVar184 * auVar304._16_4_ | (uint)!bVar184 * auVar305._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar326._20_4_ = (uint)bVar184 * auVar304._20_4_ | (uint)!bVar184 * auVar305._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar326._24_4_ = (uint)bVar184 * auVar304._24_4_ | (uint)!bVar184 * auVar305._24_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 7) & 1);
                auVar326._28_4_ = (uint)bVar184 * auVar304._28_4_ | (uint)!bVar184 * auVar305._28_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 8) & 1);
                auVar326._32_4_ = (uint)bVar184 * auVar304._32_4_ | (uint)!bVar184 * auVar305._32_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 9) & 1);
                auVar326._36_4_ = (uint)bVar184 * auVar304._36_4_ | (uint)!bVar184 * auVar305._36_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 10) & 1);
                auVar326._40_4_ = (uint)bVar184 * auVar304._40_4_ | (uint)!bVar184 * auVar305._40_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xb) & 1);
                auVar326._44_4_ = (uint)bVar184 * auVar304._44_4_ | (uint)!bVar184 * auVar305._44_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xc) & 1);
                auVar326._48_4_ = (uint)bVar184 * auVar304._48_4_ | (uint)!bVar184 * auVar305._48_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xd) & 1);
                auVar326._52_4_ = (uint)bVar184 * auVar304._52_4_ | (uint)!bVar184 * auVar305._52_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xe) & 1);
                auVar326._56_4_ = (uint)bVar184 * auVar304._56_4_ | (uint)!bVar184 * auVar305._56_4_
                ;
                bVar184 = SUB81(uVar177 >> 0xf,0);
                auVar326._60_4_ = (uint)bVar184 * auVar304._60_4_ | (uint)!bVar184 * auVar305._60_4_
                ;
                auVar303 = vfmadd231ps_avx512f(auVar303,auVar326,auVar296);
                auVar303 = vfmadd231ps_avx512f(auVar303,auVar326,auVar297);
                auVar304 = vmulps_avx512f(auVar303,auVar303);
                auVar305 = vfmadd213ps_avx512f(auVar303,(undefined1  [64])afVar124,
                                               (undefined1  [64])afVar125);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar303,(undefined1  [64])afVar126);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar303,(undefined1  [64])afVar127);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar303,(undefined1  [64])afVar128);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar303,(undefined1  [64])afVar129);
                auVar303 = vfmadd213ps_avx512f(auVar305,auVar304,auVar303);
                auVar303 = vaddps_avx512f(auVar303,(undefined1  [64])afVar120);
                auVar304 = vcvttps2dq_avx512f(auVar326);
                auVar304 = vpaddd_avx512f(auVar304,auVar298);
                auVar304 = vpslld_avx512f(auVar304,0x17);
                auVar303 = vfmadd213ps_avx512f(auVar304,auVar303,auVar299);
                auVar304 = vmaxps_avx512f(auVar303,(undefined1  [64])_ps512_min_norm_pos);
                auVar305 = vpsrld_avx512f(auVar304,0x17);
                auVar304 = vpternlogd_avx512f(auVar304,(undefined1  [64])afVar129,
                                              (undefined1  [64])_ps512_inv_mant_mask,0xec);
                uVar177 = vcmpps_avx512f(auVar304,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                auVar306 = vsubps_avx512f(auVar304,(undefined1  [64])afVar120);
                auVar304 = vaddps_avx512f(auVar306,auVar304);
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar327._0_4_ = (uint)bVar184 * auVar304._0_4_ | (uint)!bVar184 * auVar306._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar327._4_4_ = (uint)bVar184 * auVar304._4_4_ | (uint)!bVar184 * auVar306._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar327._8_4_ = (uint)bVar184 * auVar304._8_4_ | (uint)!bVar184 * auVar306._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar327._12_4_ = (uint)bVar184 * auVar304._12_4_ | (uint)!bVar184 * auVar306._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar327._16_4_ = (uint)bVar184 * auVar304._16_4_ | (uint)!bVar184 * auVar306._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar327._20_4_ = (uint)bVar184 * auVar304._20_4_ | (uint)!bVar184 * auVar306._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar327._24_4_ = (uint)bVar184 * auVar304._24_4_ | (uint)!bVar184 * auVar306._24_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 7) & 1);
                auVar327._28_4_ = (uint)bVar184 * auVar304._28_4_ | (uint)!bVar184 * auVar306._28_4_
                ;
                bVar16 = (byte)(uVar177 >> 8);
                bVar184 = (bool)(bVar16 & 1);
                auVar327._32_4_ = (uint)bVar184 * auVar304._32_4_ | (uint)!bVar184 * auVar306._32_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 9) & 1);
                auVar327._36_4_ = (uint)bVar184 * auVar304._36_4_ | (uint)!bVar184 * auVar306._36_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 10) & 1);
                auVar327._40_4_ = (uint)bVar184 * auVar304._40_4_ | (uint)!bVar184 * auVar306._40_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xb) & 1);
                auVar327._44_4_ = (uint)bVar184 * auVar304._44_4_ | (uint)!bVar184 * auVar306._44_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xc) & 1);
                auVar327._48_4_ = (uint)bVar184 * auVar304._48_4_ | (uint)!bVar184 * auVar306._48_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xd) & 1);
                auVar327._52_4_ = (uint)bVar184 * auVar304._52_4_ | (uint)!bVar184 * auVar306._52_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xe) & 1);
                auVar327._56_4_ = (uint)bVar184 * auVar304._56_4_ | (uint)!bVar184 * auVar306._56_4_
                ;
                bVar184 = SUB81(uVar177 >> 0xf,0);
                auVar327._60_4_ = (uint)bVar184 * auVar304._60_4_ | (uint)!bVar184 * auVar306._60_4_
                ;
                auVar304 = vmulps_avx512f(auVar327,auVar327);
                auVar306 = vfmadd132ps_avx512f(auVar327,(undefined1  [64])_ps512_cephes_log_p1,
                                               (undefined1  [64])_ps512_cephes_log_p0);
                auVar306 = vfmadd213ps_avx512f(auVar306,auVar327,(undefined1  [64])afVar130);
                auVar306 = vfmadd213ps_avx512f(auVar306,auVar327,(undefined1  [64])afVar131);
                auVar306 = vfmadd213ps_avx512f(auVar306,auVar327,(undefined1  [64])afVar132);
                auVar306 = vfmadd213ps_avx512f(auVar306,auVar327,(undefined1  [64])afVar133);
                auVar306 = vfmadd213ps_avx512f(auVar306,auVar327,(undefined1  [64])afVar134);
                auVar306 = vfmadd213ps_avx512f(auVar306,auVar327,(undefined1  [64])afVar135);
                auVar306 = vfmadd213ps_avx512f(auVar306,auVar327,(undefined1  [64])afVar136);
                auVar307 = vmulps_avx512f(auVar304,auVar327);
                auVar306 = vfmadd213ps_avx512f(auVar307,auVar306,auVar327);
                uVar181 = vcmpps_avx512f(auVar303,auVar301,2);
                auVar303 = vpsubd_avx512f(auVar305,auVar298);
                auVar303 = vcvtdq2ps_avx512f(auVar303);
                auVar305 = vaddps_avx512f(auVar303,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar328._0_4_ = (uint)bVar184 * auVar303._0_4_ | (uint)!bVar184 * auVar305._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar328._4_4_ = (uint)bVar184 * auVar303._4_4_ | (uint)!bVar184 * auVar305._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar328._8_4_ = (uint)bVar184 * auVar303._8_4_ | (uint)!bVar184 * auVar305._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar328._12_4_ = (uint)bVar184 * auVar303._12_4_ | (uint)!bVar184 * auVar305._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar328._16_4_ = (uint)bVar184 * auVar303._16_4_ | (uint)!bVar184 * auVar305._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar328._20_4_ = (uint)bVar184 * auVar303._20_4_ | (uint)!bVar184 * auVar305._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar328._24_4_ = (uint)bVar184 * auVar303._24_4_ | (uint)!bVar184 * auVar305._24_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 7) & 1);
                auVar328._28_4_ = (uint)bVar184 * auVar303._28_4_ | (uint)!bVar184 * auVar305._28_4_
                ;
                bVar184 = (bool)(bVar16 & 1);
                auVar328._32_4_ = (uint)bVar184 * auVar303._32_4_ | (uint)!bVar184 * auVar305._32_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 9) & 1);
                auVar328._36_4_ = (uint)bVar184 * auVar303._36_4_ | (uint)!bVar184 * auVar305._36_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 10) & 1);
                auVar328._40_4_ = (uint)bVar184 * auVar303._40_4_ | (uint)!bVar184 * auVar305._40_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xb) & 1);
                auVar328._44_4_ = (uint)bVar184 * auVar303._44_4_ | (uint)!bVar184 * auVar305._44_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xc) & 1);
                auVar328._48_4_ = (uint)bVar184 * auVar303._48_4_ | (uint)!bVar184 * auVar305._48_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xd) & 1);
                auVar328._52_4_ = (uint)bVar184 * auVar303._52_4_ | (uint)!bVar184 * auVar305._52_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xe) & 1);
                auVar328._56_4_ = (uint)bVar184 * auVar303._56_4_ | (uint)!bVar184 * auVar305._56_4_
                ;
                bVar184 = SUB81(uVar177 >> 0xf,0);
                auVar328._60_4_ = (uint)bVar184 * auVar303._60_4_ | (uint)!bVar184 * auVar305._60_4_
                ;
                auVar303 = vfmadd231ps_avx512f(auVar306,auVar328,
                                               (undefined1  [64])_ps512_cephes_log_q1);
                auVar303 = vfmadd231ps_avx512f(auVar303,auVar315,auVar304);
                auVar303 = vfmadd231ps_avx512f(auVar303,auVar328,
                                               (undefined1  [64])_ps512_cephes_log_q2);
                auVar303 = vmulps_avx512f(auVar303,auVar300);
                auVar304 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                bVar184 = (bool)((byte)uVar181 & 1);
                auVar329._0_4_ = (uint)bVar184 * auVar304._0_4_ | (uint)!bVar184 * auVar303._0_4_;
                bVar184 = (bool)((byte)(uVar181 >> 1) & 1);
                auVar329._4_4_ = (uint)bVar184 * auVar304._4_4_ | (uint)!bVar184 * auVar303._4_4_;
                bVar184 = (bool)((byte)(uVar181 >> 2) & 1);
                auVar329._8_4_ = (uint)bVar184 * auVar304._8_4_ | (uint)!bVar184 * auVar303._8_4_;
                bVar184 = (bool)((byte)(uVar181 >> 3) & 1);
                auVar329._12_4_ = (uint)bVar184 * auVar304._12_4_ | (uint)!bVar184 * auVar303._12_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 4) & 1);
                auVar329._16_4_ = (uint)bVar184 * auVar304._16_4_ | (uint)!bVar184 * auVar303._16_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 5) & 1);
                auVar329._20_4_ = (uint)bVar184 * auVar304._20_4_ | (uint)!bVar184 * auVar303._20_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 6) & 1);
                auVar329._24_4_ = (uint)bVar184 * auVar304._24_4_ | (uint)!bVar184 * auVar303._24_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 7) & 1);
                auVar329._28_4_ = (uint)bVar184 * auVar304._28_4_ | (uint)!bVar184 * auVar303._28_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 8) & 1);
                auVar329._32_4_ = (uint)bVar184 * auVar304._32_4_ | (uint)!bVar184 * auVar303._32_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 9) & 1);
                auVar329._36_4_ = (uint)bVar184 * auVar304._36_4_ | (uint)!bVar184 * auVar303._36_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 10) & 1);
                auVar329._40_4_ = (uint)bVar184 * auVar304._40_4_ | (uint)!bVar184 * auVar303._40_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 0xb) & 1);
                auVar329._44_4_ = (uint)bVar184 * auVar304._44_4_ | (uint)!bVar184 * auVar303._44_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 0xc) & 1);
                auVar329._48_4_ = (uint)bVar184 * auVar304._48_4_ | (uint)!bVar184 * auVar303._48_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 0xd) & 1);
                auVar329._52_4_ = (uint)bVar184 * auVar304._52_4_ | (uint)!bVar184 * auVar303._52_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 0xe) & 1);
                auVar329._56_4_ = (uint)bVar184 * auVar304._56_4_ | (uint)!bVar184 * auVar303._56_4_
                ;
                bVar184 = SUB81(uVar181 >> 0xf,0);
                auVar329._60_4_ = (uint)bVar184 * auVar304._60_4_ | (uint)!bVar184 * auVar303._60_4_
                ;
                auVar303 = vminps_avx512f(auVar329,(undefined1  [64])afVar121);
                auVar303 = vmaxps_avx512f(auVar303,(undefined1  [64])afVar122);
                auVar304 = vfmadd213ps_avx512f((undefined1  [64])afVar123,auVar303,
                                               (undefined1  [64])afVar129);
                auVar305 = vrndscaleps_avx512f(auVar304,1);
                uVar177 = vcmpps_avx512f(auVar304,auVar305,1);
                auVar304 = vsubps_avx512f(auVar305,(undefined1  [64])afVar120);
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar330._0_4_ = (uint)bVar184 * auVar304._0_4_ | (uint)!bVar184 * auVar305._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar330._4_4_ = (uint)bVar184 * auVar304._4_4_ | (uint)!bVar184 * auVar305._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar330._8_4_ = (uint)bVar184 * auVar304._8_4_ | (uint)!bVar184 * auVar305._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar330._12_4_ = (uint)bVar184 * auVar304._12_4_ | (uint)!bVar184 * auVar305._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar330._16_4_ = (uint)bVar184 * auVar304._16_4_ | (uint)!bVar184 * auVar305._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar330._20_4_ = (uint)bVar184 * auVar304._20_4_ | (uint)!bVar184 * auVar305._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar330._24_4_ = (uint)bVar184 * auVar304._24_4_ | (uint)!bVar184 * auVar305._24_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 7) & 1);
                auVar330._28_4_ = (uint)bVar184 * auVar304._28_4_ | (uint)!bVar184 * auVar305._28_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 8) & 1);
                auVar330._32_4_ = (uint)bVar184 * auVar304._32_4_ | (uint)!bVar184 * auVar305._32_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 9) & 1);
                auVar330._36_4_ = (uint)bVar184 * auVar304._36_4_ | (uint)!bVar184 * auVar305._36_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 10) & 1);
                auVar330._40_4_ = (uint)bVar184 * auVar304._40_4_ | (uint)!bVar184 * auVar305._40_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xb) & 1);
                auVar330._44_4_ = (uint)bVar184 * auVar304._44_4_ | (uint)!bVar184 * auVar305._44_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xc) & 1);
                auVar330._48_4_ = (uint)bVar184 * auVar304._48_4_ | (uint)!bVar184 * auVar305._48_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xd) & 1);
                auVar330._52_4_ = (uint)bVar184 * auVar304._52_4_ | (uint)!bVar184 * auVar305._52_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 0xe) & 1);
                auVar330._56_4_ = (uint)bVar184 * auVar304._56_4_ | (uint)!bVar184 * auVar305._56_4_
                ;
                bVar184 = SUB81(uVar177 >> 0xf,0);
                auVar330._60_4_ = (uint)bVar184 * auVar304._60_4_ | (uint)!bVar184 * auVar305._60_4_
                ;
                auVar303 = vfmadd231ps_avx512f(auVar303,auVar330,auVar296);
                auVar303 = vfmadd231ps_avx512f(auVar303,auVar330,auVar297);
                auVar304 = vmulps_avx512f(auVar303,auVar303);
                auVar305 = vfmadd213ps_avx512f(auVar303,(undefined1  [64])afVar124,
                                               (undefined1  [64])afVar125);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar303,(undefined1  [64])afVar126);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar303,(undefined1  [64])afVar127);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar303,(undefined1  [64])afVar128);
                auVar305 = vfmadd213ps_avx512f(auVar305,auVar303,(undefined1  [64])afVar129);
                auVar303 = vfmadd213ps_avx512f(auVar305,auVar304,auVar303);
                auVar303 = vaddps_avx512f(auVar303,(undefined1  [64])afVar120);
                auVar304 = vcvttps2dq_avx512f(auVar330);
                auVar304 = vpaddd_avx512f(auVar304,auVar298);
                auVar304 = vpslld_avx512f(auVar304,0x17);
                auVar303 = vfmadd213ps_avx512f(auVar304,auVar303,auVar299);
                auVar303 = vdivps_avx512f(auVar299,auVar303);
                auVar303 = vfnmsub213ps_avx512f(auVar303,auVar300,auVar299);
                goto LAB_0026b1aa;
              case 6:
                puVar11 = (uint *)(this->super_Deconvolution).activation_params.data;
                auVar303 = vbroadcastss_avx512f(ZEXT416(*puVar11));
                uVar170 = puVar11[1];
                auVar106._4_4_ = uVar170;
                auVar106._0_4_ = uVar170;
                auVar106._8_4_ = uVar170;
                auVar106._12_4_ = uVar170;
                auVar106._16_4_ = uVar170;
                auVar106._20_4_ = uVar170;
                auVar106._24_4_ = uVar170;
                auVar106._28_4_ = uVar170;
                auVar106._32_4_ = uVar170;
                auVar106._36_4_ = uVar170;
                auVar106._40_4_ = uVar170;
                auVar106._44_4_ = uVar170;
                auVar106._48_4_ = uVar170;
                auVar106._52_4_ = uVar170;
                auVar106._56_4_ = uVar170;
                auVar106._60_4_ = uVar170;
                auVar303 = vfmadd213ps_avx512f(auVar303,auVar302,auVar106);
                auVar303 = vmaxps_avx512f(auVar303,auVar301);
                auVar303 = vminps_avx512f(auVar303,auVar299);
LAB_0026b1aa:
                auVar332 = vmulps_avx512f(auVar303,auVar302);
              }
              *local_2a8 = auVar332;
              local_2a8 = local_2a8 + 1;
              iVar144 = iVar144 + 1;
            }
            uVar177 = (ulong)(uVar180 + 1);
          }
        }
      }
      if ((iVar174 == 0x10) && (uVar151 == 1)) {
        uVar157 = (this->super_Deconvolution).kernel_w;
        uVar160 = (this->super_Deconvolution).kernel_h;
        iVar139 = (this->super_Deconvolution).dilation_w;
        iVar138 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        local_178 = local_1e8.elemsize * local_1e8.cstep;
        uVar165 = 0;
        uVar166 = 0;
        if (0 < (int)uVar157) {
          uVar166 = (ulong)uVar157;
        }
        uVar154 = 0;
        if (0 < (int)uVar160) {
          uVar154 = (ulong)uVar160;
        }
        uVar178 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar178 = uVar165;
        }
        uVar158 = local_1e8.w;
        if (local_1e8.w < 1) {
          uVar158 = 0;
        }
        uVar159 = local_1e8.h;
        if (local_1e8.h < 1) {
          uVar159 = 0;
        }
        local_1a0 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          local_1a0 = uVar165;
        }
        iVar152 = (this->super_Deconvolution).stride_w;
        iVar153 = (this->super_Deconvolution).stride_h;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        local_180 = local_1e8.data;
        iVar8 = bottom_blob->w;
        iVar7 = bottom_blob->h;
        for (; uVar165 != local_1a0; uVar165 = uVar165 + 1) {
          local_288 = (undefined1 (*) [32])(local_178 * uVar165 + (long)local_180);
          for (uVar180 = 0; uVar180 != uVar159; uVar180 = uVar180 + 1) {
            local_168._0_8_ = (this->super_Deconvolution).activation_params.data;
            sVar12 = (this->weight_data_tm).cstep;
            sVar13 = (this->weight_data_tm).elemsize;
            pvVar179 = (this->weight_data_tm).data;
            iVar144 = (1 - uVar157) * iVar139;
            for (uVar142 = 0; uVar142 != uVar158; uVar142 = uVar142 + 1) {
              if (pvVar14 == (void *)0x0) {
                fVar334 = 0.0;
              }
              else {
                fVar334 = *(float *)((long)pvVar14 + uVar165 * 4);
              }
              auVar333 = ZEXT1664(ZEXT816(0) << 0x40);
              pvVar171 = (void *)(sVar12 * uVar165 * sVar13 + (long)pvVar179);
              for (uVar146 = 0; uVar146 != uVar178; uVar146 = uVar146 + 1) {
                pvVar167 = pvVar171;
                for (uVar177 = 0; uVar177 != uVar154; uVar177 = uVar177 + 1) {
                  iVar140 = (((int)uVar177 - uVar160) + 1) * iVar138 + uVar180;
                  if (((-1 < iVar140) && (iVar141 = iVar140 / iVar153, iVar140 % iVar153 == 0)) &&
                     (iVar141 < iVar7)) {
                    iVar140 = iVar144;
                    for (lVar150 = 0; uVar166 * 0x40 != lVar150; lVar150 = lVar150 + 0x40) {
                      if (((-1 < iVar140) && (iVar143 = iVar140 / iVar152, iVar140 % iVar152 == 0))
                         && (iVar143 < iVar8)) {
                        auVar333 = vfmadd231ps_avx512f(auVar333,*(undefined1 (*) [64])
                                                                 ((long)bottom_blob->data +
                                                                 (long)(iVar143 << 4) * 4 +
                                                                 (long)iVar141 *
                                                                 (long)bottom_blob->w *
                                                                 bottom_blob->elemsize +
                                                                 bottom_blob->cstep *
                                                                 bottom_blob->elemsize * uVar146),
                                                       *(undefined1 (*) [64])
                                                        ((long)pvVar167 + lVar150));
                      }
                      iVar140 = iVar140 + iVar139;
                    }
                  }
                  pvVar167 = (void *)((long)pvVar167 + (long)(int)uVar157 * 0x40);
                }
                pvVar171 = (void *)((long)pvVar171 + (long)(int)(uVar157 * uVar160 * 0x10) * 4);
              }
              auVar241 = vextractf64x4_avx512f(auVar333,1);
              fVar348 = auVar333._4_4_ + auVar241._4_4_;
              auVar186._0_4_ = auVar333._0_4_ + auVar241._0_4_ + auVar333._16_4_ + auVar241._16_4_;
              auVar186._4_4_ = fVar348 + fVar348;
              auVar186._8_4_ = auVar333._8_4_ + auVar241._8_4_ + auVar333._24_4_ + auVar241._24_4_;
              auVar186._12_4_ =
                   auVar333._12_4_ + auVar241._12_4_ + auVar333._28_4_ + auVar241._28_4_;
              auVar185 = vshufpd_avx(auVar186,auVar186,1);
              auVar187._0_4_ = auVar185._0_4_ + auVar186._0_4_;
              auVar187._4_4_ = auVar185._4_4_ + auVar186._4_4_;
              auVar187._8_4_ = auVar185._8_4_ + auVar186._8_4_;
              auVar187._12_4_ = auVar185._12_4_ + auVar186._12_4_;
              auVar185 = vmovshdup_avx(auVar187);
              fVar334 = auVar185._0_4_ + fVar334 + auVar187._0_4_;
              auVar185 = ZEXT416((uint)fVar334);
              fVar348 = fVar334;
              if (iVar156 - 1U < 6) {
                switch(iVar156) {
                case 1:
                  auVar185 = vmaxss_avx(ZEXT416((uint)fVar334),ZEXT416(0));
                  fVar348 = auVar185._0_4_;
                  break;
                case 2:
                  uVar17 = vcmpss_avx512f(ZEXT416((uint)fVar334),ZEXT416(0),0xe);
                  bVar184 = (bool)((byte)uVar17 & 1);
                  fVar348 = (float)((uint)bVar184 * 0x3f800000 +
                                   (uint)!bVar184 * (int)*(float *)local_168._0_8_) * fVar334;
                  break;
                case 3:
                  auVar185 = vmaxss_avx(auVar185,ZEXT416((uint)*(float *)local_168._0_8_));
                  fVar348 = auVar185._0_4_;
                  if (*(float *)(local_168._0_8_ + 4) < auVar185._0_4_) {
                    fVar348 = *(float *)(local_168._0_8_ + 4);
                  }
                  break;
                case 4:
                  auVar185 = vminss_avx(auVar185,SUB6416(ZEXT464(0x42b0c0a5),0));
                  auVar26._8_4_ = 0x80000000;
                  auVar26._0_8_ = 0x8000000080000000;
                  auVar26._12_4_ = 0x80000000;
                  auVar186 = vxorps_avx512vl(auVar185,auVar26);
                  uVar17 = vcmpss_avx512f(auVar185,ZEXT416(0xc2b0c0a5),1);
                  bVar184 = (bool)((byte)uVar17 & 1);
                  fVar334 = expf((float)((uint)bVar184 * 0x42b0c0a5 +
                                        (uint)!bVar184 * auVar186._0_4_));
                  fVar348 = 1.0 / (fVar334 + 1.0);
                  break;
                case 5:
                  fVar348 = expf(fVar334);
                  fVar348 = logf(fVar348 + 1.0);
                  fVar348 = tanhf(fVar348);
                  fVar348 = fVar348 * fVar334;
                  break;
                case 6:
                  fVar2 = *(float *)local_168._0_8_;
                  auVar25._8_4_ = 0x80000000;
                  auVar25._0_8_ = 0x8000000080000000;
                  auVar25._12_4_ = 0x80000000;
                  auVar186 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_168._0_8_ + 4)),auVar25)
                  ;
                  fVar355 = auVar186._0_4_ / fVar2;
                  fVar348 = 0.0;
                  if ((fVar355 <= fVar334) && (fVar348 = fVar334, fVar334 <= fVar355 + 1.0 / fVar2))
                  {
                    auVar185 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar185,
                                               ZEXT416((uint)*(float *)(local_168._0_8_ + 4)));
                    fVar348 = auVar185._0_4_ * fVar334;
                  }
                }
              }
              *(float *)local_288 = fVar348;
              local_288 = (undefined1 (*) [32])((long)local_288 + 4);
              iVar144 = iVar144 + 1;
            }
          }
        }
      }
      if ((iVar174 == 8) && (uVar151 == 8)) {
        uVar157 = (this->super_Deconvolution).kernel_w;
        uVar160 = (this->super_Deconvolution).kernel_h;
        iVar139 = (this->super_Deconvolution).dilation_w;
        iVar138 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar152 = (this->super_Deconvolution).stride_h;
        iVar153 = (this->super_Deconvolution).activation_type;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        uVar166 = 0;
        uVar165 = 0;
        if (0 < (int)uVar157) {
          uVar165 = (ulong)uVar157;
        }
        uVar154 = 0;
        if (0 < (int)uVar160) {
          uVar154 = (ulong)uVar160;
        }
        uVar178 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar178 = uVar166;
        }
        auVar352._8_4_ = 0x42b0c0a5;
        auVar352._0_8_ = 0x42b0c0a542b0c0a5;
        auVar352._12_4_ = 0x42b0c0a5;
        auVar352._16_4_ = 0x42b0c0a5;
        auVar352._20_4_ = 0x42b0c0a5;
        auVar352._24_4_ = 0x42b0c0a5;
        auVar352._28_4_ = 0x42b0c0a5;
        auVar359._8_4_ = 0xc2b0c0a5;
        auVar359._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar359._12_4_ = 0xc2b0c0a5;
        auVar359._16_4_ = 0xc2b0c0a5;
        auVar359._20_4_ = 0xc2b0c0a5;
        auVar359._24_4_ = 0xc2b0c0a5;
        auVar359._28_4_ = 0xc2b0c0a5;
        auVar365._8_4_ = 0x3f000000;
        auVar365._0_8_ = 0x3f0000003f000000;
        auVar365._12_4_ = 0x3f000000;
        auVar365._16_4_ = 0x3f000000;
        auVar365._20_4_ = 0x3f000000;
        auVar365._24_4_ = 0x3f000000;
        auVar365._28_4_ = 0x3f000000;
        auVar371._8_4_ = 0x3fb8aa3b;
        auVar371._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar371._12_4_ = 0x3fb8aa3b;
        auVar371._16_4_ = 0x3fb8aa3b;
        auVar371._20_4_ = 0x3fb8aa3b;
        auVar371._24_4_ = 0x3fb8aa3b;
        auVar371._28_4_ = 0x3fb8aa3b;
        auVar377._8_4_ = 0x3f800000;
        auVar377._0_8_ = 0x3f8000003f800000;
        auVar377._12_4_ = 0x3f800000;
        auVar377._16_4_ = 0x3f800000;
        auVar377._20_4_ = 0x3f800000;
        auVar377._24_4_ = 0x3f800000;
        auVar377._28_4_ = 0x3f800000;
        auVar383._8_4_ = 0x3f318000;
        auVar383._0_8_ = 0x3f3180003f318000;
        auVar383._12_4_ = 0x3f318000;
        auVar383._16_4_ = 0x3f318000;
        auVar383._20_4_ = 0x3f318000;
        auVar383._24_4_ = 0x3f318000;
        auVar383._28_4_ = 0x3f318000;
        auVar241 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar433._8_4_ = 0x3ab743ce;
        auVar433._0_8_ = 0x3ab743ce3ab743ce;
        auVar433._12_4_ = 0x3ab743ce;
        auVar433._16_4_ = 0x3ab743ce;
        auVar433._20_4_ = 0x3ab743ce;
        auVar433._24_4_ = 0x3ab743ce;
        auVar433._28_4_ = 0x3ab743ce;
        auVar439._8_4_ = 0x3c088908;
        auVar439._0_8_ = 0x3c0889083c088908;
        auVar439._12_4_ = 0x3c088908;
        auVar439._16_4_ = 0x3c088908;
        auVar439._20_4_ = 0x3c088908;
        auVar439._24_4_ = 0x3c088908;
        auVar439._28_4_ = 0x3c088908;
        auVar445._8_4_ = 0x3d2aa9c1;
        auVar445._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar445._12_4_ = 0x3d2aa9c1;
        auVar445._16_4_ = 0x3d2aa9c1;
        auVar445._20_4_ = 0x3d2aa9c1;
        auVar445._24_4_ = 0x3d2aa9c1;
        auVar445._28_4_ = 0x3d2aa9c1;
        auVar451._8_4_ = 0x3e2aaaaa;
        auVar451._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar451._12_4_ = 0x3e2aaaaa;
        auVar451._16_4_ = 0x3e2aaaaa;
        auVar451._20_4_ = 0x3e2aaaaa;
        auVar451._24_4_ = 0x3e2aaaaa;
        auVar451._28_4_ = 0x3e2aaaaa;
        auVar457._8_4_ = 0x3f800000;
        auVar457._0_8_ = 0x3f8000003f800000;
        auVar457._12_4_ = 0x3f800000;
        auVar457._16_4_ = 0x3f800000;
        auVar457._20_4_ = 0x3f800000;
        auVar457._24_4_ = 0x3f800000;
        auVar457._28_4_ = 0x3f800000;
        auVar463._8_4_ = 0xb95e8083;
        auVar463._0_8_ = 0xb95e8083b95e8083;
        auVar463._12_4_ = 0xb95e8083;
        auVar463._16_4_ = 0xb95e8083;
        auVar463._20_4_ = 0xb95e8083;
        auVar463._24_4_ = 0xb95e8083;
        auVar463._28_4_ = 0xb95e8083;
        auVar242 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar263 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar264 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar265 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar266 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar267 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar268 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar269 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar270 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        for (; uVar166 != uVar178; uVar166 = uVar166 + 1) {
          local_288 = (undefined1 (*) [32])
                      (local_1e8.cstep * uVar166 * local_1e8.elemsize + (long)local_1e8.data);
          iVar8 = bottom_blob->w;
          iVar7 = bottom_blob->h;
          uVar159 = 0;
          uVar158 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar158 = uVar159;
          }
          uVar180 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar180 = uVar159;
          }
          uVar142 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar142 = uVar159;
          }
          local_168._0_4_ = uVar142;
          for (; uVar159 != uVar142; uVar159 = uVar159 + 1) {
            iVar144 = (1 - uVar157) * iVar139;
            for (uVar170 = 0; uVar170 != uVar180; uVar170 = uVar170 + 1) {
              if (pvVar14 == (void *)0x0) {
                auVar333 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar333 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar14 + uVar166 * 0x20));
              }
              pvVar179 = bottom_blob->data;
              lVar150 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar166 * (this->weight_data_tm).elemsize +
                        0xe0;
              for (uVar146 = 0; uVar146 != uVar158; uVar146 = uVar146 + 1) {
                lVar155 = lVar150;
                for (uVar177 = 0; uVar177 != uVar154; uVar177 = uVar177 + 1) {
                  iVar140 = (((int)uVar177 - uVar160) + 1) * iVar138 + uVar159;
                  if (((-1 < iVar140) && (iVar141 = iVar140 / iVar152, iVar140 % iVar152 == 0)) &&
                     (iVar141 < iVar7)) {
                    lVar119 = (long)iVar141 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar146;
                    iVar140 = iVar144;
                    for (lVar164 = 0; uVar165 * 0x100 != lVar164; lVar164 = lVar164 + 0x100) {
                      if (((-1 < iVar140) && (iVar141 = iVar140 / iVar156, iVar140 % iVar156 == 0))
                         && (iVar141 < iVar8)) {
                        lVar145 = (long)(iVar141 << 3);
                        uVar335 = *(undefined4 *)((long)pvVar179 + lVar145 * 4 + lVar119);
                        auVar399._4_4_ = uVar335;
                        auVar399._0_4_ = uVar335;
                        auVar399._8_4_ = uVar335;
                        auVar399._12_4_ = uVar335;
                        auVar399._16_4_ = uVar335;
                        auVar399._20_4_ = uVar335;
                        auVar399._24_4_ = uVar335;
                        auVar399._28_4_ = uVar335;
                        uVar335 = *(undefined4 *)((long)pvVar179 + lVar145 * 4 + lVar119 + 4);
                        auVar422._4_4_ = uVar335;
                        auVar422._0_4_ = uVar335;
                        auVar422._8_4_ = uVar335;
                        auVar422._12_4_ = uVar335;
                        auVar422._16_4_ = uVar335;
                        auVar422._20_4_ = uVar335;
                        auVar422._24_4_ = uVar335;
                        auVar422._28_4_ = uVar335;
                        auVar271 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 8)));
                        auVar272 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0xc)));
                        auVar273 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x10)));
                        auVar274 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x14)));
                        auVar243 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x18)));
                        auVar244 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x1c)));
                        auVar185 = vfmadd231ps_fma(auVar333._0_32_,auVar399,
                                                   *(undefined1 (*) [32])(lVar155 + -0xe0 + lVar164)
                                                  );
                        auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar422,
                                                   *(undefined1 (*) [32])(lVar155 + -0xc0 + lVar164)
                                                  );
                        auVar271 = vfmadd231ps_avx512vl
                                             (ZEXT1632(auVar185),auVar271,
                                              *(undefined1 (*) [32])(lVar155 + -0xa0 + lVar164));
                        auVar271 = vfmadd231ps_avx512vl
                                             (auVar271,auVar272,
                                              *(undefined1 (*) [32])(lVar155 + -0x80 + lVar164));
                        auVar271 = vfmadd231ps_avx512vl
                                             (auVar271,auVar273,
                                              *(undefined1 (*) [32])(lVar155 + -0x60 + lVar164));
                        auVar271 = vfmadd231ps_avx512vl
                                             (auVar271,auVar274,
                                              *(undefined1 (*) [32])(lVar155 + -0x40 + lVar164));
                        auVar271 = vfmadd231ps_avx512vl
                                             (auVar271,auVar243,
                                              *(undefined1 (*) [32])(lVar155 + -0x20 + lVar164));
                        auVar271 = vfmadd231ps_avx512vl
                                             (auVar271,auVar244,
                                              *(undefined1 (*) [32])(lVar155 + lVar164));
                        auVar333 = ZEXT3264(auVar271);
                      }
                      iVar140 = iVar140 + iVar139;
                    }
                  }
                  lVar155 = lVar155 + (long)(int)uVar157 * 0x100;
                }
                lVar150 = lVar150 + (long)(int)(uVar157 * uVar160 * 0x40) * 4;
              }
              auVar271 = auVar333._0_32_;
              auVar280 = auVar271;
              if (5 < iVar153 - 1U) goto switchD_0026bb11_caseD_1;
              auVar272 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              auVar280 = vmaxps_avx(auVar271,auVar272);
              switch(iVar153) {
              case 2:
                auVar271 = vminps_avx(auVar271,auVar272);
                uVar335 = *(this->super_Deconvolution).activation_params.data;
                auVar80._4_4_ = uVar335;
                auVar80._0_4_ = uVar335;
                auVar80._8_4_ = uVar335;
                auVar80._12_4_ = uVar335;
                auVar80._16_4_ = uVar335;
                auVar80._20_4_ = uVar335;
                auVar80._24_4_ = uVar335;
                auVar80._28_4_ = uVar335;
                auVar280 = vfmadd231ps_avx512vl(auVar280,auVar271,auVar80);
                break;
              case 3:
                puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar335 = *puVar10;
                auVar78._4_4_ = uVar335;
                auVar78._0_4_ = uVar335;
                auVar78._8_4_ = uVar335;
                auVar78._12_4_ = uVar335;
                auVar78._16_4_ = uVar335;
                auVar78._20_4_ = uVar335;
                auVar78._24_4_ = uVar335;
                auVar78._28_4_ = uVar335;
                auVar271 = vmaxps_avx512vl(auVar271,auVar78);
                uVar335 = puVar10[1];
                auVar79._4_4_ = uVar335;
                auVar79._0_4_ = uVar335;
                auVar79._8_4_ = uVar335;
                auVar79._12_4_ = uVar335;
                auVar79._16_4_ = uVar335;
                auVar79._20_4_ = uVar335;
                auVar79._24_4_ = uVar335;
                auVar79._28_4_ = uVar335;
                auVar280 = vminps_avx512vl(auVar271,auVar79);
                break;
              case 4:
                auVar76._8_4_ = 0x80000000;
                auVar76._0_8_ = 0x8000000080000000;
                auVar76._12_4_ = 0x80000000;
                auVar76._16_4_ = 0x80000000;
                auVar76._20_4_ = 0x80000000;
                auVar76._24_4_ = 0x80000000;
                auVar76._28_4_ = 0x80000000;
                auVar271 = vxorps_avx512vl(auVar271,auVar76);
                auVar271 = vminps_avx(auVar271,auVar352);
                auVar271 = vmaxps_avx(auVar271,auVar359);
                auVar185 = vfmadd231ps_fma(auVar365,auVar271,auVar371);
                auVar272 = vrndscaleps_avx512vl(ZEXT1632(auVar185),1);
                uVar146 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar272,1);
                auVar273 = vsubps_avx512vl(auVar272,auVar377);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar281._0_4_ = (uint)bVar184 * auVar273._0_4_ | (uint)!bVar184 * auVar272._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar281._4_4_ = (uint)bVar184 * auVar273._4_4_ | (uint)!bVar184 * auVar272._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar281._8_4_ = (uint)bVar184 * auVar273._8_4_ | (uint)!bVar184 * auVar272._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar281._12_4_ = (uint)bVar184 * auVar273._12_4_ | (uint)!bVar184 * auVar272._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar281._16_4_ = (uint)bVar184 * auVar273._16_4_ | (uint)!bVar184 * auVar272._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar281._20_4_ = (uint)bVar184 * auVar273._20_4_ | (uint)!bVar184 * auVar272._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar281._24_4_ = (uint)bVar184 * auVar273._24_4_ | (uint)!bVar184 * auVar272._24_4_
                ;
                bVar184 = SUB81(uVar146 >> 7,0);
                auVar281._28_4_ = (uint)bVar184 * auVar273._28_4_ | (uint)!bVar184 * auVar272._28_4_
                ;
                auVar271 = vfmsub231ps_avx512vl(auVar271,auVar281,auVar383);
                auVar77._8_4_ = 0x395e8083;
                auVar77._0_8_ = 0x395e8083395e8083;
                auVar77._12_4_ = 0x395e8083;
                auVar77._16_4_ = 0x395e8083;
                auVar77._20_4_ = 0x395e8083;
                auVar77._24_4_ = 0x395e8083;
                auVar77._28_4_ = 0x395e8083;
                auVar271 = vfmsub231ps_avx512vl(auVar271,auVar281,auVar77);
                auVar400._0_4_ = auVar271._0_4_ * auVar271._0_4_;
                auVar400._4_4_ = auVar271._4_4_ * auVar271._4_4_;
                auVar400._8_4_ = auVar271._8_4_ * auVar271._8_4_;
                auVar400._12_4_ = auVar271._12_4_ * auVar271._12_4_;
                auVar400._16_4_ = auVar271._16_4_ * auVar271._16_4_;
                auVar400._20_4_ = auVar271._20_4_ * auVar271._20_4_;
                auVar400._24_4_ = auVar271._24_4_ * auVar271._24_4_;
                auVar400._28_4_ = 0;
                auVar185 = vfmadd213ps_fma(auVar241,auVar271,auVar433);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar271,auVar439);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar271,auVar445);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar271,auVar451);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar271,auVar365);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar400,auVar271);
                auVar345._0_4_ = auVar185._0_4_ + 1.0;
                auVar345._4_4_ = auVar185._4_4_ + 1.0;
                auVar345._8_4_ = auVar185._8_4_ + 1.0;
                auVar345._12_4_ = auVar185._12_4_ + 1.0;
                auVar345._16_4_ = 0x3f800000;
                auVar345._20_4_ = 0x3f800000;
                auVar345._24_4_ = 0x3f800000;
                auVar345._28_4_ = 0x3f800000;
                auVar271 = vcvttps2dq_avx512vl(auVar281);
                auVar271 = vpslld_avx2(auVar271,0x17);
                auVar271 = vpaddd_avx2(auVar271,auVar457);
                auVar185 = vfmadd213ps_fma(auVar271,auVar345,auVar377);
                auVar280 = vdivps_avx(auVar377,ZEXT1632(auVar185));
                break;
              case 5:
                auVar271 = vminps_avx(auVar271,auVar352);
                auVar271 = vmaxps_avx(auVar271,auVar359);
                auVar185 = vfmadd213ps_fma(auVar371,auVar271,auVar365);
                auVar273 = vrndscaleps_avx512vl(ZEXT1632(auVar185),1);
                uVar146 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar273,1);
                auVar274 = vsubps_avx512vl(auVar273,auVar377);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar275._0_4_ = (uint)bVar184 * auVar274._0_4_ | (uint)!bVar184 * auVar273._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar275._4_4_ = (uint)bVar184 * auVar274._4_4_ | (uint)!bVar184 * auVar273._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar275._8_4_ = (uint)bVar184 * auVar274._8_4_ | (uint)!bVar184 * auVar273._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar275._12_4_ = (uint)bVar184 * auVar274._12_4_ | (uint)!bVar184 * auVar273._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar275._16_4_ = (uint)bVar184 * auVar274._16_4_ | (uint)!bVar184 * auVar273._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar275._20_4_ = (uint)bVar184 * auVar274._20_4_ | (uint)!bVar184 * auVar273._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar275._24_4_ = (uint)bVar184 * auVar274._24_4_ | (uint)!bVar184 * auVar273._24_4_
                ;
                bVar184 = SUB81(uVar146 >> 7,0);
                auVar275._28_4_ = (uint)bVar184 * auVar274._28_4_ | (uint)!bVar184 * auVar273._28_4_
                ;
                auVar271 = vfmsub231ps_avx512vl(auVar271,auVar275,auVar383);
                auVar271 = vfnmsub231ps_avx512vl(auVar271,auVar275,auVar463);
                auVar423._0_4_ = auVar271._0_4_ * auVar271._0_4_;
                auVar423._4_4_ = auVar271._4_4_ * auVar271._4_4_;
                auVar423._8_4_ = auVar271._8_4_ * auVar271._8_4_;
                auVar423._12_4_ = auVar271._12_4_ * auVar271._12_4_;
                auVar423._16_4_ = auVar271._16_4_ * auVar271._16_4_;
                auVar423._20_4_ = auVar271._20_4_ * auVar271._20_4_;
                auVar423._24_4_ = auVar271._24_4_ * auVar271._24_4_;
                auVar423._28_4_ = 0;
                auVar273 = vfmadd213ps_avx512vl(auVar241,auVar271,auVar433);
                auVar273 = vfmadd213ps_avx512vl(auVar273,auVar271,auVar439);
                auVar273 = vfmadd213ps_avx512vl(auVar273,auVar271,auVar445);
                auVar273 = vfmadd213ps_avx512vl(auVar273,auVar271,auVar451);
                auVar273 = vfmadd213ps_avx512vl(auVar273,auVar271,auVar365);
                auVar271 = vfmadd213ps_avx512vl(auVar273,auVar423,auVar271);
                auVar273 = vaddps_avx512vl(auVar271,auVar377);
                auVar271 = vcvttps2dq_avx512vl(auVar275);
                auVar271 = vpslld_avx2(auVar271,0x17);
                auVar271 = vpaddd_avx2(auVar271,auVar457);
                auVar185 = vfmadd213ps_fma(auVar271,auVar273,auVar377);
                uVar146 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar272,2);
                auVar70._8_4_ = 0x800000;
                auVar70._0_8_ = 0x80000000800000;
                auVar70._12_4_ = 0x800000;
                auVar70._16_4_ = 0x800000;
                auVar70._20_4_ = 0x800000;
                auVar70._24_4_ = 0x800000;
                auVar70._28_4_ = 0x800000;
                auVar271 = vmaxps_avx512vl(ZEXT1632(auVar185),auVar70);
                auVar274 = vpsrld_avx2(auVar271,0x17);
                auVar272 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                auVar71._8_4_ = 0x3f000000;
                auVar71._0_8_ = 0x3f0000003f000000;
                auVar71._12_4_ = 0x3f000000;
                auVar71._16_4_ = 0x3f000000;
                auVar71._20_4_ = 0x3f000000;
                auVar71._24_4_ = 0x3f000000;
                auVar71._28_4_ = 0x3f000000;
                auVar271 = vpternlogd_avx512vl(auVar271,auVar272,auVar71,0xea);
                auVar72._8_4_ = 0x3f3504f3;
                auVar72._0_8_ = 0x3f3504f33f3504f3;
                auVar72._12_4_ = 0x3f3504f3;
                auVar72._16_4_ = 0x3f3504f3;
                auVar72._20_4_ = 0x3f3504f3;
                auVar72._24_4_ = 0x3f3504f3;
                auVar72._28_4_ = 0x3f3504f3;
                uVar177 = vcmpps_avx512vl(auVar271,auVar72,1);
                auVar272 = vaddps_avx512vl(auVar271,auVar242);
                auVar271 = vaddps_avx512vl(auVar272,auVar271);
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar276._0_4_ = (uint)bVar184 * auVar271._0_4_ | (uint)!bVar184 * auVar272._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar276._4_4_ = (uint)bVar184 * auVar271._4_4_ | (uint)!bVar184 * auVar272._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar276._8_4_ = (uint)bVar184 * auVar271._8_4_ | (uint)!bVar184 * auVar272._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar276._12_4_ = (uint)bVar184 * auVar271._12_4_ | (uint)!bVar184 * auVar272._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar276._16_4_ = (uint)bVar184 * auVar271._16_4_ | (uint)!bVar184 * auVar272._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar276._20_4_ = (uint)bVar184 * auVar271._20_4_ | (uint)!bVar184 * auVar272._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar276._24_4_ = (uint)bVar184 * auVar271._24_4_ | (uint)!bVar184 * auVar272._24_4_
                ;
                bVar184 = SUB81(uVar177 >> 7,0);
                auVar276._28_4_ = (uint)bVar184 * auVar271._28_4_ | (uint)!bVar184 * auVar272._28_4_
                ;
                auVar272 = vmulps_avx512vl(auVar276,auVar276);
                auVar73._8_4_ = 0xbdebd1b8;
                auVar73._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar73._12_4_ = 0xbdebd1b8;
                auVar73._16_4_ = 0xbdebd1b8;
                auVar73._20_4_ = 0xbdebd1b8;
                auVar73._24_4_ = 0xbdebd1b8;
                auVar73._28_4_ = 0xbdebd1b8;
                auVar271 = vfmadd213ps_avx512vl(auVar263,auVar276,auVar73);
                auVar74._8_4_ = 0x3def251a;
                auVar74._0_8_ = 0x3def251a3def251a;
                auVar74._12_4_ = 0x3def251a;
                auVar74._16_4_ = 0x3def251a;
                auVar74._20_4_ = 0x3def251a;
                auVar74._24_4_ = 0x3def251a;
                auVar74._28_4_ = 0x3def251a;
                auVar271 = vfmadd213ps_avx512vl(auVar271,auVar276,auVar74);
                auVar271 = vfmadd213ps_avx512vl(auVar271,auVar276,auVar264);
                auVar271 = vfmadd213ps_avx512vl(auVar271,auVar276,auVar265);
                auVar271 = vfmadd213ps_avx512vl(auVar271,auVar276,auVar266);
                auVar271 = vfmadd213ps_avx512vl(auVar271,auVar276,auVar267);
                auVar271 = vfmadd213ps_avx512vl(auVar271,auVar276,auVar268);
                auVar271 = vfmadd213ps_avx512vl(auVar271,auVar276,auVar269);
                auVar273 = vmulps_avx512vl(auVar272,auVar276);
                auVar273 = vmulps_avx512vl(auVar273,auVar271);
                auVar75._8_4_ = 0xffffff82;
                auVar75._0_8_ = 0xffffff82ffffff82;
                auVar75._12_4_ = 0xffffff82;
                auVar75._16_4_ = 0xffffff82;
                auVar75._20_4_ = 0xffffff82;
                auVar75._24_4_ = 0xffffff82;
                auVar75._28_4_ = 0xffffff82;
                auVar271 = vpaddd_avx512vl(auVar274,auVar75);
                auVar271 = vcvtdq2ps_avx(auVar271);
                auVar274 = vsubps_avx512vl(auVar271,auVar377);
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar277._0_4_ = (uint)bVar184 * auVar274._0_4_ | (uint)!bVar184 * auVar271._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar277._4_4_ = (uint)bVar184 * auVar274._4_4_ | (uint)!bVar184 * auVar271._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar277._8_4_ = (uint)bVar184 * auVar274._8_4_ | (uint)!bVar184 * auVar271._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar277._12_4_ = (uint)bVar184 * auVar274._12_4_ | (uint)!bVar184 * auVar271._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar277._16_4_ = (uint)bVar184 * auVar274._16_4_ | (uint)!bVar184 * auVar271._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar277._20_4_ = (uint)bVar184 * auVar274._20_4_ | (uint)!bVar184 * auVar271._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar277._24_4_ = (uint)bVar184 * auVar274._24_4_ | (uint)!bVar184 * auVar271._24_4_
                ;
                bVar184 = SUB81(uVar177 >> 7,0);
                auVar277._28_4_ = (uint)bVar184 * auVar274._28_4_ | (uint)!bVar184 * auVar271._28_4_
                ;
                auVar271 = vfmadd231ps_avx512vl(auVar273,auVar277,auVar463);
                auVar271 = vfmsub231ps_avx512vl(auVar271,auVar365,auVar272);
                auVar271 = vsubps_avx512vl(auVar271,auVar276);
                auVar185 = vfmsub231ps_fma(auVar271,auVar383,auVar277);
                auVar271 = vmulps_avx512vl(ZEXT1632(auVar185),auVar270);
                auVar272 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar278._0_4_ = (uint)bVar184 * auVar272._0_4_ | (uint)!bVar184 * auVar271._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar278._4_4_ = (uint)bVar184 * auVar272._4_4_ | (uint)!bVar184 * auVar271._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar278._8_4_ = (uint)bVar184 * auVar272._8_4_ | (uint)!bVar184 * auVar271._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar278._12_4_ = (uint)bVar184 * auVar272._12_4_ | (uint)!bVar184 * auVar271._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar278._16_4_ = (uint)bVar184 * auVar272._16_4_ | (uint)!bVar184 * auVar271._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar278._20_4_ = (uint)bVar184 * auVar272._20_4_ | (uint)!bVar184 * auVar271._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar278._24_4_ = (uint)bVar184 * auVar272._24_4_ | (uint)!bVar184 * auVar271._24_4_
                ;
                bVar184 = SUB81(uVar146 >> 7,0);
                auVar278._28_4_ = (uint)bVar184 * auVar272._28_4_ | (uint)!bVar184 * auVar271._28_4_
                ;
                auVar271 = vminps_avx(auVar278,auVar352);
                auVar271 = vmaxps_avx(auVar271,auVar359);
                auVar185 = vfmadd213ps_fma(auVar371,auVar271,auVar365);
                auVar272 = vrndscaleps_avx512vl(ZEXT1632(auVar185),1);
                uVar146 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar272,1);
                auVar273 = vsubps_avx512vl(auVar272,auVar377);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar279._0_4_ = (uint)bVar184 * auVar273._0_4_ | (uint)!bVar184 * auVar272._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar279._4_4_ = (uint)bVar184 * auVar273._4_4_ | (uint)!bVar184 * auVar272._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar279._8_4_ = (uint)bVar184 * auVar273._8_4_ | (uint)!bVar184 * auVar272._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar279._12_4_ = (uint)bVar184 * auVar273._12_4_ | (uint)!bVar184 * auVar272._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar279._16_4_ = (uint)bVar184 * auVar273._16_4_ | (uint)!bVar184 * auVar272._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar279._20_4_ = (uint)bVar184 * auVar273._20_4_ | (uint)!bVar184 * auVar272._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar279._24_4_ = (uint)bVar184 * auVar273._24_4_ | (uint)!bVar184 * auVar272._24_4_
                ;
                bVar184 = SUB81(uVar146 >> 7,0);
                auVar279._28_4_ = (uint)bVar184 * auVar273._28_4_ | (uint)!bVar184 * auVar272._28_4_
                ;
                auVar271 = vfmsub231ps_avx512vl(auVar271,auVar279,auVar383);
                auVar271 = vfnmsub231ps_avx512vl(auVar271,auVar279,auVar463);
                auVar424._0_4_ = auVar271._0_4_ * auVar271._0_4_;
                auVar424._4_4_ = auVar271._4_4_ * auVar271._4_4_;
                auVar424._8_4_ = auVar271._8_4_ * auVar271._8_4_;
                auVar424._12_4_ = auVar271._12_4_ * auVar271._12_4_;
                auVar424._16_4_ = auVar271._16_4_ * auVar271._16_4_;
                auVar424._20_4_ = auVar271._20_4_ * auVar271._20_4_;
                auVar424._24_4_ = auVar271._24_4_ * auVar271._24_4_;
                auVar424._28_4_ = 0;
                auVar272 = vfmadd213ps_avx512vl(auVar241,auVar271,auVar433);
                auVar272 = vfmadd213ps_avx512vl(auVar272,auVar271,auVar439);
                auVar272 = vfmadd213ps_avx512vl(auVar272,auVar271,auVar445);
                auVar272 = vfmadd213ps_avx512vl(auVar272,auVar271,auVar451);
                auVar272 = vfmadd213ps_avx512vl(auVar272,auVar271,auVar365);
                auVar271 = vfmadd213ps_avx512vl(auVar272,auVar424,auVar271);
                auVar272 = vaddps_avx512vl(auVar271,auVar377);
                auVar271 = vcvttps2dq_avx512vl(auVar279);
                auVar271 = vpslld_avx2(auVar271,0x17);
                auVar271 = vpaddd_avx2(auVar271,auVar457);
                auVar185 = vfmadd213ps_fma(auVar271,auVar272,auVar377);
                auVar271 = vdivps_avx(auVar377,ZEXT1632(auVar185));
                auVar271 = vfnmadd213ps_avx512vl(auVar271,auVar270,auVar242);
                goto LAB_0026bdcb;
              case 6:
                puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar335 = *puVar10;
                auVar401._4_4_ = uVar335;
                auVar401._0_4_ = uVar335;
                auVar401._8_4_ = uVar335;
                auVar401._12_4_ = uVar335;
                auVar401._16_4_ = uVar335;
                auVar401._20_4_ = uVar335;
                auVar401._24_4_ = uVar335;
                auVar401._28_4_ = uVar335;
                uVar335 = puVar10[1];
                auVar69._4_4_ = uVar335;
                auVar69._0_4_ = uVar335;
                auVar69._8_4_ = uVar335;
                auVar69._12_4_ = uVar335;
                auVar69._16_4_ = uVar335;
                auVar69._20_4_ = uVar335;
                auVar69._24_4_ = uVar335;
                auVar69._28_4_ = uVar335;
                auVar271 = vfmadd213ps_avx512vl(auVar401,auVar271,auVar69);
                auVar271 = vmaxps_avx(auVar271,auVar272);
                auVar271 = vminps_avx(auVar271,auVar377);
LAB_0026bdcb:
                auVar280._4_4_ = auVar271._4_4_ * auVar333._4_4_;
                auVar280._0_4_ = auVar271._0_4_ * auVar333._0_4_;
                auVar280._8_4_ = auVar271._8_4_ * auVar333._8_4_;
                auVar280._12_4_ = auVar271._12_4_ * auVar333._12_4_;
                auVar280._16_4_ = auVar271._16_4_ * auVar333._16_4_;
                auVar280._20_4_ = auVar271._20_4_ * auVar333._20_4_;
                auVar280._24_4_ = auVar271._24_4_ * auVar333._24_4_;
                auVar280._28_4_ = auVar271._28_4_;
              }
switchD_0026bb11_caseD_1:
              *local_288 = auVar280;
              local_288 = local_288 + 1;
              iVar144 = iVar144 + 1;
            }
          }
        }
      }
      if ((iVar174 == 4) && (uVar151 == 8)) {
        uVar157 = (this->super_Deconvolution).kernel_w;
        uVar160 = (this->super_Deconvolution).kernel_h;
        iVar139 = (this->super_Deconvolution).dilation_w;
        iVar138 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar152 = (this->super_Deconvolution).stride_h;
        iVar153 = (this->super_Deconvolution).activation_type;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        uVar166 = 0;
        uVar165 = 0;
        if (0 < (int)uVar157) {
          uVar165 = (ulong)uVar157;
        }
        uVar154 = 0;
        if (0 < (int)uVar160) {
          uVar154 = (ulong)uVar160;
        }
        uVar178 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar178 = uVar166;
        }
        auVar353._8_4_ = 0x42b0c0a5;
        auVar353._0_8_ = 0x42b0c0a542b0c0a5;
        auVar353._12_4_ = 0x42b0c0a5;
        auVar353._16_4_ = 0x42b0c0a5;
        auVar353._20_4_ = 0x42b0c0a5;
        auVar353._24_4_ = 0x42b0c0a5;
        auVar353._28_4_ = 0x42b0c0a5;
        auVar360._8_4_ = 0xc2b0c0a5;
        auVar360._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar360._12_4_ = 0xc2b0c0a5;
        auVar360._16_4_ = 0xc2b0c0a5;
        auVar360._20_4_ = 0xc2b0c0a5;
        auVar360._24_4_ = 0xc2b0c0a5;
        auVar360._28_4_ = 0xc2b0c0a5;
        auVar366._8_4_ = 0x3f000000;
        auVar366._0_8_ = 0x3f0000003f000000;
        auVar366._12_4_ = 0x3f000000;
        auVar366._16_4_ = 0x3f000000;
        auVar366._20_4_ = 0x3f000000;
        auVar366._24_4_ = 0x3f000000;
        auVar366._28_4_ = 0x3f000000;
        auVar372._8_4_ = 0x3fb8aa3b;
        auVar372._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar372._12_4_ = 0x3fb8aa3b;
        auVar372._16_4_ = 0x3fb8aa3b;
        auVar372._20_4_ = 0x3fb8aa3b;
        auVar372._24_4_ = 0x3fb8aa3b;
        auVar372._28_4_ = 0x3fb8aa3b;
        auVar378._8_4_ = 0x3f800000;
        auVar378._0_8_ = 0x3f8000003f800000;
        auVar378._12_4_ = 0x3f800000;
        auVar378._16_4_ = 0x3f800000;
        auVar378._20_4_ = 0x3f800000;
        auVar378._24_4_ = 0x3f800000;
        auVar378._28_4_ = 0x3f800000;
        auVar384._8_4_ = 0x3f318000;
        auVar384._0_8_ = 0x3f3180003f318000;
        auVar384._12_4_ = 0x3f318000;
        auVar384._16_4_ = 0x3f318000;
        auVar384._20_4_ = 0x3f318000;
        auVar384._24_4_ = 0x3f318000;
        auVar384._28_4_ = 0x3f318000;
        auVar241 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar434._8_4_ = 0x3ab743ce;
        auVar434._0_8_ = 0x3ab743ce3ab743ce;
        auVar434._12_4_ = 0x3ab743ce;
        auVar434._16_4_ = 0x3ab743ce;
        auVar434._20_4_ = 0x3ab743ce;
        auVar434._24_4_ = 0x3ab743ce;
        auVar434._28_4_ = 0x3ab743ce;
        auVar440._8_4_ = 0x3c088908;
        auVar440._0_8_ = 0x3c0889083c088908;
        auVar440._12_4_ = 0x3c088908;
        auVar440._16_4_ = 0x3c088908;
        auVar440._20_4_ = 0x3c088908;
        auVar440._24_4_ = 0x3c088908;
        auVar440._28_4_ = 0x3c088908;
        auVar446._8_4_ = 0x3d2aa9c1;
        auVar446._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar446._12_4_ = 0x3d2aa9c1;
        auVar446._16_4_ = 0x3d2aa9c1;
        auVar446._20_4_ = 0x3d2aa9c1;
        auVar446._24_4_ = 0x3d2aa9c1;
        auVar446._28_4_ = 0x3d2aa9c1;
        auVar452._8_4_ = 0x3e2aaaaa;
        auVar452._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar452._12_4_ = 0x3e2aaaaa;
        auVar452._16_4_ = 0x3e2aaaaa;
        auVar452._20_4_ = 0x3e2aaaaa;
        auVar452._24_4_ = 0x3e2aaaaa;
        auVar452._28_4_ = 0x3e2aaaaa;
        auVar458._8_4_ = 0x3f800000;
        auVar458._0_8_ = 0x3f8000003f800000;
        auVar458._12_4_ = 0x3f800000;
        auVar458._16_4_ = 0x3f800000;
        auVar458._20_4_ = 0x3f800000;
        auVar458._24_4_ = 0x3f800000;
        auVar458._28_4_ = 0x3f800000;
        auVar464._8_4_ = 0xb95e8083;
        auVar464._0_8_ = 0xb95e8083b95e8083;
        auVar464._12_4_ = 0xb95e8083;
        auVar464._16_4_ = 0xb95e8083;
        auVar464._20_4_ = 0xb95e8083;
        auVar464._24_4_ = 0xb95e8083;
        auVar464._28_4_ = 0xb95e8083;
        auVar242 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar263 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar264 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar265 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar266 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar267 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar268 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar269 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar270 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar271 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar272 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar273 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        for (; uVar166 != uVar178; uVar166 = uVar166 + 1) {
          local_288 = (undefined1 (*) [32])
                      (local_1e8.cstep * uVar166 * local_1e8.elemsize + (long)local_1e8.data);
          iVar8 = bottom_blob->w;
          iVar7 = bottom_blob->h;
          uVar159 = 0;
          uVar158 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar158 = uVar159;
          }
          uVar180 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar180 = uVar159;
          }
          uVar142 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar142 = uVar159;
          }
          local_168._0_4_ = uVar142;
          for (; uVar159 != uVar142; uVar159 = uVar159 + 1) {
            iVar144 = (1 - uVar157) * iVar139;
            for (uVar170 = 0; uVar170 != uVar180; uVar170 = uVar170 + 1) {
              if (pvVar14 == (void *)0x0) {
                auVar333 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar333 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar14 + uVar166 * 0x20));
              }
              pvVar179 = bottom_blob->data;
              lVar150 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar166 * (this->weight_data_tm).elemsize +
                        0x60;
              for (uVar146 = 0; uVar146 != uVar158; uVar146 = uVar146 + 1) {
                lVar155 = lVar150;
                for (uVar177 = 0; uVar177 != uVar154; uVar177 = uVar177 + 1) {
                  iVar140 = (((int)uVar177 - uVar160) + 1) * iVar138 + uVar159;
                  if (((-1 < iVar140) && (iVar141 = iVar140 / iVar152, iVar140 % iVar152 == 0)) &&
                     (iVar141 < iVar7)) {
                    lVar119 = (long)iVar141 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar146;
                    iVar140 = iVar144;
                    for (lVar164 = 0; uVar165 * 0x80 != lVar164; lVar164 = lVar164 + 0x80) {
                      if (((-1 < iVar140) && (iVar141 = iVar140 / iVar156, iVar140 % iVar156 == 0))
                         && (iVar141 < iVar8)) {
                        lVar145 = (long)(iVar141 << 2);
                        uVar335 = *(undefined4 *)((long)pvVar179 + lVar145 * 4 + lVar119);
                        auVar402._4_4_ = uVar335;
                        auVar402._0_4_ = uVar335;
                        auVar402._8_4_ = uVar335;
                        auVar402._12_4_ = uVar335;
                        auVar402._16_4_ = uVar335;
                        auVar402._20_4_ = uVar335;
                        auVar402._24_4_ = uVar335;
                        auVar402._28_4_ = uVar335;
                        uVar335 = *(undefined4 *)((long)pvVar179 + lVar145 * 4 + lVar119 + 4);
                        auVar425._4_4_ = uVar335;
                        auVar425._0_4_ = uVar335;
                        auVar425._8_4_ = uVar335;
                        auVar425._12_4_ = uVar335;
                        auVar425._16_4_ = uVar335;
                        auVar425._20_4_ = uVar335;
                        auVar425._24_4_ = uVar335;
                        auVar425._28_4_ = uVar335;
                        auVar274 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 8)));
                        auVar243 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0xc)));
                        auVar185 = vfmadd231ps_fma(auVar333._0_32_,auVar402,
                                                   *(undefined1 (*) [32])(lVar155 + -0x60 + lVar164)
                                                  );
                        auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar425,
                                                   *(undefined1 (*) [32])(lVar155 + -0x40 + lVar164)
                                                  );
                        auVar274 = vfmadd231ps_avx512vl
                                             (ZEXT1632(auVar185),auVar274,
                                              *(undefined1 (*) [32])(lVar155 + -0x20 + lVar164));
                        auVar274 = vfmadd231ps_avx512vl
                                             (auVar274,auVar243,
                                              *(undefined1 (*) [32])(lVar155 + lVar164));
                        auVar333 = ZEXT3264(auVar274);
                      }
                      iVar140 = iVar140 + iVar139;
                    }
                  }
                  lVar155 = lVar155 + (long)(int)uVar157 * 0x80;
                }
                lVar150 = lVar150 + (long)(int)(uVar157 * uVar160 * 0x20) * 4;
              }
              auVar274 = auVar333._0_32_;
              auVar287 = auVar274;
              if (5 < iVar153 - 1U) goto switchD_0026c23a_caseD_1;
              auVar243 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              auVar287 = vmaxps_avx(auVar274,auVar243);
              switch(iVar153) {
              case 2:
                auVar274 = vminps_avx(auVar274,auVar243);
                uVar335 = *(this->super_Deconvolution).activation_params.data;
                auVar89._4_4_ = uVar335;
                auVar89._0_4_ = uVar335;
                auVar89._8_4_ = uVar335;
                auVar89._12_4_ = uVar335;
                auVar89._16_4_ = uVar335;
                auVar89._20_4_ = uVar335;
                auVar89._24_4_ = uVar335;
                auVar89._28_4_ = uVar335;
                auVar287 = vfmadd231ps_avx512vl(auVar287,auVar274,auVar89);
                break;
              case 3:
                puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar335 = *puVar10;
                auVar87._4_4_ = uVar335;
                auVar87._0_4_ = uVar335;
                auVar87._8_4_ = uVar335;
                auVar87._12_4_ = uVar335;
                auVar87._16_4_ = uVar335;
                auVar87._20_4_ = uVar335;
                auVar87._24_4_ = uVar335;
                auVar87._28_4_ = uVar335;
                auVar274 = vmaxps_avx512vl(auVar274,auVar87);
                uVar335 = puVar10[1];
                auVar88._4_4_ = uVar335;
                auVar88._0_4_ = uVar335;
                auVar88._8_4_ = uVar335;
                auVar88._12_4_ = uVar335;
                auVar88._16_4_ = uVar335;
                auVar88._20_4_ = uVar335;
                auVar88._24_4_ = uVar335;
                auVar88._28_4_ = uVar335;
                auVar287 = vminps_avx512vl(auVar274,auVar88);
                break;
              case 4:
                auVar85._8_4_ = 0x80000000;
                auVar85._0_8_ = 0x8000000080000000;
                auVar85._12_4_ = 0x80000000;
                auVar85._16_4_ = 0x80000000;
                auVar85._20_4_ = 0x80000000;
                auVar85._24_4_ = 0x80000000;
                auVar85._28_4_ = 0x80000000;
                auVar274 = vxorps_avx512vl(auVar274,auVar85);
                auVar274 = vminps_avx(auVar274,auVar353);
                auVar274 = vmaxps_avx(auVar274,auVar360);
                auVar185 = vfmadd231ps_fma(auVar366,auVar274,auVar372);
                auVar243 = vrndscaleps_avx512vl(ZEXT1632(auVar185),1);
                uVar146 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar243,1);
                auVar244 = vsubps_avx512vl(auVar243,auVar378);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar288._0_4_ = (uint)bVar184 * auVar244._0_4_ | (uint)!bVar184 * auVar243._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar288._4_4_ = (uint)bVar184 * auVar244._4_4_ | (uint)!bVar184 * auVar243._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar288._8_4_ = (uint)bVar184 * auVar244._8_4_ | (uint)!bVar184 * auVar243._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar288._12_4_ = (uint)bVar184 * auVar244._12_4_ | (uint)!bVar184 * auVar243._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar288._16_4_ = (uint)bVar184 * auVar244._16_4_ | (uint)!bVar184 * auVar243._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar288._20_4_ = (uint)bVar184 * auVar244._20_4_ | (uint)!bVar184 * auVar243._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar288._24_4_ = (uint)bVar184 * auVar244._24_4_ | (uint)!bVar184 * auVar243._24_4_
                ;
                bVar184 = SUB81(uVar146 >> 7,0);
                auVar288._28_4_ = (uint)bVar184 * auVar244._28_4_ | (uint)!bVar184 * auVar243._28_4_
                ;
                auVar274 = vfmsub231ps_avx512vl(auVar274,auVar288,auVar384);
                auVar86._8_4_ = 0x395e8083;
                auVar86._0_8_ = 0x395e8083395e8083;
                auVar86._12_4_ = 0x395e8083;
                auVar86._16_4_ = 0x395e8083;
                auVar86._20_4_ = 0x395e8083;
                auVar86._24_4_ = 0x395e8083;
                auVar86._28_4_ = 0x395e8083;
                auVar274 = vfmsub231ps_avx512vl(auVar274,auVar288,auVar86);
                auVar403._0_4_ = auVar274._0_4_ * auVar274._0_4_;
                auVar403._4_4_ = auVar274._4_4_ * auVar274._4_4_;
                auVar403._8_4_ = auVar274._8_4_ * auVar274._8_4_;
                auVar403._12_4_ = auVar274._12_4_ * auVar274._12_4_;
                auVar403._16_4_ = auVar274._16_4_ * auVar274._16_4_;
                auVar403._20_4_ = auVar274._20_4_ * auVar274._20_4_;
                auVar403._24_4_ = auVar274._24_4_ * auVar274._24_4_;
                auVar403._28_4_ = 0;
                auVar185 = vfmadd213ps_fma(auVar241,auVar274,auVar434);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar274,auVar440);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar274,auVar446);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar274,auVar452);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar274,auVar366);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar403,auVar274);
                auVar346._0_4_ = auVar185._0_4_ + 1.0;
                auVar346._4_4_ = auVar185._4_4_ + 1.0;
                auVar346._8_4_ = auVar185._8_4_ + 1.0;
                auVar346._12_4_ = auVar185._12_4_ + 1.0;
                auVar346._16_4_ = 0x3f800000;
                auVar346._20_4_ = 0x3f800000;
                auVar346._24_4_ = 0x3f800000;
                auVar346._28_4_ = 0x3f800000;
                auVar274 = vcvttps2dq_avx512vl(auVar288);
                auVar274 = vpslld_avx2(auVar274,0x17);
                auVar274 = vpaddd_avx2(auVar274,auVar458);
                auVar185 = vfmadd213ps_fma(auVar274,auVar346,auVar378);
                auVar287 = vdivps_avx(auVar378,ZEXT1632(auVar185));
                break;
              case 5:
                auVar274 = vminps_avx(auVar274,auVar353);
                auVar274 = vmaxps_avx(auVar274,auVar360);
                auVar185 = vfmadd213ps_fma(auVar372,auVar274,auVar366);
                auVar244 = vrndscaleps_avx512vl(ZEXT1632(auVar185),1);
                uVar146 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar244,1);
                auVar245 = vsubps_avx512vl(auVar244,auVar378);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar282._0_4_ = (uint)bVar184 * auVar245._0_4_ | (uint)!bVar184 * auVar244._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar282._4_4_ = (uint)bVar184 * auVar245._4_4_ | (uint)!bVar184 * auVar244._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar282._8_4_ = (uint)bVar184 * auVar245._8_4_ | (uint)!bVar184 * auVar244._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar282._12_4_ = (uint)bVar184 * auVar245._12_4_ | (uint)!bVar184 * auVar244._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar282._16_4_ = (uint)bVar184 * auVar245._16_4_ | (uint)!bVar184 * auVar244._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar282._20_4_ = (uint)bVar184 * auVar245._20_4_ | (uint)!bVar184 * auVar244._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar282._24_4_ = (uint)bVar184 * auVar245._24_4_ | (uint)!bVar184 * auVar244._24_4_
                ;
                bVar184 = SUB81(uVar146 >> 7,0);
                auVar282._28_4_ = (uint)bVar184 * auVar245._28_4_ | (uint)!bVar184 * auVar244._28_4_
                ;
                auVar274 = vfmsub231ps_avx512vl(auVar274,auVar282,auVar384);
                auVar274 = vfnmsub231ps_avx512vl(auVar274,auVar282,auVar464);
                auVar426._0_4_ = auVar274._0_4_ * auVar274._0_4_;
                auVar426._4_4_ = auVar274._4_4_ * auVar274._4_4_;
                auVar426._8_4_ = auVar274._8_4_ * auVar274._8_4_;
                auVar426._12_4_ = auVar274._12_4_ * auVar274._12_4_;
                auVar426._16_4_ = auVar274._16_4_ * auVar274._16_4_;
                auVar426._20_4_ = auVar274._20_4_ * auVar274._20_4_;
                auVar426._24_4_ = auVar274._24_4_ * auVar274._24_4_;
                auVar426._28_4_ = 0;
                auVar244 = vfmadd213ps_avx512vl(auVar241,auVar274,auVar434);
                auVar244 = vfmadd213ps_avx512vl(auVar244,auVar274,auVar440);
                auVar244 = vfmadd213ps_avx512vl(auVar244,auVar274,auVar446);
                auVar244 = vfmadd213ps_avx512vl(auVar244,auVar274,auVar452);
                auVar244 = vfmadd213ps_avx512vl(auVar244,auVar274,auVar366);
                auVar274 = vfmadd213ps_avx512vl(auVar244,auVar426,auVar274);
                auVar244 = vaddps_avx512vl(auVar274,auVar378);
                auVar274 = vcvttps2dq_avx512vl(auVar282);
                auVar274 = vpslld_avx2(auVar274,0x17);
                auVar274 = vpaddd_avx2(auVar274,auVar458);
                auVar185 = vfmadd213ps_fma(auVar274,auVar244,auVar378);
                uVar146 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar243,2);
                auVar82._8_4_ = 0x800000;
                auVar82._0_8_ = 0x80000000800000;
                auVar82._12_4_ = 0x800000;
                auVar82._16_4_ = 0x800000;
                auVar82._20_4_ = 0x800000;
                auVar82._24_4_ = 0x800000;
                auVar82._28_4_ = 0x800000;
                auVar274 = vmaxps_avx512vl(ZEXT1632(auVar185),auVar82);
                auVar245 = vpsrld_avx2(auVar274,0x17);
                auVar243 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                auVar83._8_4_ = 0x3f000000;
                auVar83._0_8_ = 0x3f0000003f000000;
                auVar83._12_4_ = 0x3f000000;
                auVar83._16_4_ = 0x3f000000;
                auVar83._20_4_ = 0x3f000000;
                auVar83._24_4_ = 0x3f000000;
                auVar83._28_4_ = 0x3f000000;
                auVar274 = vpternlogd_avx512vl(auVar274,auVar243,auVar83,0xea);
                uVar177 = vcmpps_avx512vl(auVar274,auVar242,1);
                auVar243 = vaddps_avx512vl(auVar274,auVar263);
                auVar274 = vaddps_avx512vl(auVar243,auVar274);
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar283._0_4_ = (uint)bVar184 * auVar274._0_4_ | (uint)!bVar184 * auVar243._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar283._4_4_ = (uint)bVar184 * auVar274._4_4_ | (uint)!bVar184 * auVar243._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar283._8_4_ = (uint)bVar184 * auVar274._8_4_ | (uint)!bVar184 * auVar243._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar283._12_4_ = (uint)bVar184 * auVar274._12_4_ | (uint)!bVar184 * auVar243._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar283._16_4_ = (uint)bVar184 * auVar274._16_4_ | (uint)!bVar184 * auVar243._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar283._20_4_ = (uint)bVar184 * auVar274._20_4_ | (uint)!bVar184 * auVar243._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar283._24_4_ = (uint)bVar184 * auVar274._24_4_ | (uint)!bVar184 * auVar243._24_4_
                ;
                bVar184 = SUB81(uVar177 >> 7,0);
                auVar283._28_4_ = (uint)bVar184 * auVar274._28_4_ | (uint)!bVar184 * auVar243._28_4_
                ;
                auVar243 = vmulps_avx512vl(auVar283,auVar283);
                auVar274 = vfmadd213ps_avx512vl(auVar264,auVar283,auVar265);
                auVar274 = vfmadd213ps_avx512vl(auVar274,auVar283,auVar266);
                auVar274 = vfmadd213ps_avx512vl(auVar274,auVar283,auVar267);
                auVar274 = vfmadd213ps_avx512vl(auVar274,auVar283,auVar268);
                auVar274 = vfmadd213ps_avx512vl(auVar274,auVar283,auVar269);
                auVar274 = vfmadd213ps_avx512vl(auVar274,auVar283,auVar270);
                auVar274 = vfmadd213ps_avx512vl(auVar274,auVar283,auVar271);
                auVar274 = vfmadd213ps_avx512vl(auVar274,auVar283,auVar272);
                auVar244 = vmulps_avx512vl(auVar243,auVar283);
                auVar244 = vmulps_avx512vl(auVar244,auVar274);
                auVar84._8_4_ = 0xffffff82;
                auVar84._0_8_ = 0xffffff82ffffff82;
                auVar84._12_4_ = 0xffffff82;
                auVar84._16_4_ = 0xffffff82;
                auVar84._20_4_ = 0xffffff82;
                auVar84._24_4_ = 0xffffff82;
                auVar84._28_4_ = 0xffffff82;
                auVar274 = vpaddd_avx512vl(auVar245,auVar84);
                auVar274 = vcvtdq2ps_avx(auVar274);
                auVar245 = vsubps_avx512vl(auVar274,auVar378);
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar284._0_4_ = (uint)bVar184 * auVar245._0_4_ | (uint)!bVar184 * auVar274._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar284._4_4_ = (uint)bVar184 * auVar245._4_4_ | (uint)!bVar184 * auVar274._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar284._8_4_ = (uint)bVar184 * auVar245._8_4_ | (uint)!bVar184 * auVar274._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar284._12_4_ = (uint)bVar184 * auVar245._12_4_ | (uint)!bVar184 * auVar274._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar284._16_4_ = (uint)bVar184 * auVar245._16_4_ | (uint)!bVar184 * auVar274._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar284._20_4_ = (uint)bVar184 * auVar245._20_4_ | (uint)!bVar184 * auVar274._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar284._24_4_ = (uint)bVar184 * auVar245._24_4_ | (uint)!bVar184 * auVar274._24_4_
                ;
                bVar184 = SUB81(uVar177 >> 7,0);
                auVar284._28_4_ = (uint)bVar184 * auVar245._28_4_ | (uint)!bVar184 * auVar274._28_4_
                ;
                auVar274 = vfmadd231ps_avx512vl(auVar244,auVar284,auVar464);
                auVar274 = vfmsub231ps_avx512vl(auVar274,auVar366,auVar243);
                auVar274 = vsubps_avx512vl(auVar274,auVar283);
                auVar185 = vfmsub231ps_fma(auVar274,auVar384,auVar284);
                auVar274 = vmulps_avx512vl(ZEXT1632(auVar185),auVar273);
                auVar243 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar285._0_4_ = (uint)bVar184 * auVar243._0_4_ | (uint)!bVar184 * auVar274._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar285._4_4_ = (uint)bVar184 * auVar243._4_4_ | (uint)!bVar184 * auVar274._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar285._8_4_ = (uint)bVar184 * auVar243._8_4_ | (uint)!bVar184 * auVar274._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar285._12_4_ = (uint)bVar184 * auVar243._12_4_ | (uint)!bVar184 * auVar274._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar285._16_4_ = (uint)bVar184 * auVar243._16_4_ | (uint)!bVar184 * auVar274._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar285._20_4_ = (uint)bVar184 * auVar243._20_4_ | (uint)!bVar184 * auVar274._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar285._24_4_ = (uint)bVar184 * auVar243._24_4_ | (uint)!bVar184 * auVar274._24_4_
                ;
                bVar184 = SUB81(uVar146 >> 7,0);
                auVar285._28_4_ = (uint)bVar184 * auVar243._28_4_ | (uint)!bVar184 * auVar274._28_4_
                ;
                auVar274 = vminps_avx(auVar285,auVar353);
                auVar274 = vmaxps_avx(auVar274,auVar360);
                auVar185 = vfmadd213ps_fma(auVar372,auVar274,auVar366);
                auVar243 = vrndscaleps_avx512vl(ZEXT1632(auVar185),1);
                uVar146 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar243,1);
                auVar244 = vsubps_avx512vl(auVar243,auVar378);
                bVar184 = (bool)((byte)uVar146 & 1);
                auVar286._0_4_ = (uint)bVar184 * auVar244._0_4_ | (uint)!bVar184 * auVar243._0_4_;
                bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                auVar286._4_4_ = (uint)bVar184 * auVar244._4_4_ | (uint)!bVar184 * auVar243._4_4_;
                bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                auVar286._8_4_ = (uint)bVar184 * auVar244._8_4_ | (uint)!bVar184 * auVar243._8_4_;
                bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                auVar286._12_4_ = (uint)bVar184 * auVar244._12_4_ | (uint)!bVar184 * auVar243._12_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 4) & 1);
                auVar286._16_4_ = (uint)bVar184 * auVar244._16_4_ | (uint)!bVar184 * auVar243._16_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 5) & 1);
                auVar286._20_4_ = (uint)bVar184 * auVar244._20_4_ | (uint)!bVar184 * auVar243._20_4_
                ;
                bVar184 = (bool)((byte)(uVar146 >> 6) & 1);
                auVar286._24_4_ = (uint)bVar184 * auVar244._24_4_ | (uint)!bVar184 * auVar243._24_4_
                ;
                bVar184 = SUB81(uVar146 >> 7,0);
                auVar286._28_4_ = (uint)bVar184 * auVar244._28_4_ | (uint)!bVar184 * auVar243._28_4_
                ;
                auVar274 = vfmsub231ps_avx512vl(auVar274,auVar286,auVar384);
                auVar274 = vfnmsub231ps_avx512vl(auVar274,auVar286,auVar464);
                auVar427._0_4_ = auVar274._0_4_ * auVar274._0_4_;
                auVar427._4_4_ = auVar274._4_4_ * auVar274._4_4_;
                auVar427._8_4_ = auVar274._8_4_ * auVar274._8_4_;
                auVar427._12_4_ = auVar274._12_4_ * auVar274._12_4_;
                auVar427._16_4_ = auVar274._16_4_ * auVar274._16_4_;
                auVar427._20_4_ = auVar274._20_4_ * auVar274._20_4_;
                auVar427._24_4_ = auVar274._24_4_ * auVar274._24_4_;
                auVar427._28_4_ = 0;
                auVar243 = vfmadd213ps_avx512vl(auVar241,auVar274,auVar434);
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar274,auVar440);
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar274,auVar446);
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar274,auVar452);
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar274,auVar366);
                auVar274 = vfmadd213ps_avx512vl(auVar243,auVar427,auVar274);
                auVar243 = vaddps_avx512vl(auVar274,auVar378);
                auVar274 = vcvttps2dq_avx512vl(auVar286);
                auVar274 = vpslld_avx2(auVar274,0x17);
                auVar274 = vpaddd_avx2(auVar274,auVar458);
                auVar185 = vfmadd213ps_fma(auVar274,auVar243,auVar378);
                auVar274 = vdivps_avx(auVar378,ZEXT1632(auVar185));
                auVar274 = vfnmadd213ps_avx512vl(auVar274,auVar273,auVar263);
                goto LAB_0026c4e8;
              case 6:
                puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar335 = *puVar10;
                auVar404._4_4_ = uVar335;
                auVar404._0_4_ = uVar335;
                auVar404._8_4_ = uVar335;
                auVar404._12_4_ = uVar335;
                auVar404._16_4_ = uVar335;
                auVar404._20_4_ = uVar335;
                auVar404._24_4_ = uVar335;
                auVar404._28_4_ = uVar335;
                uVar335 = puVar10[1];
                auVar81._4_4_ = uVar335;
                auVar81._0_4_ = uVar335;
                auVar81._8_4_ = uVar335;
                auVar81._12_4_ = uVar335;
                auVar81._16_4_ = uVar335;
                auVar81._20_4_ = uVar335;
                auVar81._24_4_ = uVar335;
                auVar81._28_4_ = uVar335;
                auVar274 = vfmadd213ps_avx512vl(auVar404,auVar274,auVar81);
                auVar274 = vmaxps_avx(auVar274,auVar243);
                auVar274 = vminps_avx(auVar274,auVar378);
LAB_0026c4e8:
                auVar287._4_4_ = auVar274._4_4_ * auVar333._4_4_;
                auVar287._0_4_ = auVar274._0_4_ * auVar333._0_4_;
                auVar287._8_4_ = auVar274._8_4_ * auVar333._8_4_;
                auVar287._12_4_ = auVar274._12_4_ * auVar333._12_4_;
                auVar287._16_4_ = auVar274._16_4_ * auVar333._16_4_;
                auVar287._20_4_ = auVar274._20_4_ * auVar333._20_4_;
                auVar287._24_4_ = auVar274._24_4_ * auVar333._24_4_;
                auVar287._28_4_ = auVar274._28_4_;
              }
switchD_0026c23a_caseD_1:
              *local_288 = auVar287;
              local_288 = local_288 + 1;
              iVar144 = iVar144 + 1;
            }
          }
        }
      }
      if ((iVar174 == 8) && (uVar151 == 4)) {
        uVar157 = (this->super_Deconvolution).kernel_w;
        uVar160 = (this->super_Deconvolution).kernel_h;
        iVar139 = (this->super_Deconvolution).dilation_w;
        iVar138 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar152 = (this->super_Deconvolution).stride_h;
        iVar153 = (this->super_Deconvolution).activation_type;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        uVar166 = 0;
        uVar165 = 0;
        if (0 < (int)uVar157) {
          uVar165 = (ulong)uVar157;
        }
        uVar154 = 0;
        if (0 < (int)uVar160) {
          uVar154 = (ulong)uVar160;
        }
        uVar178 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar178 = uVar166;
        }
        auVar349._8_4_ = 0x42b0c0a5;
        auVar349._0_8_ = 0x42b0c0a542b0c0a5;
        auVar349._12_4_ = 0x42b0c0a5;
        auVar356._8_4_ = 0xc2b0c0a5;
        auVar356._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar356._12_4_ = 0xc2b0c0a5;
        auVar362._8_4_ = 0x3f000000;
        auVar362._0_8_ = 0x3f0000003f000000;
        auVar362._12_4_ = 0x3f000000;
        auVar368._8_4_ = 0x3fb8aa3b;
        auVar368._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar368._12_4_ = 0x3fb8aa3b;
        auVar374._8_4_ = 0x3f800000;
        auVar374._0_8_ = 0x3f8000003f800000;
        auVar374._12_4_ = 0x3f800000;
        auVar380._8_4_ = 0x3f318000;
        auVar380._0_8_ = 0x3f3180003f318000;
        auVar380._12_4_ = 0x3f318000;
        auVar185 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar430._8_4_ = 0x3ab743ce;
        auVar430._0_8_ = 0x3ab743ce3ab743ce;
        auVar430._12_4_ = 0x3ab743ce;
        auVar436._8_4_ = 0x3c088908;
        auVar436._0_8_ = 0x3c0889083c088908;
        auVar436._12_4_ = 0x3c088908;
        auVar442._8_4_ = 0x3d2aa9c1;
        auVar442._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar442._12_4_ = 0x3d2aa9c1;
        auVar448._8_4_ = 0x3e2aaaaa;
        auVar448._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar448._12_4_ = 0x3e2aaaaa;
        auVar454._8_4_ = 0x3f800000;
        auVar454._0_8_ = 0x3f8000003f800000;
        auVar454._12_4_ = 0x3f800000;
        auVar460._8_4_ = 0xb95e8083;
        auVar460._0_8_ = 0xb95e8083b95e8083;
        auVar460._12_4_ = 0xb95e8083;
        auVar186 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar187 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar208 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar209 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar210 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar211 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar212 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar213 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar214 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        for (; uVar166 != uVar178; uVar166 = uVar166 + 1) {
          local_288 = (undefined1 (*) [32])
                      (local_1e8.cstep * uVar166 * local_1e8.elemsize + (long)local_1e8.data);
          iVar8 = bottom_blob->w;
          iVar7 = bottom_blob->h;
          uVar159 = 0;
          uVar158 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar158 = uVar159;
          }
          uVar180 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar180 = uVar159;
          }
          uVar142 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar142 = uVar159;
          }
          local_168._0_4_ = uVar142;
          for (; uVar159 != uVar142; uVar159 = uVar159 + 1) {
            iVar144 = (1 - uVar157) * iVar139;
            for (uVar170 = 0; uVar170 != uVar180; uVar170 = uVar170 + 1) {
              if (pvVar14 == (void *)0x0) {
                auVar219 = ZEXT816(0) << 0x40;
              }
              else {
                auVar219 = *(undefined1 (*) [16])((long)pvVar14 + uVar166 * 0x10);
              }
              auVar333 = ZEXT1664(auVar219);
              pvVar179 = bottom_blob->data;
              lVar150 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar166 * (this->weight_data_tm).elemsize +
                        0x70;
              for (uVar146 = 0; uVar146 != uVar158; uVar146 = uVar146 + 1) {
                lVar155 = lVar150;
                for (uVar177 = 0; uVar177 != uVar154; uVar177 = uVar177 + 1) {
                  iVar140 = (((int)uVar177 - uVar160) + 1) * iVar138 + uVar159;
                  if (((-1 < iVar140) && (iVar141 = iVar140 / iVar152, iVar140 % iVar152 == 0)) &&
                     (iVar141 < iVar7)) {
                    lVar119 = (long)iVar141 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar146;
                    iVar140 = iVar144;
                    for (lVar164 = 0; uVar165 * 0x80 != lVar164; lVar164 = lVar164 + 0x80) {
                      if (((-1 < iVar140) && (iVar141 = iVar140 / iVar156, iVar140 % iVar156 == 0))
                         && (iVar141 < iVar8)) {
                        lVar145 = (long)(iVar141 << 3);
                        uVar335 = *(undefined4 *)((long)pvVar179 + lVar145 * 4 + lVar119);
                        auVar388._4_4_ = uVar335;
                        auVar388._0_4_ = uVar335;
                        auVar388._8_4_ = uVar335;
                        auVar388._12_4_ = uVar335;
                        uVar335 = *(undefined4 *)((long)pvVar179 + lVar145 * 4 + lVar119 + 4);
                        auVar411._4_4_ = uVar335;
                        auVar411._0_4_ = uVar335;
                        auVar411._8_4_ = uVar335;
                        auVar411._12_4_ = uVar335;
                        auVar215 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 8)));
                        auVar216 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0xc)));
                        auVar217 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x10)));
                        auVar218 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x14)));
                        auVar188 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x18)));
                        auVar189 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0x1c)));
                        auVar219 = vfmadd231ps_fma(auVar333._0_16_,auVar388,
                                                   *(undefined1 (*) [16])(lVar155 + -0x70 + lVar164)
                                                  );
                        auVar219 = vfmadd231ps_fma(auVar219,auVar411,
                                                   *(undefined1 (*) [16])(lVar155 + -0x60 + lVar164)
                                                  );
                        auVar219 = vfmadd231ps_avx512vl
                                             (auVar219,auVar215,
                                              *(undefined1 (*) [16])(lVar155 + -0x50 + lVar164));
                        auVar219 = vfmadd231ps_avx512vl
                                             (auVar219,auVar216,
                                              *(undefined1 (*) [16])(lVar155 + -0x40 + lVar164));
                        auVar219 = vfmadd231ps_avx512vl
                                             (auVar219,auVar217,
                                              *(undefined1 (*) [16])(lVar155 + -0x30 + lVar164));
                        auVar219 = vfmadd231ps_avx512vl
                                             (auVar219,auVar218,
                                              *(undefined1 (*) [16])(lVar155 + -0x20 + lVar164));
                        auVar219 = vfmadd231ps_avx512vl
                                             (auVar219,auVar188,
                                              *(undefined1 (*) [16])(lVar155 + -0x10 + lVar164));
                        auVar219 = vfmadd231ps_avx512vl
                                             (auVar219,auVar189,
                                              *(undefined1 (*) [16])(lVar155 + lVar164));
                        auVar333 = ZEXT1664(auVar219);
                      }
                      iVar140 = iVar140 + iVar139;
                    }
                  }
                  lVar155 = lVar155 + (long)(int)uVar157 * 0x80;
                }
                lVar150 = lVar150 + (long)(int)(uVar157 * uVar160 * 0x20) * 4;
              }
              auVar219 = auVar333._0_16_;
              auVar225 = auVar219;
              if (iVar153 - 1U < 6) {
                auVar225 = vmaxps_avx(auVar219,(undefined1  [16])0x0);
                switch(iVar153) {
                case 2:
                  auVar219 = vminps_avx(auVar219,(undefined1  [16])0x0);
                  uVar335 = *(this->super_Deconvolution).activation_params.data;
                  auVar38._4_4_ = uVar335;
                  auVar38._0_4_ = uVar335;
                  auVar38._8_4_ = uVar335;
                  auVar38._12_4_ = uVar335;
                  auVar225 = vfmadd231ps_avx512vl(auVar225,auVar219,auVar38);
                  break;
                case 3:
                  puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar335 = *puVar10;
                  auVar36._4_4_ = uVar335;
                  auVar36._0_4_ = uVar335;
                  auVar36._8_4_ = uVar335;
                  auVar36._12_4_ = uVar335;
                  auVar219 = vmaxps_avx512vl(auVar219,auVar36);
                  uVar335 = puVar10[1];
                  auVar37._4_4_ = uVar335;
                  auVar37._0_4_ = uVar335;
                  auVar37._8_4_ = uVar335;
                  auVar37._12_4_ = uVar335;
                  auVar225 = vminps_avx512vl(auVar219,auVar37);
                  break;
                case 4:
                  auVar34._8_4_ = 0x80000000;
                  auVar34._0_8_ = 0x8000000080000000;
                  auVar34._12_4_ = 0x80000000;
                  auVar219 = vxorps_avx512vl(auVar219,auVar34);
                  auVar219 = vminps_avx(auVar219,auVar349);
                  auVar219 = vmaxps_avx(auVar219,auVar356);
                  auVar215 = vfmadd231ps_fma(auVar362,auVar219,auVar368);
                  auVar216 = vcvttps2dq_avx512vl(auVar215);
                  auVar216 = vcvtdq2ps_avx512vl(auVar216);
                  uVar146 = vcmpps_avx512vl(auVar215,auVar216,1);
                  auVar215 = vsubps_avx512vl(auVar216,auVar374);
                  bVar184 = (bool)((byte)uVar146 & 1);
                  auVar226._0_4_ = (uint)bVar184 * auVar215._0_4_ | (uint)!bVar184 * auVar216._0_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                  auVar226._4_4_ = (uint)bVar184 * auVar215._4_4_ | (uint)!bVar184 * auVar216._4_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                  auVar226._8_4_ = (uint)bVar184 * auVar215._8_4_ | (uint)!bVar184 * auVar216._8_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                  auVar226._12_4_ =
                       (uint)bVar184 * auVar215._12_4_ | (uint)!bVar184 * auVar216._12_4_;
                  auVar219 = vfmsub231ps_avx512vl(auVar219,auVar226,auVar380);
                  auVar35._8_4_ = 0x395e8083;
                  auVar35._0_8_ = 0x395e8083395e8083;
                  auVar35._12_4_ = 0x395e8083;
                  auVar215 = vfmsub231ps_avx512vl(auVar219,auVar226,auVar35);
                  auVar389._0_4_ = auVar215._0_4_ * auVar215._0_4_;
                  auVar389._4_4_ = auVar215._4_4_ * auVar215._4_4_;
                  auVar389._8_4_ = auVar215._8_4_ * auVar215._8_4_;
                  auVar389._12_4_ = auVar215._12_4_ * auVar215._12_4_;
                  auVar219 = vfmadd213ps_fma(auVar185,auVar215,auVar430);
                  auVar219 = vfmadd213ps_fma(auVar219,auVar215,auVar436);
                  auVar219 = vfmadd213ps_fma(auVar219,auVar215,auVar442);
                  auVar219 = vfmadd213ps_fma(auVar219,auVar215,auVar448);
                  auVar219 = vfmadd213ps_fma(auVar219,auVar215,auVar362);
                  auVar219 = vfmadd213ps_fma(auVar219,auVar389,auVar215);
                  auVar337._0_4_ = auVar219._0_4_ + 1.0;
                  auVar337._4_4_ = auVar219._4_4_ + 1.0;
                  auVar337._8_4_ = auVar219._8_4_ + 1.0;
                  auVar337._12_4_ = auVar219._12_4_ + 1.0;
                  auVar219 = vcvttps2dq_avx512vl(auVar226);
                  auVar219 = vpslld_avx(auVar219,0x17);
                  auVar219 = vpaddd_avx(auVar219,auVar454);
                  auVar219 = vfmadd213ps_fma(auVar219,auVar337,auVar374);
                  auVar225 = vdivps_avx(auVar374,auVar219);
                  break;
                case 5:
                  auVar215 = vminps_avx(auVar219,auVar349);
                  auVar215 = vmaxps_avx(auVar215,auVar356);
                  auVar216 = vfmadd213ps_fma(auVar368,auVar215,auVar362);
                  auVar217 = vcvttps2dq_avx512vl(auVar216);
                  auVar217 = vcvtdq2ps_avx512vl(auVar217);
                  uVar146 = vcmpps_avx512vl(auVar216,auVar217,1);
                  auVar216 = vsubps_avx512vl(auVar217,auVar374);
                  bVar184 = (bool)((byte)uVar146 & 1);
                  auVar220._0_4_ = (uint)bVar184 * auVar216._0_4_ | (uint)!bVar184 * auVar217._0_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                  auVar220._4_4_ = (uint)bVar184 * auVar216._4_4_ | (uint)!bVar184 * auVar217._4_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                  auVar220._8_4_ = (uint)bVar184 * auVar216._8_4_ | (uint)!bVar184 * auVar217._8_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                  auVar220._12_4_ =
                       (uint)bVar184 * auVar216._12_4_ | (uint)!bVar184 * auVar217._12_4_;
                  auVar215 = vfmsub231ps_avx512vl(auVar215,auVar220,auVar380);
                  auVar215 = vfnmsub231ps_avx512vl(auVar215,auVar220,auVar460);
                  auVar412._0_4_ = auVar215._0_4_ * auVar215._0_4_;
                  auVar412._4_4_ = auVar215._4_4_ * auVar215._4_4_;
                  auVar412._8_4_ = auVar215._8_4_ * auVar215._8_4_;
                  auVar412._12_4_ = auVar215._12_4_ * auVar215._12_4_;
                  auVar216 = vfmadd213ps_avx512vl(auVar185,auVar215,auVar430);
                  auVar216 = vfmadd213ps_avx512vl(auVar216,auVar215,auVar436);
                  auVar216 = vfmadd213ps_avx512vl(auVar216,auVar215,auVar442);
                  auVar216 = vfmadd213ps_avx512vl(auVar216,auVar215,auVar448);
                  auVar216 = vfmadd213ps_avx512vl(auVar216,auVar215,auVar362);
                  auVar215 = vfmadd213ps_avx512vl(auVar216,auVar412,auVar215);
                  auVar216 = vaddps_avx512vl(auVar215,auVar374);
                  auVar215 = vcvttps2dq_avx512vl(auVar220);
                  auVar215 = vpslld_avx(auVar215,0x17);
                  auVar215 = vpaddd_avx(auVar215,auVar454);
                  auVar215 = vfmadd213ps_fma(auVar215,auVar216,auVar374);
                  uVar146 = vcmpps_avx512vl(auVar215,(undefined1  [16])0x0,2);
                  auVar28._8_4_ = 0x800000;
                  auVar28._0_8_ = 0x80000000800000;
                  auVar28._12_4_ = 0x800000;
                  auVar215 = vmaxps_avx512vl(auVar215,auVar28);
                  auVar218 = vpsrld_avx(auVar215,0x17);
                  auVar216 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar29._8_4_ = 0x3f000000;
                  auVar29._0_8_ = 0x3f0000003f000000;
                  auVar29._12_4_ = 0x3f000000;
                  auVar215 = vpternlogd_avx512vl(auVar215,auVar216,auVar29,0xea);
                  auVar30._8_4_ = 0x3f3504f3;
                  auVar30._0_8_ = 0x3f3504f33f3504f3;
                  auVar30._12_4_ = 0x3f3504f3;
                  uVar177 = vcmpps_avx512vl(auVar215,auVar30,1);
                  auVar31._8_4_ = 0xbf800000;
                  auVar31._0_8_ = 0xbf800000bf800000;
                  auVar31._12_4_ = 0xbf800000;
                  auVar216 = vaddps_avx512vl(auVar215,auVar31);
                  auVar215 = vaddps_avx512vl(auVar216,auVar215);
                  bVar184 = (bool)((byte)uVar177 & 1);
                  auVar221._0_4_ = (uint)bVar184 * auVar215._0_4_ | (uint)!bVar184 * auVar216._0_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                  auVar221._4_4_ = (uint)bVar184 * auVar215._4_4_ | (uint)!bVar184 * auVar216._4_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                  auVar221._8_4_ = (uint)bVar184 * auVar215._8_4_ | (uint)!bVar184 * auVar216._8_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                  auVar221._12_4_ =
                       (uint)bVar184 * auVar215._12_4_ | (uint)!bVar184 * auVar216._12_4_;
                  auVar216 = vmulps_avx512vl(auVar221,auVar221);
                  auVar32._8_4_ = 0xbdebd1b8;
                  auVar32._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar32._12_4_ = 0xbdebd1b8;
                  auVar215 = vfmadd213ps_avx512vl(auVar186,auVar221,auVar32);
                  auVar215 = vfmadd213ps_avx512vl(auVar215,auVar221,auVar187);
                  auVar215 = vfmadd213ps_avx512vl(auVar215,auVar221,auVar208);
                  auVar215 = vfmadd213ps_avx512vl(auVar215,auVar221,auVar209);
                  auVar215 = vfmadd213ps_avx512vl(auVar215,auVar221,auVar210);
                  auVar215 = vfmadd213ps_avx512vl(auVar215,auVar221,auVar211);
                  auVar215 = vfmadd213ps_avx512vl(auVar215,auVar221,auVar212);
                  auVar215 = vfmadd213ps_avx512vl(auVar215,auVar221,auVar213);
                  auVar217 = vmulps_avx512vl(auVar216,auVar221);
                  auVar217 = vmulps_avx512vl(auVar217,auVar215);
                  auVar33._8_4_ = 0xffffff82;
                  auVar33._0_8_ = 0xffffff82ffffff82;
                  auVar33._12_4_ = 0xffffff82;
                  auVar215 = vpaddd_avx512vl(auVar218,auVar33);
                  auVar215 = vcvtdq2ps_avx(auVar215);
                  auVar218 = vsubps_avx512vl(auVar215,auVar374);
                  bVar184 = (bool)((byte)uVar177 & 1);
                  auVar222._0_4_ = (uint)bVar184 * auVar218._0_4_ | (uint)!bVar184 * auVar215._0_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                  auVar222._4_4_ = (uint)bVar184 * auVar218._4_4_ | (uint)!bVar184 * auVar215._4_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                  auVar222._8_4_ = (uint)bVar184 * auVar218._8_4_ | (uint)!bVar184 * auVar215._8_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                  auVar222._12_4_ =
                       (uint)bVar184 * auVar218._12_4_ | (uint)!bVar184 * auVar215._12_4_;
                  auVar215 = vfmadd231ps_avx512vl(auVar217,auVar222,auVar460);
                  auVar215 = vfmsub231ps_avx512vl(auVar215,auVar362,auVar216);
                  auVar215 = vsubps_avx512vl(auVar215,auVar221);
                  auVar215 = vfnmadd231ps_fma(auVar215,auVar380,auVar222);
                  auVar216 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar184 = (bool)((byte)uVar146 & 1);
                  auVar223._0_4_ =
                       (uint)bVar184 * auVar216._0_4_ |
                       (uint)!bVar184 * (int)(auVar215._0_4_ + auVar215._0_4_);
                  bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                  auVar223._4_4_ =
                       (uint)bVar184 * auVar216._4_4_ |
                       (uint)!bVar184 * (int)(auVar215._4_4_ + auVar215._4_4_);
                  bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                  auVar223._8_4_ =
                       (uint)bVar184 * auVar216._8_4_ |
                       (uint)!bVar184 * (int)(auVar215._8_4_ + auVar215._8_4_);
                  bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                  auVar223._12_4_ =
                       (uint)bVar184 * auVar216._12_4_ |
                       (uint)!bVar184 * (int)(auVar215._12_4_ + auVar215._12_4_);
                  auVar215 = vminps_avx(auVar223,auVar349);
                  auVar215 = vmaxps_avx(auVar215,auVar356);
                  auVar216 = vfmadd213ps_fma(auVar368,auVar215,auVar362);
                  auVar217 = vcvttps2dq_avx512vl(auVar216);
                  auVar217 = vcvtdq2ps_avx512vl(auVar217);
                  uVar146 = vcmpps_avx512vl(auVar216,auVar217,1);
                  auVar216 = vsubps_avx512vl(auVar217,auVar374);
                  bVar184 = (bool)((byte)uVar146 & 1);
                  auVar224._0_4_ = (uint)bVar184 * auVar216._0_4_ | (uint)!bVar184 * auVar217._0_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                  auVar224._4_4_ = (uint)bVar184 * auVar216._4_4_ | (uint)!bVar184 * auVar217._4_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                  auVar224._8_4_ = (uint)bVar184 * auVar216._8_4_ | (uint)!bVar184 * auVar217._8_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                  auVar224._12_4_ =
                       (uint)bVar184 * auVar216._12_4_ | (uint)!bVar184 * auVar217._12_4_;
                  auVar215 = vfmsub231ps_avx512vl(auVar215,auVar224,auVar380);
                  auVar215 = vfnmsub231ps_avx512vl(auVar215,auVar224,auVar460);
                  auVar413._0_4_ = auVar215._0_4_ * auVar215._0_4_;
                  auVar413._4_4_ = auVar215._4_4_ * auVar215._4_4_;
                  auVar413._8_4_ = auVar215._8_4_ * auVar215._8_4_;
                  auVar413._12_4_ = auVar215._12_4_ * auVar215._12_4_;
                  auVar216 = vfmadd213ps_avx512vl(auVar185,auVar215,auVar430);
                  auVar216 = vfmadd213ps_avx512vl(auVar216,auVar215,auVar436);
                  auVar216 = vfmadd213ps_avx512vl(auVar216,auVar215,auVar442);
                  auVar216 = vfmadd213ps_avx512vl(auVar216,auVar215,auVar448);
                  auVar216 = vfmadd213ps_avx512vl(auVar216,auVar215,auVar362);
                  auVar215 = vfmadd213ps_avx512vl(auVar216,auVar413,auVar215);
                  auVar216 = vaddps_avx512vl(auVar215,auVar374);
                  auVar215 = vcvttps2dq_avx512vl(auVar224);
                  auVar215 = vpslld_avx(auVar215,0x17);
                  auVar215 = vpaddd_avx(auVar215,auVar454);
                  auVar215 = vfmadd213ps_fma(auVar215,auVar216,auVar374);
                  auVar215 = vdivps_avx512vl(auVar214,auVar215);
                  auVar225 = vfmsub213ps_fma(auVar215,auVar219,auVar219);
                  break;
                case 6:
                  puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar335 = *puVar10;
                  auVar390._4_4_ = uVar335;
                  auVar390._0_4_ = uVar335;
                  auVar390._8_4_ = uVar335;
                  auVar390._12_4_ = uVar335;
                  uVar335 = puVar10[1];
                  auVar27._4_4_ = uVar335;
                  auVar27._0_4_ = uVar335;
                  auVar27._8_4_ = uVar335;
                  auVar27._12_4_ = uVar335;
                  auVar219 = vfmadd213ps_avx512vl(auVar390,auVar219,auVar27);
                  auVar219 = vmaxps_avx(auVar219,(undefined1  [16])0x0);
                  auVar219 = vminps_avx(auVar219,auVar374);
                  auVar225._0_4_ = auVar219._0_4_ * auVar333._0_4_;
                  auVar225._4_4_ = auVar219._4_4_ * auVar333._4_4_;
                  auVar225._8_4_ = auVar219._8_4_ * auVar333._8_4_;
                  auVar225._12_4_ = auVar219._12_4_ * auVar333._12_4_;
                }
              }
              *(undefined1 (*) [16])local_288 = auVar225;
              local_288 = (undefined1 (*) [32])((long)local_288 + 0x10);
              iVar144 = iVar144 + 1;
            }
          }
        }
      }
      if ((iVar174 == 1) && (uVar151 == 8)) {
        uVar157 = (this->super_Deconvolution).kernel_w;
        uVar160 = (this->super_Deconvolution).kernel_h;
        iVar139 = (this->super_Deconvolution).dilation_w;
        iVar138 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar152 = (this->super_Deconvolution).stride_h;
        iVar153 = (this->super_Deconvolution).activation_type;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        uVar166 = 0;
        uVar165 = 0;
        if (0 < (int)uVar157) {
          uVar165 = (ulong)uVar157;
        }
        uVar154 = 0;
        if (0 < (int)uVar160) {
          uVar154 = (ulong)uVar160;
        }
        uVar178 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar178 = uVar166;
        }
        auVar354._8_4_ = 0x42b0c0a5;
        auVar354._0_8_ = 0x42b0c0a542b0c0a5;
        auVar354._12_4_ = 0x42b0c0a5;
        auVar354._16_4_ = 0x42b0c0a5;
        auVar354._20_4_ = 0x42b0c0a5;
        auVar354._24_4_ = 0x42b0c0a5;
        auVar354._28_4_ = 0x42b0c0a5;
        auVar361._8_4_ = 0xc2b0c0a5;
        auVar361._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar361._12_4_ = 0xc2b0c0a5;
        auVar361._16_4_ = 0xc2b0c0a5;
        auVar361._20_4_ = 0xc2b0c0a5;
        auVar361._24_4_ = 0xc2b0c0a5;
        auVar361._28_4_ = 0xc2b0c0a5;
        auVar367._8_4_ = 0x3f000000;
        auVar367._0_8_ = 0x3f0000003f000000;
        auVar367._12_4_ = 0x3f000000;
        auVar367._16_4_ = 0x3f000000;
        auVar367._20_4_ = 0x3f000000;
        auVar367._24_4_ = 0x3f000000;
        auVar367._28_4_ = 0x3f000000;
        auVar373._8_4_ = 0x3fb8aa3b;
        auVar373._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar373._12_4_ = 0x3fb8aa3b;
        auVar373._16_4_ = 0x3fb8aa3b;
        auVar373._20_4_ = 0x3fb8aa3b;
        auVar373._24_4_ = 0x3fb8aa3b;
        auVar373._28_4_ = 0x3fb8aa3b;
        auVar379._8_4_ = 0x3f800000;
        auVar379._0_8_ = 0x3f8000003f800000;
        auVar379._12_4_ = 0x3f800000;
        auVar379._16_4_ = 0x3f800000;
        auVar379._20_4_ = 0x3f800000;
        auVar379._24_4_ = 0x3f800000;
        auVar379._28_4_ = 0x3f800000;
        auVar385._8_4_ = 0x3f318000;
        auVar385._0_8_ = 0x3f3180003f318000;
        auVar385._12_4_ = 0x3f318000;
        auVar385._16_4_ = 0x3f318000;
        auVar385._20_4_ = 0x3f318000;
        auVar385._24_4_ = 0x3f318000;
        auVar385._28_4_ = 0x3f318000;
        auVar241 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar435._8_4_ = 0x3ab743ce;
        auVar435._0_8_ = 0x3ab743ce3ab743ce;
        auVar435._12_4_ = 0x3ab743ce;
        auVar435._16_4_ = 0x3ab743ce;
        auVar435._20_4_ = 0x3ab743ce;
        auVar435._24_4_ = 0x3ab743ce;
        auVar435._28_4_ = 0x3ab743ce;
        auVar441._8_4_ = 0x3c088908;
        auVar441._0_8_ = 0x3c0889083c088908;
        auVar441._12_4_ = 0x3c088908;
        auVar441._16_4_ = 0x3c088908;
        auVar441._20_4_ = 0x3c088908;
        auVar441._24_4_ = 0x3c088908;
        auVar441._28_4_ = 0x3c088908;
        auVar447._8_4_ = 0x3d2aa9c1;
        auVar447._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar447._12_4_ = 0x3d2aa9c1;
        auVar447._16_4_ = 0x3d2aa9c1;
        auVar447._20_4_ = 0x3d2aa9c1;
        auVar447._24_4_ = 0x3d2aa9c1;
        auVar447._28_4_ = 0x3d2aa9c1;
        auVar453._8_4_ = 0x3e2aaaaa;
        auVar453._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar453._12_4_ = 0x3e2aaaaa;
        auVar453._16_4_ = 0x3e2aaaaa;
        auVar453._20_4_ = 0x3e2aaaaa;
        auVar453._24_4_ = 0x3e2aaaaa;
        auVar453._28_4_ = 0x3e2aaaaa;
        auVar459._8_4_ = 0x3f800000;
        auVar459._0_8_ = 0x3f8000003f800000;
        auVar459._12_4_ = 0x3f800000;
        auVar459._16_4_ = 0x3f800000;
        auVar459._20_4_ = 0x3f800000;
        auVar459._24_4_ = 0x3f800000;
        auVar459._28_4_ = 0x3f800000;
        auVar465._8_4_ = 0xb95e8083;
        auVar465._0_8_ = 0xb95e8083b95e8083;
        auVar465._12_4_ = 0xb95e8083;
        auVar465._16_4_ = 0xb95e8083;
        auVar465._20_4_ = 0xb95e8083;
        auVar465._24_4_ = 0xb95e8083;
        auVar465._28_4_ = 0xb95e8083;
        auVar242 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar263 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar264 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar265 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar266 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar267 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar268 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar269 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar270 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar271 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar272 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar273 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        for (; uVar166 != uVar178; uVar166 = uVar166 + 1) {
          local_288 = (undefined1 (*) [32])
                      (local_1e8.cstep * uVar166 * local_1e8.elemsize + (long)local_1e8.data);
          iVar8 = bottom_blob->w;
          iVar7 = bottom_blob->h;
          uVar177 = 0;
          uVar146 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar146 = uVar177;
          }
          uVar158 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar158 = 0;
          }
          uVar159 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar159 = 0;
          }
          local_168._0_4_ = uVar159;
          while (uVar180 = (uint)uVar177, uVar180 != uVar159) {
            iVar144 = (1 - uVar157) * iVar139;
            for (uVar142 = 0; uVar142 != uVar158; uVar142 = uVar142 + 1) {
              if (pvVar14 == (void *)0x0) {
                auVar333 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar333 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar14 + uVar166 * 0x20));
              }
              pvVar179 = (void *)((this->weight_data_tm).cstep * uVar166 *
                                  (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              for (uVar177 = 0; uVar177 != uVar146; uVar177 = uVar177 + 1) {
                pvVar171 = pvVar179;
                for (uVar181 = 0; uVar181 != uVar154; uVar181 = uVar181 + 1) {
                  iVar140 = (((int)uVar181 - uVar160) + 1) * iVar138 + uVar180;
                  if (((-1 < iVar140) && (iVar141 = iVar140 / iVar152, iVar140 % iVar152 == 0)) &&
                     (iVar141 < iVar7)) {
                    iVar140 = iVar144;
                    for (lVar150 = 0; uVar165 * 0x20 != lVar150; lVar150 = lVar150 + 0x20) {
                      if (((-1 < iVar140) && (iVar143 = iVar140 / iVar156, iVar140 % iVar156 == 0))
                         && (iVar143 < iVar8)) {
                        uVar335 = *(undefined4 *)
                                   ((long)bottom_blob->data +
                                   (long)iVar143 * 4 +
                                   (long)iVar141 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar177);
                        auVar405._4_4_ = uVar335;
                        auVar405._0_4_ = uVar335;
                        auVar405._8_4_ = uVar335;
                        auVar405._12_4_ = uVar335;
                        auVar405._16_4_ = uVar335;
                        auVar405._20_4_ = uVar335;
                        auVar405._24_4_ = uVar335;
                        auVar405._28_4_ = uVar335;
                        auVar185 = vfmadd231ps_fma(auVar333._0_32_,auVar405,
                                                   *(undefined1 (*) [32])((long)pvVar171 + lVar150))
                        ;
                        auVar333 = ZEXT1664(auVar185);
                      }
                      iVar140 = iVar140 + iVar139;
                    }
                  }
                  pvVar171 = (void *)((long)pvVar171 + (long)(int)uVar157 * 0x20);
                }
                pvVar179 = (void *)((long)pvVar179 + (long)(int)(uVar157 * uVar160 * 8) * 4);
              }
              auVar274 = auVar333._0_32_;
              auVar294 = auVar274;
              if (5 < iVar153 - 1U) goto switchD_0026d076_caseD_1;
              auVar243 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              auVar294 = vmaxps_avx(auVar274,auVar243);
              switch(iVar153) {
              case 2:
                auVar274 = vminps_avx(auVar274,auVar243);
                uVar335 = *(this->super_Deconvolution).activation_params.data;
                auVar98._4_4_ = uVar335;
                auVar98._0_4_ = uVar335;
                auVar98._8_4_ = uVar335;
                auVar98._12_4_ = uVar335;
                auVar98._16_4_ = uVar335;
                auVar98._20_4_ = uVar335;
                auVar98._24_4_ = uVar335;
                auVar98._28_4_ = uVar335;
                auVar294 = vfmadd231ps_avx512vl(auVar294,auVar274,auVar98);
                break;
              case 3:
                puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar335 = *puVar10;
                auVar96._4_4_ = uVar335;
                auVar96._0_4_ = uVar335;
                auVar96._8_4_ = uVar335;
                auVar96._12_4_ = uVar335;
                auVar96._16_4_ = uVar335;
                auVar96._20_4_ = uVar335;
                auVar96._24_4_ = uVar335;
                auVar96._28_4_ = uVar335;
                auVar274 = vmaxps_avx512vl(auVar274,auVar96);
                uVar335 = puVar10[1];
                auVar97._4_4_ = uVar335;
                auVar97._0_4_ = uVar335;
                auVar97._8_4_ = uVar335;
                auVar97._12_4_ = uVar335;
                auVar97._16_4_ = uVar335;
                auVar97._20_4_ = uVar335;
                auVar97._24_4_ = uVar335;
                auVar97._28_4_ = uVar335;
                auVar294 = vminps_avx512vl(auVar274,auVar97);
                break;
              case 4:
                auVar94._8_4_ = 0x80000000;
                auVar94._0_8_ = 0x8000000080000000;
                auVar94._12_4_ = 0x80000000;
                auVar94._16_4_ = 0x80000000;
                auVar94._20_4_ = 0x80000000;
                auVar94._24_4_ = 0x80000000;
                auVar94._28_4_ = 0x80000000;
                auVar274 = vxorps_avx512vl(auVar274,auVar94);
                auVar274 = vminps_avx(auVar274,auVar354);
                auVar274 = vmaxps_avx(auVar274,auVar361);
                auVar185 = vfmadd231ps_fma(auVar367,auVar274,auVar373);
                auVar243 = vrndscaleps_avx512vl(ZEXT1632(auVar185),1);
                uVar177 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar243,1);
                auVar244 = vsubps_avx512vl(auVar243,auVar379);
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar295._0_4_ = (uint)bVar184 * auVar244._0_4_ | (uint)!bVar184 * auVar243._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar295._4_4_ = (uint)bVar184 * auVar244._4_4_ | (uint)!bVar184 * auVar243._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar295._8_4_ = (uint)bVar184 * auVar244._8_4_ | (uint)!bVar184 * auVar243._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar295._12_4_ = (uint)bVar184 * auVar244._12_4_ | (uint)!bVar184 * auVar243._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar295._16_4_ = (uint)bVar184 * auVar244._16_4_ | (uint)!bVar184 * auVar243._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar295._20_4_ = (uint)bVar184 * auVar244._20_4_ | (uint)!bVar184 * auVar243._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar295._24_4_ = (uint)bVar184 * auVar244._24_4_ | (uint)!bVar184 * auVar243._24_4_
                ;
                bVar184 = SUB81(uVar177 >> 7,0);
                auVar295._28_4_ = (uint)bVar184 * auVar244._28_4_ | (uint)!bVar184 * auVar243._28_4_
                ;
                auVar274 = vfmsub231ps_avx512vl(auVar274,auVar295,auVar385);
                auVar95._8_4_ = 0x395e8083;
                auVar95._0_8_ = 0x395e8083395e8083;
                auVar95._12_4_ = 0x395e8083;
                auVar95._16_4_ = 0x395e8083;
                auVar95._20_4_ = 0x395e8083;
                auVar95._24_4_ = 0x395e8083;
                auVar95._28_4_ = 0x395e8083;
                auVar274 = vfmsub231ps_avx512vl(auVar274,auVar295,auVar95);
                auVar406._0_4_ = auVar274._0_4_ * auVar274._0_4_;
                auVar406._4_4_ = auVar274._4_4_ * auVar274._4_4_;
                auVar406._8_4_ = auVar274._8_4_ * auVar274._8_4_;
                auVar406._12_4_ = auVar274._12_4_ * auVar274._12_4_;
                auVar406._16_4_ = auVar274._16_4_ * auVar274._16_4_;
                auVar406._20_4_ = auVar274._20_4_ * auVar274._20_4_;
                auVar406._24_4_ = auVar274._24_4_ * auVar274._24_4_;
                auVar406._28_4_ = 0;
                auVar185 = vfmadd213ps_fma(auVar241,auVar274,auVar435);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar274,auVar441);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar274,auVar447);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar274,auVar453);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar274,auVar367);
                auVar185 = vfmadd213ps_fma(ZEXT1632(auVar185),auVar406,auVar274);
                auVar347._0_4_ = auVar185._0_4_ + 1.0;
                auVar347._4_4_ = auVar185._4_4_ + 1.0;
                auVar347._8_4_ = auVar185._8_4_ + 1.0;
                auVar347._12_4_ = auVar185._12_4_ + 1.0;
                auVar347._16_4_ = 0x3f800000;
                auVar347._20_4_ = 0x3f800000;
                auVar347._24_4_ = 0x3f800000;
                auVar347._28_4_ = 0x3f800000;
                auVar274 = vcvttps2dq_avx512vl(auVar295);
                auVar274 = vpslld_avx2(auVar274,0x17);
                auVar274 = vpaddd_avx2(auVar274,auVar459);
                auVar185 = vfmadd213ps_fma(auVar274,auVar347,auVar379);
                auVar294 = vdivps_avx(auVar379,ZEXT1632(auVar185));
                break;
              case 5:
                auVar274 = vminps_avx(auVar274,auVar354);
                auVar274 = vmaxps_avx(auVar274,auVar361);
                auVar185 = vfmadd213ps_fma(auVar373,auVar274,auVar367);
                auVar244 = vrndscaleps_avx512vl(ZEXT1632(auVar185),1);
                uVar177 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar244,1);
                auVar245 = vsubps_avx512vl(auVar244,auVar379);
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar289._0_4_ = (uint)bVar184 * auVar245._0_4_ | (uint)!bVar184 * auVar244._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar289._4_4_ = (uint)bVar184 * auVar245._4_4_ | (uint)!bVar184 * auVar244._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar289._8_4_ = (uint)bVar184 * auVar245._8_4_ | (uint)!bVar184 * auVar244._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar289._12_4_ = (uint)bVar184 * auVar245._12_4_ | (uint)!bVar184 * auVar244._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar289._16_4_ = (uint)bVar184 * auVar245._16_4_ | (uint)!bVar184 * auVar244._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar289._20_4_ = (uint)bVar184 * auVar245._20_4_ | (uint)!bVar184 * auVar244._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar289._24_4_ = (uint)bVar184 * auVar245._24_4_ | (uint)!bVar184 * auVar244._24_4_
                ;
                bVar184 = SUB81(uVar177 >> 7,0);
                auVar289._28_4_ = (uint)bVar184 * auVar245._28_4_ | (uint)!bVar184 * auVar244._28_4_
                ;
                auVar274 = vfmsub231ps_avx512vl(auVar274,auVar289,auVar385);
                auVar274 = vfnmsub231ps_avx512vl(auVar274,auVar289,auVar465);
                auVar428._0_4_ = auVar274._0_4_ * auVar274._0_4_;
                auVar428._4_4_ = auVar274._4_4_ * auVar274._4_4_;
                auVar428._8_4_ = auVar274._8_4_ * auVar274._8_4_;
                auVar428._12_4_ = auVar274._12_4_ * auVar274._12_4_;
                auVar428._16_4_ = auVar274._16_4_ * auVar274._16_4_;
                auVar428._20_4_ = auVar274._20_4_ * auVar274._20_4_;
                auVar428._24_4_ = auVar274._24_4_ * auVar274._24_4_;
                auVar428._28_4_ = 0;
                auVar244 = vfmadd213ps_avx512vl(auVar241,auVar274,auVar435);
                auVar244 = vfmadd213ps_avx512vl(auVar244,auVar274,auVar441);
                auVar244 = vfmadd213ps_avx512vl(auVar244,auVar274,auVar447);
                auVar244 = vfmadd213ps_avx512vl(auVar244,auVar274,auVar453);
                auVar244 = vfmadd213ps_avx512vl(auVar244,auVar274,auVar367);
                auVar274 = vfmadd213ps_avx512vl(auVar244,auVar428,auVar274);
                auVar244 = vaddps_avx512vl(auVar274,auVar379);
                auVar274 = vcvttps2dq_avx512vl(auVar289);
                auVar274 = vpslld_avx2(auVar274,0x17);
                auVar274 = vpaddd_avx2(auVar274,auVar459);
                auVar185 = vfmadd213ps_fma(auVar274,auVar244,auVar379);
                uVar177 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar243,2);
                auVar91._8_4_ = 0x800000;
                auVar91._0_8_ = 0x80000000800000;
                auVar91._12_4_ = 0x800000;
                auVar91._16_4_ = 0x800000;
                auVar91._20_4_ = 0x800000;
                auVar91._24_4_ = 0x800000;
                auVar91._28_4_ = 0x800000;
                auVar274 = vmaxps_avx512vl(ZEXT1632(auVar185),auVar91);
                auVar245 = vpsrld_avx2(auVar274,0x17);
                auVar243 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                auVar92._8_4_ = 0x3f000000;
                auVar92._0_8_ = 0x3f0000003f000000;
                auVar92._12_4_ = 0x3f000000;
                auVar92._16_4_ = 0x3f000000;
                auVar92._20_4_ = 0x3f000000;
                auVar92._24_4_ = 0x3f000000;
                auVar92._28_4_ = 0x3f000000;
                auVar274 = vpternlogd_avx512vl(auVar274,auVar243,auVar92,0xea);
                uVar181 = vcmpps_avx512vl(auVar274,auVar242,1);
                auVar243 = vaddps_avx512vl(auVar274,auVar263);
                auVar274 = vaddps_avx512vl(auVar243,auVar274);
                bVar184 = (bool)((byte)uVar181 & 1);
                auVar290._0_4_ = (uint)bVar184 * auVar274._0_4_ | (uint)!bVar184 * auVar243._0_4_;
                bVar184 = (bool)((byte)(uVar181 >> 1) & 1);
                auVar290._4_4_ = (uint)bVar184 * auVar274._4_4_ | (uint)!bVar184 * auVar243._4_4_;
                bVar184 = (bool)((byte)(uVar181 >> 2) & 1);
                auVar290._8_4_ = (uint)bVar184 * auVar274._8_4_ | (uint)!bVar184 * auVar243._8_4_;
                bVar184 = (bool)((byte)(uVar181 >> 3) & 1);
                auVar290._12_4_ = (uint)bVar184 * auVar274._12_4_ | (uint)!bVar184 * auVar243._12_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 4) & 1);
                auVar290._16_4_ = (uint)bVar184 * auVar274._16_4_ | (uint)!bVar184 * auVar243._16_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 5) & 1);
                auVar290._20_4_ = (uint)bVar184 * auVar274._20_4_ | (uint)!bVar184 * auVar243._20_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 6) & 1);
                auVar290._24_4_ = (uint)bVar184 * auVar274._24_4_ | (uint)!bVar184 * auVar243._24_4_
                ;
                bVar184 = SUB81(uVar181 >> 7,0);
                auVar290._28_4_ = (uint)bVar184 * auVar274._28_4_ | (uint)!bVar184 * auVar243._28_4_
                ;
                auVar243 = vmulps_avx512vl(auVar290,auVar290);
                auVar274 = vfmadd213ps_avx512vl(auVar264,auVar290,auVar265);
                auVar274 = vfmadd213ps_avx512vl(auVar274,auVar290,auVar266);
                auVar274 = vfmadd213ps_avx512vl(auVar274,auVar290,auVar267);
                auVar274 = vfmadd213ps_avx512vl(auVar274,auVar290,auVar268);
                auVar274 = vfmadd213ps_avx512vl(auVar274,auVar290,auVar269);
                auVar274 = vfmadd213ps_avx512vl(auVar274,auVar290,auVar270);
                auVar274 = vfmadd213ps_avx512vl(auVar274,auVar290,auVar271);
                auVar274 = vfmadd213ps_avx512vl(auVar274,auVar290,auVar272);
                auVar244 = vmulps_avx512vl(auVar243,auVar290);
                auVar244 = vmulps_avx512vl(auVar244,auVar274);
                auVar93._8_4_ = 0xffffff82;
                auVar93._0_8_ = 0xffffff82ffffff82;
                auVar93._12_4_ = 0xffffff82;
                auVar93._16_4_ = 0xffffff82;
                auVar93._20_4_ = 0xffffff82;
                auVar93._24_4_ = 0xffffff82;
                auVar93._28_4_ = 0xffffff82;
                auVar274 = vpaddd_avx512vl(auVar245,auVar93);
                auVar274 = vcvtdq2ps_avx(auVar274);
                auVar245 = vsubps_avx512vl(auVar274,auVar379);
                bVar184 = (bool)((byte)uVar181 & 1);
                auVar291._0_4_ = (uint)bVar184 * auVar245._0_4_ | (uint)!bVar184 * auVar274._0_4_;
                bVar184 = (bool)((byte)(uVar181 >> 1) & 1);
                auVar291._4_4_ = (uint)bVar184 * auVar245._4_4_ | (uint)!bVar184 * auVar274._4_4_;
                bVar184 = (bool)((byte)(uVar181 >> 2) & 1);
                auVar291._8_4_ = (uint)bVar184 * auVar245._8_4_ | (uint)!bVar184 * auVar274._8_4_;
                bVar184 = (bool)((byte)(uVar181 >> 3) & 1);
                auVar291._12_4_ = (uint)bVar184 * auVar245._12_4_ | (uint)!bVar184 * auVar274._12_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 4) & 1);
                auVar291._16_4_ = (uint)bVar184 * auVar245._16_4_ | (uint)!bVar184 * auVar274._16_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 5) & 1);
                auVar291._20_4_ = (uint)bVar184 * auVar245._20_4_ | (uint)!bVar184 * auVar274._20_4_
                ;
                bVar184 = (bool)((byte)(uVar181 >> 6) & 1);
                auVar291._24_4_ = (uint)bVar184 * auVar245._24_4_ | (uint)!bVar184 * auVar274._24_4_
                ;
                bVar184 = SUB81(uVar181 >> 7,0);
                auVar291._28_4_ = (uint)bVar184 * auVar245._28_4_ | (uint)!bVar184 * auVar274._28_4_
                ;
                auVar274 = vfmadd231ps_avx512vl(auVar244,auVar291,auVar465);
                auVar274 = vfmsub231ps_avx512vl(auVar274,auVar367,auVar243);
                auVar274 = vsubps_avx512vl(auVar274,auVar290);
                auVar185 = vfmsub231ps_fma(auVar274,auVar385,auVar291);
                auVar274 = vmulps_avx512vl(ZEXT1632(auVar185),auVar273);
                auVar243 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar292._0_4_ = (uint)bVar184 * auVar243._0_4_ | (uint)!bVar184 * auVar274._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar292._4_4_ = (uint)bVar184 * auVar243._4_4_ | (uint)!bVar184 * auVar274._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar292._8_4_ = (uint)bVar184 * auVar243._8_4_ | (uint)!bVar184 * auVar274._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar292._12_4_ = (uint)bVar184 * auVar243._12_4_ | (uint)!bVar184 * auVar274._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar292._16_4_ = (uint)bVar184 * auVar243._16_4_ | (uint)!bVar184 * auVar274._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar292._20_4_ = (uint)bVar184 * auVar243._20_4_ | (uint)!bVar184 * auVar274._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar292._24_4_ = (uint)bVar184 * auVar243._24_4_ | (uint)!bVar184 * auVar274._24_4_
                ;
                bVar184 = SUB81(uVar177 >> 7,0);
                auVar292._28_4_ = (uint)bVar184 * auVar243._28_4_ | (uint)!bVar184 * auVar274._28_4_
                ;
                auVar274 = vminps_avx(auVar292,auVar354);
                auVar274 = vmaxps_avx(auVar274,auVar361);
                auVar185 = vfmadd213ps_fma(auVar373,auVar274,auVar367);
                auVar243 = vrndscaleps_avx512vl(ZEXT1632(auVar185),1);
                uVar177 = vcmpps_avx512vl(ZEXT1632(auVar185),auVar243,1);
                auVar244 = vsubps_avx512vl(auVar243,auVar379);
                bVar184 = (bool)((byte)uVar177 & 1);
                auVar293._0_4_ = (uint)bVar184 * auVar244._0_4_ | (uint)!bVar184 * auVar243._0_4_;
                bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                auVar293._4_4_ = (uint)bVar184 * auVar244._4_4_ | (uint)!bVar184 * auVar243._4_4_;
                bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                auVar293._8_4_ = (uint)bVar184 * auVar244._8_4_ | (uint)!bVar184 * auVar243._8_4_;
                bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                auVar293._12_4_ = (uint)bVar184 * auVar244._12_4_ | (uint)!bVar184 * auVar243._12_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 4) & 1);
                auVar293._16_4_ = (uint)bVar184 * auVar244._16_4_ | (uint)!bVar184 * auVar243._16_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 5) & 1);
                auVar293._20_4_ = (uint)bVar184 * auVar244._20_4_ | (uint)!bVar184 * auVar243._20_4_
                ;
                bVar184 = (bool)((byte)(uVar177 >> 6) & 1);
                auVar293._24_4_ = (uint)bVar184 * auVar244._24_4_ | (uint)!bVar184 * auVar243._24_4_
                ;
                bVar184 = SUB81(uVar177 >> 7,0);
                auVar293._28_4_ = (uint)bVar184 * auVar244._28_4_ | (uint)!bVar184 * auVar243._28_4_
                ;
                auVar274 = vfmsub231ps_avx512vl(auVar274,auVar293,auVar385);
                auVar274 = vfnmsub231ps_avx512vl(auVar274,auVar293,auVar465);
                auVar429._0_4_ = auVar274._0_4_ * auVar274._0_4_;
                auVar429._4_4_ = auVar274._4_4_ * auVar274._4_4_;
                auVar429._8_4_ = auVar274._8_4_ * auVar274._8_4_;
                auVar429._12_4_ = auVar274._12_4_ * auVar274._12_4_;
                auVar429._16_4_ = auVar274._16_4_ * auVar274._16_4_;
                auVar429._20_4_ = auVar274._20_4_ * auVar274._20_4_;
                auVar429._24_4_ = auVar274._24_4_ * auVar274._24_4_;
                auVar429._28_4_ = 0;
                auVar243 = vfmadd213ps_avx512vl(auVar241,auVar274,auVar435);
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar274,auVar441);
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar274,auVar447);
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar274,auVar453);
                auVar243 = vfmadd213ps_avx512vl(auVar243,auVar274,auVar367);
                auVar274 = vfmadd213ps_avx512vl(auVar243,auVar429,auVar274);
                auVar243 = vaddps_avx512vl(auVar274,auVar379);
                auVar274 = vcvttps2dq_avx512vl(auVar293);
                auVar274 = vpslld_avx2(auVar274,0x17);
                auVar274 = vpaddd_avx2(auVar274,auVar459);
                auVar185 = vfmadd213ps_fma(auVar274,auVar243,auVar379);
                auVar274 = vdivps_avx(auVar379,ZEXT1632(auVar185));
                auVar274 = vfnmadd213ps_avx512vl(auVar274,auVar273,auVar263);
                goto LAB_0026d324;
              case 6:
                puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                uVar335 = *puVar10;
                auVar407._4_4_ = uVar335;
                auVar407._0_4_ = uVar335;
                auVar407._8_4_ = uVar335;
                auVar407._12_4_ = uVar335;
                auVar407._16_4_ = uVar335;
                auVar407._20_4_ = uVar335;
                auVar407._24_4_ = uVar335;
                auVar407._28_4_ = uVar335;
                uVar335 = puVar10[1];
                auVar90._4_4_ = uVar335;
                auVar90._0_4_ = uVar335;
                auVar90._8_4_ = uVar335;
                auVar90._12_4_ = uVar335;
                auVar90._16_4_ = uVar335;
                auVar90._20_4_ = uVar335;
                auVar90._24_4_ = uVar335;
                auVar90._28_4_ = uVar335;
                auVar274 = vfmadd213ps_avx512vl(auVar407,auVar274,auVar90);
                auVar274 = vmaxps_avx(auVar274,auVar243);
                auVar274 = vminps_avx(auVar274,auVar379);
LAB_0026d324:
                auVar294._4_4_ = auVar274._4_4_ * auVar333._4_4_;
                auVar294._0_4_ = auVar274._0_4_ * auVar333._0_4_;
                auVar294._8_4_ = auVar274._8_4_ * auVar333._8_4_;
                auVar294._12_4_ = auVar274._12_4_ * auVar333._12_4_;
                auVar294._16_4_ = auVar274._16_4_ * auVar333._16_4_;
                auVar294._20_4_ = auVar274._20_4_ * auVar333._20_4_;
                auVar294._24_4_ = auVar274._24_4_ * auVar333._24_4_;
                auVar294._28_4_ = auVar274._28_4_;
              }
switchD_0026d076_caseD_1:
              *local_288 = auVar294;
              local_288 = local_288 + 1;
              iVar144 = iVar144 + 1;
            }
            uVar177 = (ulong)(uVar180 + 1);
          }
        }
      }
      if ((iVar174 == 8) && (uVar151 == 1)) {
        uVar157 = (this->super_Deconvolution).kernel_w;
        uVar160 = (this->super_Deconvolution).kernel_h;
        iVar139 = (this->super_Deconvolution).dilation_w;
        iVar138 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        local_178 = local_1e8.elemsize * local_1e8.cstep;
        uVar165 = 0;
        uVar166 = 0;
        if (0 < (int)uVar157) {
          uVar166 = (ulong)uVar157;
        }
        uVar154 = 0;
        if (0 < (int)uVar160) {
          uVar154 = (ulong)uVar160;
        }
        uVar178 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar178 = uVar165;
        }
        uVar158 = local_1e8.w;
        if (local_1e8.w < 1) {
          uVar158 = 0;
        }
        uVar159 = local_1e8.h;
        if (local_1e8.h < 1) {
          uVar159 = 0;
        }
        local_1a0 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          local_1a0 = uVar165;
        }
        iVar152 = (this->super_Deconvolution).stride_w;
        iVar153 = (this->super_Deconvolution).stride_h;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        local_180 = local_1e8.data;
        iVar8 = bottom_blob->w;
        iVar7 = bottom_blob->h;
        for (; uVar165 != local_1a0; uVar165 = uVar165 + 1) {
          local_288 = (undefined1 (*) [32])(local_178 * uVar165 + (long)local_180);
          for (uVar180 = 0; uVar180 != uVar159; uVar180 = uVar180 + 1) {
            local_168._0_8_ = (this->super_Deconvolution).activation_params.data;
            sVar12 = (this->weight_data_tm).cstep;
            sVar13 = (this->weight_data_tm).elemsize;
            pvVar179 = (this->weight_data_tm).data;
            iVar144 = (1 - uVar157) * iVar139;
            for (uVar142 = 0; uVar142 != uVar158; uVar142 = uVar142 + 1) {
              if (pvVar14 == (void *)0x0) {
                fVar334 = 0.0;
              }
              else {
                fVar334 = *(float *)((long)pvVar14 + uVar165 * 4);
              }
              auVar333 = ZEXT1664(ZEXT816(0) << 0x40);
              pvVar171 = (void *)(sVar12 * uVar165 * sVar13 + (long)pvVar179);
              for (uVar146 = 0; uVar146 != uVar178; uVar146 = uVar146 + 1) {
                pvVar167 = pvVar171;
                for (uVar177 = 0; uVar177 != uVar154; uVar177 = uVar177 + 1) {
                  iVar140 = (((int)uVar177 - uVar160) + 1) * iVar138 + uVar180;
                  if (((-1 < iVar140) && (iVar141 = iVar140 / iVar153, iVar140 % iVar153 == 0)) &&
                     (iVar141 < iVar7)) {
                    iVar140 = iVar144;
                    for (lVar150 = 0; uVar166 * 0x20 != lVar150; lVar150 = lVar150 + 0x20) {
                      if (((-1 < iVar140) && (iVar143 = iVar140 / iVar152, iVar140 % iVar152 == 0))
                         && (iVar143 < iVar8)) {
                        auVar185 = vfmadd231ps_fma(auVar333._0_32_,
                                                   *(undefined1 (*) [32])
                                                    ((long)bottom_blob->data +
                                                    (long)(iVar143 << 3) * 4 +
                                                    (long)iVar141 *
                                                    (long)bottom_blob->w * bottom_blob->elemsize +
                                                    bottom_blob->cstep * bottom_blob->elemsize *
                                                    uVar146),
                                                   *(undefined1 (*) [32])((long)pvVar167 + lVar150))
                        ;
                        auVar333 = ZEXT1664(auVar185);
                      }
                      iVar140 = iVar140 + iVar139;
                    }
                  }
                  pvVar167 = (void *)((long)pvVar167 + (long)(int)uVar157 * 0x20);
                }
                pvVar171 = (void *)((long)pvVar171 + (long)(int)(uVar157 * uVar160 * 8) * 4);
              }
              auVar338._0_4_ = auVar333._16_4_ + auVar333._0_4_;
              auVar338._4_4_ = auVar333._20_4_ + auVar333._4_4_;
              auVar338._8_4_ = auVar333._24_4_ + auVar333._8_4_;
              auVar338._12_4_ = auVar333._28_4_ + auVar333._12_4_;
              auVar185 = vshufpd_avx(auVar338,auVar338,1);
              auVar339._0_4_ = auVar185._0_4_ + auVar338._0_4_;
              auVar339._4_4_ = auVar185._4_4_ + auVar338._4_4_;
              auVar339._8_4_ = auVar185._8_4_ + auVar338._8_4_;
              auVar339._12_4_ = auVar185._12_4_ + auVar338._12_4_;
              auVar185 = vmovshdup_avx(auVar339);
              fVar334 = auVar185._0_4_ + fVar334 + auVar339._0_4_;
              auVar185 = ZEXT416((uint)fVar334);
              fVar348 = fVar334;
              if (iVar156 - 1U < 6) {
                switch(iVar156) {
                case 1:
                  auVar185 = vmaxss_avx(ZEXT416((uint)fVar334),ZEXT416(0));
                  fVar348 = auVar185._0_4_;
                  break;
                case 2:
                  uVar17 = vcmpss_avx512f(ZEXT416((uint)fVar334),ZEXT416(0),0xe);
                  bVar184 = (bool)((byte)uVar17 & 1);
                  fVar348 = (float)((uint)bVar184 * 0x3f800000 +
                                   (uint)!bVar184 * (int)*(float *)local_168._0_8_) * fVar334;
                  break;
                case 3:
                  auVar185 = vmaxss_avx(auVar185,ZEXT416((uint)*(float *)local_168._0_8_));
                  fVar348 = auVar185._0_4_;
                  if (*(float *)(local_168._0_8_ + 4) < auVar185._0_4_) {
                    fVar348 = *(float *)(local_168._0_8_ + 4);
                  }
                  break;
                case 4:
                  auVar185 = vminss_avx(auVar185,SUB6416(ZEXT464(0x42b0c0a5),0));
                  auVar40._8_4_ = 0x80000000;
                  auVar40._0_8_ = 0x8000000080000000;
                  auVar40._12_4_ = 0x80000000;
                  auVar186 = vxorps_avx512vl(auVar185,auVar40);
                  uVar17 = vcmpss_avx512f(auVar185,ZEXT416(0xc2b0c0a5),1);
                  bVar184 = (bool)((byte)uVar17 & 1);
                  fVar334 = expf((float)((uint)bVar184 * 0x42b0c0a5 +
                                        (uint)!bVar184 * auVar186._0_4_));
                  fVar348 = 1.0 / (fVar334 + 1.0);
                  break;
                case 5:
                  fVar348 = expf(fVar334);
                  fVar348 = logf(fVar348 + 1.0);
                  fVar348 = tanhf(fVar348);
                  fVar348 = fVar348 * fVar334;
                  break;
                case 6:
                  fVar2 = *(float *)local_168._0_8_;
                  auVar39._8_4_ = 0x80000000;
                  auVar39._0_8_ = 0x8000000080000000;
                  auVar39._12_4_ = 0x80000000;
                  auVar186 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_168._0_8_ + 4)),auVar39)
                  ;
                  fVar355 = auVar186._0_4_ / fVar2;
                  fVar348 = 0.0;
                  if ((fVar355 <= fVar334) && (fVar348 = fVar334, fVar334 <= fVar355 + 1.0 / fVar2))
                  {
                    auVar185 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar185,
                                               ZEXT416((uint)*(float *)(local_168._0_8_ + 4)));
                    fVar348 = auVar185._0_4_ * fVar334;
                  }
                }
              }
              *(float *)local_288 = fVar348;
              local_288 = (undefined1 (*) [32])((long)local_288 + 4);
              iVar144 = iVar144 + 1;
            }
          }
        }
      }
      if ((iVar174 == 4) && (uVar151 == 4)) {
        uVar157 = (this->super_Deconvolution).kernel_w;
        uVar160 = (this->super_Deconvolution).kernel_h;
        iVar139 = (this->super_Deconvolution).dilation_w;
        iVar138 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar152 = (this->super_Deconvolution).stride_h;
        iVar153 = (this->super_Deconvolution).activation_type;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        uVar166 = 0;
        uVar165 = 0;
        if (0 < (int)uVar157) {
          uVar165 = (ulong)uVar157;
        }
        uVar154 = 0;
        if (0 < (int)uVar160) {
          uVar154 = (ulong)uVar160;
        }
        uVar178 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar178 = uVar166;
        }
        auVar350._8_4_ = 0x42b0c0a5;
        auVar350._0_8_ = 0x42b0c0a542b0c0a5;
        auVar350._12_4_ = 0x42b0c0a5;
        auVar357._8_4_ = 0xc2b0c0a5;
        auVar357._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar357._12_4_ = 0xc2b0c0a5;
        auVar363._8_4_ = 0x3f000000;
        auVar363._0_8_ = 0x3f0000003f000000;
        auVar363._12_4_ = 0x3f000000;
        auVar369._8_4_ = 0x3fb8aa3b;
        auVar369._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar369._12_4_ = 0x3fb8aa3b;
        auVar375._8_4_ = 0x3f800000;
        auVar375._0_8_ = 0x3f8000003f800000;
        auVar375._12_4_ = 0x3f800000;
        auVar381._8_4_ = 0x3f318000;
        auVar381._0_8_ = 0x3f3180003f318000;
        auVar381._12_4_ = 0x3f318000;
        auVar185 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar431._8_4_ = 0x3ab743ce;
        auVar431._0_8_ = 0x3ab743ce3ab743ce;
        auVar431._12_4_ = 0x3ab743ce;
        auVar437._8_4_ = 0x3c088908;
        auVar437._0_8_ = 0x3c0889083c088908;
        auVar437._12_4_ = 0x3c088908;
        auVar443._8_4_ = 0x3d2aa9c1;
        auVar443._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar443._12_4_ = 0x3d2aa9c1;
        auVar449._8_4_ = 0x3e2aaaaa;
        auVar449._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar449._12_4_ = 0x3e2aaaaa;
        auVar455._8_4_ = 0x3f800000;
        auVar455._0_8_ = 0x3f8000003f800000;
        auVar455._12_4_ = 0x3f800000;
        auVar461._8_4_ = 0xb95e8083;
        auVar461._0_8_ = 0xb95e8083b95e8083;
        auVar461._12_4_ = 0xb95e8083;
        auVar186 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar187 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar208 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar209 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar210 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar211 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar212 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar213 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar214 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar219 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar215 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar216 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        for (; uVar166 != uVar178; uVar166 = uVar166 + 1) {
          local_288 = (undefined1 (*) [32])
                      (local_1e8.cstep * uVar166 * local_1e8.elemsize + (long)local_1e8.data);
          iVar8 = bottom_blob->w;
          iVar7 = bottom_blob->h;
          uVar159 = 0;
          uVar158 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar158 = uVar159;
          }
          uVar180 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar180 = uVar159;
          }
          uVar142 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar142 = uVar159;
          }
          local_168._0_4_ = uVar142;
          for (; uVar159 != uVar142; uVar159 = uVar159 + 1) {
            iVar144 = (1 - uVar157) * iVar139;
            for (uVar170 = 0; uVar170 != uVar180; uVar170 = uVar170 + 1) {
              if (pvVar14 == (void *)0x0) {
                auVar217 = ZEXT816(0) << 0x40;
              }
              else {
                auVar217 = *(undefined1 (*) [16])((long)pvVar14 + uVar166 * 0x10);
              }
              auVar333 = ZEXT1664(auVar217);
              pvVar179 = bottom_blob->data;
              lVar150 = (long)(this->weight_data_tm).data +
                        (this->weight_data_tm).cstep * uVar166 * (this->weight_data_tm).elemsize +
                        0x30;
              for (uVar146 = 0; uVar146 != uVar158; uVar146 = uVar146 + 1) {
                lVar155 = lVar150;
                for (uVar177 = 0; uVar177 != uVar154; uVar177 = uVar177 + 1) {
                  iVar140 = (((int)uVar177 - uVar160) + 1) * iVar138 + uVar159;
                  if (((-1 < iVar140) && (iVar141 = iVar140 / iVar152, iVar140 % iVar152 == 0)) &&
                     (iVar141 < iVar7)) {
                    lVar119 = (long)iVar141 * (long)bottom_blob->w * bottom_blob->elemsize +
                              bottom_blob->cstep * bottom_blob->elemsize * uVar146;
                    iVar140 = iVar144;
                    for (lVar164 = 0; uVar165 * 0x40 != lVar164; lVar164 = lVar164 + 0x40) {
                      if (((-1 < iVar140) && (iVar141 = iVar140 / iVar156, iVar140 % iVar156 == 0))
                         && (iVar141 < iVar8)) {
                        lVar145 = (long)(iVar141 << 2);
                        uVar335 = *(undefined4 *)((long)pvVar179 + lVar145 * 4 + lVar119);
                        auVar391._4_4_ = uVar335;
                        auVar391._0_4_ = uVar335;
                        auVar391._8_4_ = uVar335;
                        auVar391._12_4_ = uVar335;
                        uVar335 = *(undefined4 *)((long)pvVar179 + lVar145 * 4 + lVar119 + 4);
                        auVar414._4_4_ = uVar335;
                        auVar414._0_4_ = uVar335;
                        auVar414._8_4_ = uVar335;
                        auVar414._12_4_ = uVar335;
                        auVar218 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 8)));
                        auVar188 = vbroadcastss_avx512vl
                                             (ZEXT416(*(uint *)((long)pvVar179 +
                                                               lVar145 * 4 + lVar119 + 0xc)));
                        auVar217 = vfmadd231ps_fma(auVar333._0_16_,auVar391,
                                                   *(undefined1 (*) [16])(lVar155 + -0x30 + lVar164)
                                                  );
                        auVar217 = vfmadd231ps_fma(auVar217,auVar414,
                                                   *(undefined1 (*) [16])(lVar155 + -0x20 + lVar164)
                                                  );
                        auVar217 = vfmadd231ps_avx512vl
                                             (auVar217,auVar218,
                                              *(undefined1 (*) [16])(lVar155 + -0x10 + lVar164));
                        auVar217 = vfmadd231ps_avx512vl
                                             (auVar217,auVar188,
                                              *(undefined1 (*) [16])(lVar155 + lVar164));
                        auVar333 = ZEXT1664(auVar217);
                      }
                      iVar140 = iVar140 + iVar139;
                    }
                  }
                  lVar155 = lVar155 + (long)(int)uVar157 * 0x40;
                }
                lVar150 = lVar150 + (long)(int)(uVar157 * uVar160 * 0x10) * 4;
              }
              auVar217 = auVar333._0_16_;
              auVar232 = auVar217;
              if (iVar153 - 1U < 6) {
                auVar232 = vmaxps_avx(auVar217,(undefined1  [16])0x0);
                switch(iVar153) {
                case 2:
                  auVar217 = vminps_avx(auVar217,(undefined1  [16])0x0);
                  uVar335 = *(this->super_Deconvolution).activation_params.data;
                  auVar49._4_4_ = uVar335;
                  auVar49._0_4_ = uVar335;
                  auVar49._8_4_ = uVar335;
                  auVar49._12_4_ = uVar335;
                  auVar232 = vfmadd231ps_avx512vl(auVar232,auVar217,auVar49);
                  break;
                case 3:
                  puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar335 = *puVar10;
                  auVar47._4_4_ = uVar335;
                  auVar47._0_4_ = uVar335;
                  auVar47._8_4_ = uVar335;
                  auVar47._12_4_ = uVar335;
                  auVar217 = vmaxps_avx512vl(auVar217,auVar47);
                  uVar335 = puVar10[1];
                  auVar48._4_4_ = uVar335;
                  auVar48._0_4_ = uVar335;
                  auVar48._8_4_ = uVar335;
                  auVar48._12_4_ = uVar335;
                  auVar232 = vminps_avx512vl(auVar217,auVar48);
                  break;
                case 4:
                  auVar45._8_4_ = 0x80000000;
                  auVar45._0_8_ = 0x8000000080000000;
                  auVar45._12_4_ = 0x80000000;
                  auVar217 = vxorps_avx512vl(auVar217,auVar45);
                  auVar217 = vminps_avx(auVar217,auVar350);
                  auVar217 = vmaxps_avx(auVar217,auVar357);
                  auVar218 = vfmadd231ps_fma(auVar363,auVar217,auVar369);
                  auVar188 = vcvttps2dq_avx512vl(auVar218);
                  auVar188 = vcvtdq2ps_avx512vl(auVar188);
                  uVar146 = vcmpps_avx512vl(auVar218,auVar188,1);
                  auVar218 = vsubps_avx512vl(auVar188,auVar375);
                  bVar184 = (bool)((byte)uVar146 & 1);
                  auVar233._0_4_ = (uint)bVar184 * auVar218._0_4_ | (uint)!bVar184 * auVar188._0_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                  auVar233._4_4_ = (uint)bVar184 * auVar218._4_4_ | (uint)!bVar184 * auVar188._4_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                  auVar233._8_4_ = (uint)bVar184 * auVar218._8_4_ | (uint)!bVar184 * auVar188._8_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                  auVar233._12_4_ =
                       (uint)bVar184 * auVar218._12_4_ | (uint)!bVar184 * auVar188._12_4_;
                  auVar217 = vfmsub231ps_avx512vl(auVar217,auVar233,auVar381);
                  auVar46._8_4_ = 0x395e8083;
                  auVar46._0_8_ = 0x395e8083395e8083;
                  auVar46._12_4_ = 0x395e8083;
                  auVar218 = vfmsub231ps_avx512vl(auVar217,auVar233,auVar46);
                  auVar392._0_4_ = auVar218._0_4_ * auVar218._0_4_;
                  auVar392._4_4_ = auVar218._4_4_ * auVar218._4_4_;
                  auVar392._8_4_ = auVar218._8_4_ * auVar218._8_4_;
                  auVar392._12_4_ = auVar218._12_4_ * auVar218._12_4_;
                  auVar217 = vfmadd213ps_fma(auVar185,auVar218,auVar431);
                  auVar217 = vfmadd213ps_fma(auVar217,auVar218,auVar437);
                  auVar217 = vfmadd213ps_fma(auVar217,auVar218,auVar443);
                  auVar217 = vfmadd213ps_fma(auVar217,auVar218,auVar449);
                  auVar217 = vfmadd213ps_fma(auVar217,auVar218,auVar363);
                  auVar217 = vfmadd213ps_fma(auVar217,auVar392,auVar218);
                  auVar340._0_4_ = auVar217._0_4_ + 1.0;
                  auVar340._4_4_ = auVar217._4_4_ + 1.0;
                  auVar340._8_4_ = auVar217._8_4_ + 1.0;
                  auVar340._12_4_ = auVar217._12_4_ + 1.0;
                  auVar217 = vcvttps2dq_avx512vl(auVar233);
                  auVar217 = vpslld_avx(auVar217,0x17);
                  auVar217 = vpaddd_avx(auVar217,auVar455);
                  auVar217 = vfmadd213ps_fma(auVar217,auVar340,auVar375);
                  auVar232 = vdivps_avx(auVar375,auVar217);
                  break;
                case 5:
                  auVar218 = vminps_avx(auVar217,auVar350);
                  auVar218 = vmaxps_avx(auVar218,auVar357);
                  auVar188 = vfmadd213ps_fma(auVar369,auVar218,auVar363);
                  auVar189 = vcvttps2dq_avx512vl(auVar188);
                  auVar189 = vcvtdq2ps_avx512vl(auVar189);
                  uVar146 = vcmpps_avx512vl(auVar188,auVar189,1);
                  auVar188 = vsubps_avx512vl(auVar189,auVar375);
                  bVar184 = (bool)((byte)uVar146 & 1);
                  auVar227._0_4_ = (uint)bVar184 * auVar188._0_4_ | (uint)!bVar184 * auVar189._0_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                  auVar227._4_4_ = (uint)bVar184 * auVar188._4_4_ | (uint)!bVar184 * auVar189._4_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                  auVar227._8_4_ = (uint)bVar184 * auVar188._8_4_ | (uint)!bVar184 * auVar189._8_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                  auVar227._12_4_ =
                       (uint)bVar184 * auVar188._12_4_ | (uint)!bVar184 * auVar189._12_4_;
                  auVar218 = vfmsub231ps_avx512vl(auVar218,auVar227,auVar381);
                  auVar218 = vfnmsub231ps_avx512vl(auVar218,auVar227,auVar461);
                  auVar415._0_4_ = auVar218._0_4_ * auVar218._0_4_;
                  auVar415._4_4_ = auVar218._4_4_ * auVar218._4_4_;
                  auVar415._8_4_ = auVar218._8_4_ * auVar218._8_4_;
                  auVar415._12_4_ = auVar218._12_4_ * auVar218._12_4_;
                  auVar188 = vfmadd213ps_avx512vl(auVar185,auVar218,auVar431);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar437);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar443);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar449);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar363);
                  auVar218 = vfmadd213ps_avx512vl(auVar188,auVar415,auVar218);
                  auVar188 = vaddps_avx512vl(auVar218,auVar375);
                  auVar218 = vcvttps2dq_avx512vl(auVar227);
                  auVar218 = vpslld_avx(auVar218,0x17);
                  auVar218 = vpaddd_avx(auVar218,auVar455);
                  auVar218 = vfmadd213ps_fma(auVar218,auVar188,auVar375);
                  uVar146 = vcmpps_avx512vl(auVar218,(undefined1  [16])0x0,2);
                  auVar42._8_4_ = 0x800000;
                  auVar42._0_8_ = 0x80000000800000;
                  auVar42._12_4_ = 0x800000;
                  auVar218 = vmaxps_avx512vl(auVar218,auVar42);
                  auVar190 = vpsrld_avx(auVar218,0x17);
                  auVar188 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar43._8_4_ = 0x3f000000;
                  auVar43._0_8_ = 0x3f0000003f000000;
                  auVar43._12_4_ = 0x3f000000;
                  auVar218 = vpternlogd_avx512vl(auVar218,auVar188,auVar43,0xea);
                  uVar177 = vcmpps_avx512vl(auVar218,auVar186,1);
                  auVar188 = vaddps_avx512vl(auVar218,auVar187);
                  auVar218 = vaddps_avx512vl(auVar188,auVar218);
                  bVar184 = (bool)((byte)uVar177 & 1);
                  auVar228._0_4_ = (uint)bVar184 * auVar218._0_4_ | (uint)!bVar184 * auVar188._0_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                  auVar228._4_4_ = (uint)bVar184 * auVar218._4_4_ | (uint)!bVar184 * auVar188._4_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                  auVar228._8_4_ = (uint)bVar184 * auVar218._8_4_ | (uint)!bVar184 * auVar188._8_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                  auVar228._12_4_ =
                       (uint)bVar184 * auVar218._12_4_ | (uint)!bVar184 * auVar188._12_4_;
                  auVar188 = vmulps_avx512vl(auVar228,auVar228);
                  auVar218 = vfmadd213ps_avx512vl(auVar208,auVar228,auVar209);
                  auVar218 = vfmadd213ps_avx512vl(auVar218,auVar228,auVar210);
                  auVar218 = vfmadd213ps_avx512vl(auVar218,auVar228,auVar211);
                  auVar218 = vfmadd213ps_avx512vl(auVar218,auVar228,auVar212);
                  auVar218 = vfmadd213ps_avx512vl(auVar218,auVar228,auVar213);
                  auVar218 = vfmadd213ps_avx512vl(auVar218,auVar228,auVar214);
                  auVar218 = vfmadd213ps_avx512vl(auVar218,auVar228,auVar219);
                  auVar218 = vfmadd213ps_avx512vl(auVar218,auVar228,auVar215);
                  auVar189 = vmulps_avx512vl(auVar188,auVar228);
                  auVar189 = vmulps_avx512vl(auVar189,auVar218);
                  auVar44._8_4_ = 0xffffff82;
                  auVar44._0_8_ = 0xffffff82ffffff82;
                  auVar44._12_4_ = 0xffffff82;
                  auVar218 = vpaddd_avx512vl(auVar190,auVar44);
                  auVar218 = vcvtdq2ps_avx(auVar218);
                  auVar190 = vsubps_avx512vl(auVar218,auVar375);
                  bVar184 = (bool)((byte)uVar177 & 1);
                  auVar229._0_4_ = (uint)bVar184 * auVar190._0_4_ | (uint)!bVar184 * auVar218._0_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                  auVar229._4_4_ = (uint)bVar184 * auVar190._4_4_ | (uint)!bVar184 * auVar218._4_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                  auVar229._8_4_ = (uint)bVar184 * auVar190._8_4_ | (uint)!bVar184 * auVar218._8_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                  auVar229._12_4_ =
                       (uint)bVar184 * auVar190._12_4_ | (uint)!bVar184 * auVar218._12_4_;
                  auVar218 = vfmadd231ps_avx512vl(auVar189,auVar229,auVar461);
                  auVar218 = vfmsub231ps_avx512vl(auVar218,auVar363,auVar188);
                  auVar218 = vsubps_avx512vl(auVar218,auVar228);
                  auVar218 = vfnmadd231ps_fma(auVar218,auVar381,auVar229);
                  auVar188 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar184 = (bool)((byte)uVar146 & 1);
                  auVar230._0_4_ =
                       (uint)bVar184 * auVar188._0_4_ |
                       (uint)!bVar184 * (int)(auVar218._0_4_ + auVar218._0_4_);
                  bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                  auVar230._4_4_ =
                       (uint)bVar184 * auVar188._4_4_ |
                       (uint)!bVar184 * (int)(auVar218._4_4_ + auVar218._4_4_);
                  bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                  auVar230._8_4_ =
                       (uint)bVar184 * auVar188._8_4_ |
                       (uint)!bVar184 * (int)(auVar218._8_4_ + auVar218._8_4_);
                  bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                  auVar230._12_4_ =
                       (uint)bVar184 * auVar188._12_4_ |
                       (uint)!bVar184 * (int)(auVar218._12_4_ + auVar218._12_4_);
                  auVar218 = vminps_avx(auVar230,auVar350);
                  auVar218 = vmaxps_avx(auVar218,auVar357);
                  auVar188 = vfmadd213ps_fma(auVar369,auVar218,auVar363);
                  auVar189 = vcvttps2dq_avx512vl(auVar188);
                  auVar189 = vcvtdq2ps_avx512vl(auVar189);
                  uVar146 = vcmpps_avx512vl(auVar188,auVar189,1);
                  auVar188 = vsubps_avx512vl(auVar189,auVar375);
                  bVar184 = (bool)((byte)uVar146 & 1);
                  auVar231._0_4_ = (uint)bVar184 * auVar188._0_4_ | (uint)!bVar184 * auVar189._0_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 1) & 1);
                  auVar231._4_4_ = (uint)bVar184 * auVar188._4_4_ | (uint)!bVar184 * auVar189._4_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 2) & 1);
                  auVar231._8_4_ = (uint)bVar184 * auVar188._8_4_ | (uint)!bVar184 * auVar189._8_4_;
                  bVar184 = (bool)((byte)(uVar146 >> 3) & 1);
                  auVar231._12_4_ =
                       (uint)bVar184 * auVar188._12_4_ | (uint)!bVar184 * auVar189._12_4_;
                  auVar218 = vfmsub231ps_avx512vl(auVar218,auVar231,auVar381);
                  auVar218 = vfnmsub231ps_avx512vl(auVar218,auVar231,auVar461);
                  auVar416._0_4_ = auVar218._0_4_ * auVar218._0_4_;
                  auVar416._4_4_ = auVar218._4_4_ * auVar218._4_4_;
                  auVar416._8_4_ = auVar218._8_4_ * auVar218._8_4_;
                  auVar416._12_4_ = auVar218._12_4_ * auVar218._12_4_;
                  auVar188 = vfmadd213ps_avx512vl(auVar185,auVar218,auVar431);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar437);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar443);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar449);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar363);
                  auVar218 = vfmadd213ps_avx512vl(auVar188,auVar416,auVar218);
                  auVar188 = vaddps_avx512vl(auVar218,auVar375);
                  auVar218 = vcvttps2dq_avx512vl(auVar231);
                  auVar218 = vpslld_avx(auVar218,0x17);
                  auVar218 = vpaddd_avx(auVar218,auVar455);
                  auVar218 = vfmadd213ps_fma(auVar218,auVar188,auVar375);
                  auVar218 = vdivps_avx512vl(auVar216,auVar218);
                  auVar232 = vfmsub213ps_fma(auVar218,auVar217,auVar217);
                  break;
                case 6:
                  puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar335 = *puVar10;
                  auVar393._4_4_ = uVar335;
                  auVar393._0_4_ = uVar335;
                  auVar393._8_4_ = uVar335;
                  auVar393._12_4_ = uVar335;
                  uVar335 = puVar10[1];
                  auVar41._4_4_ = uVar335;
                  auVar41._0_4_ = uVar335;
                  auVar41._8_4_ = uVar335;
                  auVar41._12_4_ = uVar335;
                  auVar217 = vfmadd213ps_avx512vl(auVar393,auVar217,auVar41);
                  auVar217 = vmaxps_avx(auVar217,(undefined1  [16])0x0);
                  auVar217 = vminps_avx(auVar217,auVar375);
                  auVar232._0_4_ = auVar217._0_4_ * auVar333._0_4_;
                  auVar232._4_4_ = auVar217._4_4_ * auVar333._4_4_;
                  auVar232._8_4_ = auVar217._8_4_ * auVar333._8_4_;
                  auVar232._12_4_ = auVar217._12_4_ * auVar333._12_4_;
                }
              }
              *(undefined1 (*) [16])local_288 = auVar232;
              local_288 = (undefined1 (*) [32])((long)local_288 + 0x10);
              iVar144 = iVar144 + 1;
            }
          }
        }
      }
      if ((iVar174 == 1) && (uVar151 == 4)) {
        uVar157 = (this->super_Deconvolution).kernel_w;
        uVar160 = (this->super_Deconvolution).kernel_h;
        iVar139 = (this->super_Deconvolution).dilation_w;
        iVar138 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).stride_w;
        iVar152 = (this->super_Deconvolution).stride_h;
        iVar153 = (this->super_Deconvolution).activation_type;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        uVar166 = 0;
        uVar165 = 0;
        if (0 < (int)uVar157) {
          uVar165 = (ulong)uVar157;
        }
        uVar154 = 0;
        if (0 < (int)uVar160) {
          uVar154 = (ulong)uVar160;
        }
        uVar178 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          uVar178 = uVar166;
        }
        auVar351._8_4_ = 0x42b0c0a5;
        auVar351._0_8_ = 0x42b0c0a542b0c0a5;
        auVar351._12_4_ = 0x42b0c0a5;
        auVar358._8_4_ = 0xc2b0c0a5;
        auVar358._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar358._12_4_ = 0xc2b0c0a5;
        auVar364._8_4_ = 0x3f000000;
        auVar364._0_8_ = 0x3f0000003f000000;
        auVar364._12_4_ = 0x3f000000;
        auVar370._8_4_ = 0x3fb8aa3b;
        auVar370._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar370._12_4_ = 0x3fb8aa3b;
        auVar376._8_4_ = 0x3f800000;
        auVar376._0_8_ = 0x3f8000003f800000;
        auVar376._12_4_ = 0x3f800000;
        auVar382._8_4_ = 0x3f318000;
        auVar382._0_8_ = 0x3f3180003f318000;
        auVar382._12_4_ = 0x3f318000;
        auVar185 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar432._8_4_ = 0x3ab743ce;
        auVar432._0_8_ = 0x3ab743ce3ab743ce;
        auVar432._12_4_ = 0x3ab743ce;
        auVar438._8_4_ = 0x3c088908;
        auVar438._0_8_ = 0x3c0889083c088908;
        auVar438._12_4_ = 0x3c088908;
        auVar444._8_4_ = 0x3d2aa9c1;
        auVar444._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar444._12_4_ = 0x3d2aa9c1;
        auVar450._8_4_ = 0x3e2aaaaa;
        auVar450._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar450._12_4_ = 0x3e2aaaaa;
        auVar456._8_4_ = 0x3f800000;
        auVar456._0_8_ = 0x3f8000003f800000;
        auVar456._12_4_ = 0x3f800000;
        auVar462._8_4_ = 0xb95e8083;
        auVar462._0_8_ = 0xb95e8083b95e8083;
        auVar462._12_4_ = 0xb95e8083;
        auVar186 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar187 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar208 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar209 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar210 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar211 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar212 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar213 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar214 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar219 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar215 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar216 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        for (; uVar166 != uVar178; uVar166 = uVar166 + 1) {
          local_288 = (undefined1 (*) [32])
                      (local_1e8.cstep * uVar166 * local_1e8.elemsize + (long)local_1e8.data);
          iVar8 = bottom_blob->w;
          iVar7 = bottom_blob->h;
          uVar177 = 0;
          uVar146 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar146 = uVar177;
          }
          uVar158 = local_1e8.w;
          if (local_1e8.w < 1) {
            uVar158 = 0;
          }
          uVar159 = local_1e8.h;
          if (local_1e8.h < 1) {
            uVar159 = 0;
          }
          local_168._0_4_ = uVar159;
          while (uVar180 = (uint)uVar177, uVar180 != uVar159) {
            iVar144 = (1 - uVar157) * iVar139;
            for (uVar142 = 0; uVar142 != uVar158; uVar142 = uVar142 + 1) {
              if (pvVar14 == (void *)0x0) {
                auVar217 = ZEXT816(0) << 0x40;
              }
              else {
                auVar217 = *(undefined1 (*) [16])((long)pvVar14 + uVar166 * 0x10);
              }
              auVar333 = ZEXT1664(auVar217);
              pvVar179 = (void *)((this->weight_data_tm).cstep * uVar166 *
                                  (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              for (uVar177 = 0; uVar177 != uVar146; uVar177 = uVar177 + 1) {
                pvVar171 = pvVar179;
                for (uVar181 = 0; uVar181 != uVar154; uVar181 = uVar181 + 1) {
                  iVar140 = (((int)uVar181 - uVar160) + 1) * iVar138 + uVar180;
                  if (((-1 < iVar140) && (iVar141 = iVar140 / iVar152, iVar140 % iVar152 == 0)) &&
                     (iVar141 < iVar7)) {
                    iVar140 = iVar144;
                    for (lVar150 = 0; uVar165 * 0x10 != lVar150; lVar150 = lVar150 + 0x10) {
                      if (((-1 < iVar140) && (iVar143 = iVar140 / iVar156, iVar140 % iVar156 == 0))
                         && (iVar143 < iVar8)) {
                        uVar335 = *(undefined4 *)
                                   ((long)bottom_blob->data +
                                   (long)iVar143 * 4 +
                                   (long)iVar141 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar177);
                        auVar394._4_4_ = uVar335;
                        auVar394._0_4_ = uVar335;
                        auVar394._8_4_ = uVar335;
                        auVar394._12_4_ = uVar335;
                        auVar217 = vfmadd231ps_fma(auVar333._0_16_,auVar394,
                                                   *(undefined1 (*) [16])((long)pvVar171 + lVar150))
                        ;
                        auVar333 = ZEXT1664(auVar217);
                      }
                      iVar140 = iVar140 + iVar139;
                    }
                  }
                  pvVar171 = (void *)((long)pvVar171 + (long)(int)uVar157 * 0x10);
                }
                pvVar179 = (void *)((long)pvVar179 + (long)(int)(uVar157 * uVar160 * 4) * 4);
              }
              auVar217 = auVar333._0_16_;
              auVar239 = auVar217;
              if (iVar153 - 1U < 6) {
                auVar239 = vmaxps_avx(auVar217,(undefined1  [16])0x0);
                switch(iVar153) {
                case 2:
                  auVar217 = vminps_avx(auVar217,(undefined1  [16])0x0);
                  uVar335 = *(this->super_Deconvolution).activation_params.data;
                  auVar58._4_4_ = uVar335;
                  auVar58._0_4_ = uVar335;
                  auVar58._8_4_ = uVar335;
                  auVar58._12_4_ = uVar335;
                  auVar239 = vfmadd231ps_avx512vl(auVar239,auVar217,auVar58);
                  break;
                case 3:
                  puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar335 = *puVar10;
                  auVar56._4_4_ = uVar335;
                  auVar56._0_4_ = uVar335;
                  auVar56._8_4_ = uVar335;
                  auVar56._12_4_ = uVar335;
                  auVar217 = vmaxps_avx512vl(auVar217,auVar56);
                  uVar335 = puVar10[1];
                  auVar57._4_4_ = uVar335;
                  auVar57._0_4_ = uVar335;
                  auVar57._8_4_ = uVar335;
                  auVar57._12_4_ = uVar335;
                  auVar239 = vminps_avx512vl(auVar217,auVar57);
                  break;
                case 4:
                  auVar54._8_4_ = 0x80000000;
                  auVar54._0_8_ = 0x8000000080000000;
                  auVar54._12_4_ = 0x80000000;
                  auVar217 = vxorps_avx512vl(auVar217,auVar54);
                  auVar217 = vminps_avx(auVar217,auVar351);
                  auVar217 = vmaxps_avx(auVar217,auVar358);
                  auVar218 = vfmadd231ps_fma(auVar364,auVar217,auVar370);
                  auVar188 = vcvttps2dq_avx512vl(auVar218);
                  auVar188 = vcvtdq2ps_avx512vl(auVar188);
                  uVar177 = vcmpps_avx512vl(auVar218,auVar188,1);
                  auVar218 = vsubps_avx512vl(auVar188,auVar376);
                  bVar184 = (bool)((byte)uVar177 & 1);
                  auVar240._0_4_ = (uint)bVar184 * auVar218._0_4_ | (uint)!bVar184 * auVar188._0_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                  auVar240._4_4_ = (uint)bVar184 * auVar218._4_4_ | (uint)!bVar184 * auVar188._4_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                  auVar240._8_4_ = (uint)bVar184 * auVar218._8_4_ | (uint)!bVar184 * auVar188._8_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                  auVar240._12_4_ =
                       (uint)bVar184 * auVar218._12_4_ | (uint)!bVar184 * auVar188._12_4_;
                  auVar217 = vfmsub231ps_avx512vl(auVar217,auVar240,auVar382);
                  auVar55._8_4_ = 0x395e8083;
                  auVar55._0_8_ = 0x395e8083395e8083;
                  auVar55._12_4_ = 0x395e8083;
                  auVar218 = vfmsub231ps_avx512vl(auVar217,auVar240,auVar55);
                  auVar395._0_4_ = auVar218._0_4_ * auVar218._0_4_;
                  auVar395._4_4_ = auVar218._4_4_ * auVar218._4_4_;
                  auVar395._8_4_ = auVar218._8_4_ * auVar218._8_4_;
                  auVar395._12_4_ = auVar218._12_4_ * auVar218._12_4_;
                  auVar217 = vfmadd213ps_fma(auVar185,auVar218,auVar432);
                  auVar217 = vfmadd213ps_fma(auVar217,auVar218,auVar438);
                  auVar217 = vfmadd213ps_fma(auVar217,auVar218,auVar444);
                  auVar217 = vfmadd213ps_fma(auVar217,auVar218,auVar450);
                  auVar217 = vfmadd213ps_fma(auVar217,auVar218,auVar364);
                  auVar217 = vfmadd213ps_fma(auVar217,auVar395,auVar218);
                  auVar341._0_4_ = auVar217._0_4_ + 1.0;
                  auVar341._4_4_ = auVar217._4_4_ + 1.0;
                  auVar341._8_4_ = auVar217._8_4_ + 1.0;
                  auVar341._12_4_ = auVar217._12_4_ + 1.0;
                  auVar217 = vcvttps2dq_avx512vl(auVar240);
                  auVar217 = vpslld_avx(auVar217,0x17);
                  auVar217 = vpaddd_avx(auVar217,auVar456);
                  auVar217 = vfmadd213ps_fma(auVar217,auVar341,auVar376);
                  auVar239 = vdivps_avx(auVar376,auVar217);
                  break;
                case 5:
                  auVar218 = vminps_avx(auVar217,auVar351);
                  auVar218 = vmaxps_avx(auVar218,auVar358);
                  auVar188 = vfmadd213ps_fma(auVar370,auVar218,auVar364);
                  auVar189 = vcvttps2dq_avx512vl(auVar188);
                  auVar189 = vcvtdq2ps_avx512vl(auVar189);
                  uVar177 = vcmpps_avx512vl(auVar188,auVar189,1);
                  auVar188 = vsubps_avx512vl(auVar189,auVar376);
                  bVar184 = (bool)((byte)uVar177 & 1);
                  auVar234._0_4_ = (uint)bVar184 * auVar188._0_4_ | (uint)!bVar184 * auVar189._0_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                  auVar234._4_4_ = (uint)bVar184 * auVar188._4_4_ | (uint)!bVar184 * auVar189._4_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                  auVar234._8_4_ = (uint)bVar184 * auVar188._8_4_ | (uint)!bVar184 * auVar189._8_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                  auVar234._12_4_ =
                       (uint)bVar184 * auVar188._12_4_ | (uint)!bVar184 * auVar189._12_4_;
                  auVar218 = vfmsub231ps_avx512vl(auVar218,auVar234,auVar382);
                  auVar218 = vfnmsub231ps_avx512vl(auVar218,auVar234,auVar462);
                  auVar417._0_4_ = auVar218._0_4_ * auVar218._0_4_;
                  auVar417._4_4_ = auVar218._4_4_ * auVar218._4_4_;
                  auVar417._8_4_ = auVar218._8_4_ * auVar218._8_4_;
                  auVar417._12_4_ = auVar218._12_4_ * auVar218._12_4_;
                  auVar188 = vfmadd213ps_avx512vl(auVar185,auVar218,auVar432);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar438);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar444);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar450);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar364);
                  auVar218 = vfmadd213ps_avx512vl(auVar188,auVar417,auVar218);
                  auVar188 = vaddps_avx512vl(auVar218,auVar376);
                  auVar218 = vcvttps2dq_avx512vl(auVar234);
                  auVar218 = vpslld_avx(auVar218,0x17);
                  auVar218 = vpaddd_avx(auVar218,auVar456);
                  auVar218 = vfmadd213ps_fma(auVar218,auVar188,auVar376);
                  uVar177 = vcmpps_avx512vl(auVar218,(undefined1  [16])0x0,2);
                  auVar51._8_4_ = 0x800000;
                  auVar51._0_8_ = 0x80000000800000;
                  auVar51._12_4_ = 0x800000;
                  auVar218 = vmaxps_avx512vl(auVar218,auVar51);
                  auVar190 = vpsrld_avx(auVar218,0x17);
                  auVar188 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar52._8_4_ = 0x3f000000;
                  auVar52._0_8_ = 0x3f0000003f000000;
                  auVar52._12_4_ = 0x3f000000;
                  auVar218 = vpternlogd_avx512vl(auVar218,auVar188,auVar52,0xea);
                  uVar181 = vcmpps_avx512vl(auVar218,auVar186,1);
                  auVar188 = vaddps_avx512vl(auVar218,auVar187);
                  auVar218 = vaddps_avx512vl(auVar188,auVar218);
                  bVar184 = (bool)((byte)uVar181 & 1);
                  auVar235._0_4_ = (uint)bVar184 * auVar218._0_4_ | (uint)!bVar184 * auVar188._0_4_;
                  bVar184 = (bool)((byte)(uVar181 >> 1) & 1);
                  auVar235._4_4_ = (uint)bVar184 * auVar218._4_4_ | (uint)!bVar184 * auVar188._4_4_;
                  bVar184 = (bool)((byte)(uVar181 >> 2) & 1);
                  auVar235._8_4_ = (uint)bVar184 * auVar218._8_4_ | (uint)!bVar184 * auVar188._8_4_;
                  bVar184 = (bool)((byte)(uVar181 >> 3) & 1);
                  auVar235._12_4_ =
                       (uint)bVar184 * auVar218._12_4_ | (uint)!bVar184 * auVar188._12_4_;
                  auVar188 = vmulps_avx512vl(auVar235,auVar235);
                  auVar218 = vfmadd213ps_avx512vl(auVar208,auVar235,auVar209);
                  auVar218 = vfmadd213ps_avx512vl(auVar218,auVar235,auVar210);
                  auVar218 = vfmadd213ps_avx512vl(auVar218,auVar235,auVar211);
                  auVar218 = vfmadd213ps_avx512vl(auVar218,auVar235,auVar212);
                  auVar218 = vfmadd213ps_avx512vl(auVar218,auVar235,auVar213);
                  auVar218 = vfmadd213ps_avx512vl(auVar218,auVar235,auVar214);
                  auVar218 = vfmadd213ps_avx512vl(auVar218,auVar235,auVar219);
                  auVar218 = vfmadd213ps_avx512vl(auVar218,auVar235,auVar215);
                  auVar189 = vmulps_avx512vl(auVar188,auVar235);
                  auVar189 = vmulps_avx512vl(auVar189,auVar218);
                  auVar53._8_4_ = 0xffffff82;
                  auVar53._0_8_ = 0xffffff82ffffff82;
                  auVar53._12_4_ = 0xffffff82;
                  auVar218 = vpaddd_avx512vl(auVar190,auVar53);
                  auVar218 = vcvtdq2ps_avx(auVar218);
                  auVar190 = vsubps_avx512vl(auVar218,auVar376);
                  bVar184 = (bool)((byte)uVar181 & 1);
                  auVar236._0_4_ = (uint)bVar184 * auVar190._0_4_ | (uint)!bVar184 * auVar218._0_4_;
                  bVar184 = (bool)((byte)(uVar181 >> 1) & 1);
                  auVar236._4_4_ = (uint)bVar184 * auVar190._4_4_ | (uint)!bVar184 * auVar218._4_4_;
                  bVar184 = (bool)((byte)(uVar181 >> 2) & 1);
                  auVar236._8_4_ = (uint)bVar184 * auVar190._8_4_ | (uint)!bVar184 * auVar218._8_4_;
                  bVar184 = (bool)((byte)(uVar181 >> 3) & 1);
                  auVar236._12_4_ =
                       (uint)bVar184 * auVar190._12_4_ | (uint)!bVar184 * auVar218._12_4_;
                  auVar218 = vfmadd231ps_avx512vl(auVar189,auVar236,auVar462);
                  auVar218 = vfmsub231ps_avx512vl(auVar218,auVar364,auVar188);
                  auVar218 = vsubps_avx512vl(auVar218,auVar235);
                  auVar218 = vfnmadd231ps_fma(auVar218,auVar382,auVar236);
                  auVar188 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar184 = (bool)((byte)uVar177 & 1);
                  auVar237._0_4_ =
                       (uint)bVar184 * auVar188._0_4_ |
                       (uint)!bVar184 * (int)(auVar218._0_4_ + auVar218._0_4_);
                  bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                  auVar237._4_4_ =
                       (uint)bVar184 * auVar188._4_4_ |
                       (uint)!bVar184 * (int)(auVar218._4_4_ + auVar218._4_4_);
                  bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                  auVar237._8_4_ =
                       (uint)bVar184 * auVar188._8_4_ |
                       (uint)!bVar184 * (int)(auVar218._8_4_ + auVar218._8_4_);
                  bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                  auVar237._12_4_ =
                       (uint)bVar184 * auVar188._12_4_ |
                       (uint)!bVar184 * (int)(auVar218._12_4_ + auVar218._12_4_);
                  auVar218 = vminps_avx(auVar237,auVar351);
                  auVar218 = vmaxps_avx(auVar218,auVar358);
                  auVar188 = vfmadd213ps_fma(auVar370,auVar218,auVar364);
                  auVar189 = vcvttps2dq_avx512vl(auVar188);
                  auVar189 = vcvtdq2ps_avx512vl(auVar189);
                  uVar177 = vcmpps_avx512vl(auVar188,auVar189,1);
                  auVar188 = vsubps_avx512vl(auVar189,auVar376);
                  bVar184 = (bool)((byte)uVar177 & 1);
                  auVar238._0_4_ = (uint)bVar184 * auVar188._0_4_ | (uint)!bVar184 * auVar189._0_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 1) & 1);
                  auVar238._4_4_ = (uint)bVar184 * auVar188._4_4_ | (uint)!bVar184 * auVar189._4_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 2) & 1);
                  auVar238._8_4_ = (uint)bVar184 * auVar188._8_4_ | (uint)!bVar184 * auVar189._8_4_;
                  bVar184 = (bool)((byte)(uVar177 >> 3) & 1);
                  auVar238._12_4_ =
                       (uint)bVar184 * auVar188._12_4_ | (uint)!bVar184 * auVar189._12_4_;
                  auVar218 = vfmsub231ps_avx512vl(auVar218,auVar238,auVar382);
                  auVar218 = vfnmsub231ps_avx512vl(auVar218,auVar238,auVar462);
                  auVar418._0_4_ = auVar218._0_4_ * auVar218._0_4_;
                  auVar418._4_4_ = auVar218._4_4_ * auVar218._4_4_;
                  auVar418._8_4_ = auVar218._8_4_ * auVar218._8_4_;
                  auVar418._12_4_ = auVar218._12_4_ * auVar218._12_4_;
                  auVar188 = vfmadd213ps_avx512vl(auVar185,auVar218,auVar432);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar438);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar444);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar450);
                  auVar188 = vfmadd213ps_avx512vl(auVar188,auVar218,auVar364);
                  auVar218 = vfmadd213ps_avx512vl(auVar188,auVar418,auVar218);
                  auVar188 = vaddps_avx512vl(auVar218,auVar376);
                  auVar218 = vcvttps2dq_avx512vl(auVar238);
                  auVar218 = vpslld_avx(auVar218,0x17);
                  auVar218 = vpaddd_avx(auVar218,auVar456);
                  auVar218 = vfmadd213ps_fma(auVar218,auVar188,auVar376);
                  auVar218 = vdivps_avx512vl(auVar216,auVar218);
                  auVar239 = vfmsub213ps_fma(auVar218,auVar217,auVar217);
                  break;
                case 6:
                  puVar10 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar335 = *puVar10;
                  auVar396._4_4_ = uVar335;
                  auVar396._0_4_ = uVar335;
                  auVar396._8_4_ = uVar335;
                  auVar396._12_4_ = uVar335;
                  uVar335 = puVar10[1];
                  auVar50._4_4_ = uVar335;
                  auVar50._0_4_ = uVar335;
                  auVar50._8_4_ = uVar335;
                  auVar50._12_4_ = uVar335;
                  auVar217 = vfmadd213ps_avx512vl(auVar396,auVar217,auVar50);
                  auVar217 = vmaxps_avx(auVar217,(undefined1  [16])0x0);
                  auVar217 = vminps_avx(auVar217,auVar376);
                  auVar239._0_4_ = auVar217._0_4_ * auVar333._0_4_;
                  auVar239._4_4_ = auVar217._4_4_ * auVar333._4_4_;
                  auVar239._8_4_ = auVar217._8_4_ * auVar333._8_4_;
                  auVar239._12_4_ = auVar217._12_4_ * auVar333._12_4_;
                }
              }
              *(undefined1 (*) [16])local_288 = auVar239;
              local_288 = (undefined1 (*) [32])((long)local_288 + 0x10);
              iVar144 = iVar144 + 1;
            }
            uVar177 = (ulong)(uVar180 + 1);
          }
        }
      }
      if ((iVar174 == 4) && (uVar151 == 1)) {
        uVar157 = (this->super_Deconvolution).kernel_w;
        uVar160 = (this->super_Deconvolution).kernel_h;
        iVar139 = (this->super_Deconvolution).dilation_w;
        iVar138 = (this->super_Deconvolution).dilation_h;
        iVar156 = (this->super_Deconvolution).activation_type;
        local_178 = local_1e8.elemsize * local_1e8.cstep;
        uVar165 = 0;
        uVar166 = 0;
        if (0 < (int)uVar157) {
          uVar166 = (ulong)uVar157;
        }
        uVar154 = 0;
        if (0 < (int)uVar160) {
          uVar154 = (ulong)uVar160;
        }
        uVar178 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar178 = uVar165;
        }
        uVar158 = local_1e8.w;
        if (local_1e8.w < 1) {
          uVar158 = 0;
        }
        uVar159 = local_1e8.h;
        if (local_1e8.h < 1) {
          uVar159 = 0;
        }
        local_1a0 = (ulong)(uint)local_1e8.c;
        if (local_1e8.c < 1) {
          local_1a0 = uVar165;
        }
        iVar152 = (this->super_Deconvolution).stride_w;
        iVar153 = (this->super_Deconvolution).stride_h;
        pvVar14 = (this->super_Deconvolution).bias_data.data;
        local_180 = local_1e8.data;
        iVar8 = bottom_blob->w;
        iVar7 = bottom_blob->h;
        for (; uVar165 != local_1a0; uVar165 = uVar165 + 1) {
          local_288 = (undefined1 (*) [32])(local_178 * uVar165 + (long)local_180);
          for (uVar180 = 0; uVar180 != uVar159; uVar180 = uVar180 + 1) {
            local_168._0_8_ = (this->super_Deconvolution).activation_params.data;
            sVar12 = (this->weight_data_tm).cstep;
            sVar13 = (this->weight_data_tm).elemsize;
            pvVar179 = (this->weight_data_tm).data;
            iVar144 = (1 - uVar157) * iVar139;
            for (uVar142 = 0; uVar142 != uVar158; uVar142 = uVar142 + 1) {
              if (pvVar14 == (void *)0x0) {
                fVar334 = 0.0;
              }
              else {
                fVar334 = *(float *)((long)pvVar14 + uVar165 * 4);
              }
              auVar333 = ZEXT1664(ZEXT816(0) << 0x40);
              pvVar171 = (void *)(sVar12 * uVar165 * sVar13 + (long)pvVar179);
              for (uVar146 = 0; uVar146 != uVar178; uVar146 = uVar146 + 1) {
                pvVar167 = pvVar171;
                for (uVar177 = 0; uVar177 != uVar154; uVar177 = uVar177 + 1) {
                  iVar140 = (((int)uVar177 - uVar160) + 1) * iVar138 + uVar180;
                  if (((-1 < iVar140) && (iVar141 = iVar140 / iVar153, iVar140 % iVar153 == 0)) &&
                     (iVar141 < iVar7)) {
                    iVar140 = iVar144;
                    for (lVar150 = 0; uVar166 * 0x10 != lVar150; lVar150 = lVar150 + 0x10) {
                      if (((-1 < iVar140) && (iVar143 = iVar140 / iVar152, iVar140 % iVar152 == 0))
                         && (iVar143 < iVar8)) {
                        auVar185 = vfmadd231ps_fma(auVar333._0_16_,
                                                   *(undefined1 (*) [16])
                                                    ((long)bottom_blob->data +
                                                    (long)(iVar143 << 2) * 4 +
                                                    (long)iVar141 *
                                                    (long)bottom_blob->w * bottom_blob->elemsize +
                                                    bottom_blob->cstep * bottom_blob->elemsize *
                                                    uVar146),
                                                   *(undefined1 (*) [16])((long)pvVar167 + lVar150))
                        ;
                        auVar333 = ZEXT1664(auVar185);
                      }
                      iVar140 = iVar140 + iVar139;
                    }
                  }
                  pvVar167 = (void *)((long)pvVar167 + (long)(int)uVar157 * 0x10);
                }
                pvVar171 = (void *)((long)pvVar171 + (long)(int)(uVar157 * uVar160 * 4) * 4);
              }
              auVar185 = vshufpd_avx(auVar333._0_16_,auVar333._0_16_,1);
              auVar342._0_4_ = auVar185._0_4_ + auVar333._0_4_;
              auVar342._4_4_ = auVar185._4_4_ + auVar333._4_4_;
              auVar342._8_4_ = auVar185._8_4_ + auVar333._8_4_;
              auVar342._12_4_ = auVar185._12_4_ + auVar333._12_4_;
              auVar185 = vmovshdup_avx(auVar342);
              fVar334 = auVar185._0_4_ + fVar334 + auVar342._0_4_;
              auVar185 = ZEXT416((uint)fVar334);
              fVar348 = fVar334;
              if (iVar156 - 1U < 6) {
                switch(iVar156) {
                case 1:
                  auVar185 = vmaxss_avx(ZEXT416((uint)fVar334),ZEXT416(0));
                  fVar348 = auVar185._0_4_;
                  break;
                case 2:
                  uVar17 = vcmpss_avx512f(ZEXT416((uint)fVar334),ZEXT416(0),0xe);
                  bVar184 = (bool)((byte)uVar17 & 1);
                  fVar348 = (float)((uint)bVar184 * 0x3f800000 +
                                   (uint)!bVar184 * (int)*(float *)local_168._0_8_) * fVar334;
                  break;
                case 3:
                  auVar185 = vmaxss_avx(auVar185,ZEXT416((uint)*(float *)local_168._0_8_));
                  fVar348 = auVar185._0_4_;
                  if (*(float *)(local_168._0_8_ + 4) < auVar185._0_4_) {
                    fVar348 = *(float *)(local_168._0_8_ + 4);
                  }
                  break;
                case 4:
                  auVar185 = vminss_avx(auVar185,SUB6416(ZEXT464(0x42b0c0a5),0));
                  auVar60._8_4_ = 0x80000000;
                  auVar60._0_8_ = 0x8000000080000000;
                  auVar60._12_4_ = 0x80000000;
                  auVar186 = vxorps_avx512vl(auVar185,auVar60);
                  uVar17 = vcmpss_avx512f(auVar185,ZEXT416(0xc2b0c0a5),1);
                  bVar184 = (bool)((byte)uVar17 & 1);
                  fVar334 = expf((float)((uint)bVar184 * 0x42b0c0a5 +
                                        (uint)!bVar184 * auVar186._0_4_));
                  fVar348 = 1.0 / (fVar334 + 1.0);
                  break;
                case 5:
                  fVar348 = expf(fVar334);
                  fVar348 = logf(fVar348 + 1.0);
                  fVar348 = tanhf(fVar348);
                  fVar348 = fVar348 * fVar334;
                  break;
                case 6:
                  fVar2 = *(float *)local_168._0_8_;
                  auVar59._8_4_ = 0x80000000;
                  auVar59._0_8_ = 0x8000000080000000;
                  auVar59._12_4_ = 0x80000000;
                  auVar186 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_168._0_8_ + 4)),auVar59)
                  ;
                  fVar355 = auVar186._0_4_ / fVar2;
                  fVar348 = 0.0;
                  if ((fVar355 <= fVar334) && (fVar348 = fVar334, fVar334 <= fVar355 + 1.0 / fVar2))
                  {
                    auVar185 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar185,
                                               ZEXT416((uint)*(float *)(local_168._0_8_ + 4)));
                    fVar348 = auVar185._0_4_ * fVar334;
                  }
                }
              }
              *(float *)local_288 = fVar348;
              local_288 = (undefined1 (*) [32])((long)local_288 + 4);
              iVar144 = iVar144 + 1;
            }
          }
        }
      }
      pvVar14 = local_1e8.data;
      if ((iVar174 == 1) && (uVar151 == 1)) {
        uVar157 = (this->super_Deconvolution).num_output;
        local_1a0 = local_1e8.cstep * local_1e8.elemsize;
        iVar174 = bottom_blob->w;
        iVar139 = bottom_blob->h;
        lVar150 = (long)local_1e8.w;
        uVar165 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar165 = 0;
        }
        uVar166 = 0;
        if (0 < local_1e8.w) {
          uVar166 = (ulong)(uint)local_1e8.w;
        }
        uVar160 = local_1e8.h;
        if (local_1e8.h < 1) {
          uVar160 = 0;
        }
        uVar154 = (ulong)uVar157;
        if ((int)uVar157 < 1) {
          uVar154 = 0;
        }
        local_18c = -local_18c;
        local_198 = local_198 << 2;
        for (uVar178 = 0; uVar178 != uVar154; uVar178 = uVar178 + 1) {
          local_238 = (void *)(local_1a0 * uVar178 + (long)pvVar14);
          for (uVar157 = 0; uVar157 != uVar160; uVar157 = uVar157 + 1) {
            iVar156 = (this->super_Deconvolution).bias_term;
            iVar152 = (this->super_Deconvolution).activation_type;
            pvVar179 = (this->super_Deconvolution).bias_data.data;
            iVar153 = uVar157 - local_16c;
            sVar12 = (this->weight_data_tm).cstep;
            sVar13 = (this->weight_data_tm).elemsize;
            pvVar171 = (this->weight_data_tm).data;
            local_168._0_8_ = (this->super_Deconvolution).activation_params.data;
            iVar138 = local_18c;
            for (uVar146 = 0; uVar146 != uVar166; uVar146 = uVar146 + 1) {
              if (iVar156 == 0) {
                auVar333 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar333 = ZEXT464(*(uint *)((long)pvVar179 + uVar178 * 4));
              }
              iVar8 = (this->super_Deconvolution).stride_h;
              uVar158 = (this->super_Deconvolution).kernel_w;
              uVar151 = (this->super_Deconvolution).kernel_h;
              uVar177 = 0;
              if (0 < (int)uVar158) {
                uVar177 = (ulong)uVar158;
              }
              if ((int)uVar151 < 1) {
                uVar151 = 0;
              }
              iVar7 = (this->super_Deconvolution).stride_w;
              pvVar167 = (void *)(sVar12 * uVar178 * sVar13 + (long)pvVar171);
              for (uVar181 = 0; uVar181 != uVar165; uVar181 = uVar181 + 1) {
                pvVar175 = pvVar167;
                for (uVar161 = 0; uVar161 != uVar151; uVar161 = uVar161 + 1) {
                  iVar144 = (this->super_Deconvolution).dilation_h * (int)uVar161 + iVar153;
                  if (((-1 < iVar144) && (iVar140 = iVar144 / iVar8, iVar144 % iVar8 == 0)) &&
                     (iVar140 < iVar139)) {
                    iVar144 = iVar138;
                    for (uVar182 = 0; uVar177 != uVar182; uVar182 = uVar182 + 1) {
                      if (((-1 < iVar144) && (iVar141 = iVar144 / iVar7, iVar144 % iVar7 == 0)) &&
                         (iVar141 < iVar174)) {
                        auVar185 = vfmadd231ss_fma(auVar333._0_16_,
                                                   ZEXT416(*(uint *)((long)pvVar175 + uVar182 * 4)),
                                                   ZEXT416(*(uint *)((long)bottom_blob->data +
                                                                    (long)iVar141 * 4 +
                                                                    (long)iVar140 *
                                                                    (long)bottom_blob->w *
                                                                    bottom_blob->elemsize +
                                                                    bottom_blob->cstep *
                                                                    bottom_blob->elemsize * uVar181)
                                                          ));
                        auVar333 = ZEXT1664(auVar185);
                      }
                      iVar144 = iVar144 + (this->super_Deconvolution).dilation_w;
                    }
                  }
                  pvVar175 = (void *)((long)pvVar175 + (long)(int)uVar158 * 4);
                }
                pvVar167 = (void *)((long)pvVar167 + local_198);
              }
              auVar185 = auVar333._0_16_;
              fVar348 = auVar333._0_4_;
              fVar334 = fVar348;
              switch(iVar152) {
              case 1:
                auVar185 = vmaxss_avx(auVar185,ZEXT416(0));
                fVar334 = auVar185._0_4_;
                break;
              case 2:
                uVar17 = vcmpss_avx512f(auVar185,ZEXT416(0),0xe);
                bVar184 = (bool)((byte)uVar17 & 1);
                fVar334 = (float)((uint)bVar184 * 0x3f800000 +
                                 (uint)!bVar184 * (int)*(float *)local_168._0_8_) * fVar348;
                break;
              case 3:
                auVar185 = vmaxss_avx(auVar185,ZEXT416((uint)*(float *)local_168._0_8_));
                fVar334 = auVar185._0_4_;
                if (*(float *)(local_168._0_8_ + 4) < auVar185._0_4_) {
                  fVar334 = *(float *)(local_168._0_8_ + 4);
                }
                break;
              case 4:
                auVar185 = vminss_avx(auVar185,SUB6416(ZEXT464(0x42b0c0a5),0));
                auVar62._8_4_ = 0x80000000;
                auVar62._0_8_ = 0x8000000080000000;
                auVar62._12_4_ = 0x80000000;
                auVar186 = vxorps_avx512vl(auVar185,auVar62);
                uVar17 = vcmpss_avx512f(auVar185,ZEXT416(0xc2b0c0a5),1);
                bVar184 = (bool)((byte)uVar17 & 1);
                fVar334 = expf((float)((uint)bVar184 * 0x42b0c0a5 + (uint)!bVar184 * auVar186._0_4_)
                              );
                fVar334 = 1.0 / (fVar334 + 1.0);
                break;
              case 5:
                fVar334 = expf(fVar348);
                fVar334 = logf(fVar334 + 1.0);
                fVar334 = tanhf(fVar334);
                fVar334 = fVar334 * fVar348;
                break;
              case 6:
                fVar2 = *(float *)local_168._0_8_;
                auVar61._8_4_ = 0x80000000;
                auVar61._0_8_ = 0x8000000080000000;
                auVar61._12_4_ = 0x80000000;
                auVar186 = vxorps_avx512vl(ZEXT416((uint)*(float *)(local_168._0_8_ + 4)),auVar61);
                fVar355 = auVar186._0_4_ / fVar2;
                fVar334 = 0.0;
                if ((fVar355 <= fVar348) && (fVar334 = fVar348, fVar348 <= fVar355 + 1.0 / fVar2)) {
                  auVar185 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar185,
                                             ZEXT416((uint)*(float *)(local_168._0_8_ + 4)));
                  fVar334 = auVar185._0_4_ * fVar348;
                }
              }
              *(float *)((long)local_238 + uVar146 * 4) = fVar334;
              iVar138 = iVar138 + 1;
            }
            local_238 = (void *)((long)local_238 + lVar150 * 4);
          }
        }
      }
    }
    pMVar137 = local_120;
    Deconvolution::cut_padding(&this->super_Deconvolution,&local_1e8,local_120,local_188);
    if ((pMVar137->data == (void *)0x0) || (iVar139 = 0, (long)pMVar137->c * pMVar137->cstep == 0))
    {
      iVar139 = -100;
    }
  }
LAB_0026f8a9:
  piVar9 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_1e8.allocator == (Allocator *)0x0) {
        free(local_1e8.data);
      }
      else {
        (*(local_1e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar139;
}

Assistant:

int Deconvolution_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        int ret = gemm->forward(bottom_blob_2, top_col2im, opt_b);
        if (ret != 0)
            return ret;

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_loadu_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_loadu_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_loadu_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}